

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

void embree::avx::CurveNiMBIntersector1<4>::
     intersect_h<embree::avx::RibbonCurve1Intersector1<embree::HermiteCurveT,8>,embree::avx::Intersect1EpilogMU<8,true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  undefined1 (*pauVar9) [16];
  undefined1 (*pauVar10) [28];
  undefined1 (*pauVar11) [28];
  undefined1 (*pauVar12) [28];
  undefined4 uVar13;
  undefined8 uVar14;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar15;
  Primitive PVar16;
  uint uVar17;
  Geometry *pGVar18;
  __int_type_conflict _Var19;
  long lVar20;
  long lVar21;
  RTCFilterFunctionN p_Var22;
  uint uVar23;
  long lVar24;
  undefined1 auVar25 [32];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  bool bVar113;
  bool bVar114;
  bool bVar115;
  bool bVar116;
  bool bVar117;
  bool bVar118;
  bool bVar119;
  bool bVar120;
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [28];
  undefined1 auVar130 [12];
  undefined1 auVar131 [28];
  undefined1 auVar132 [28];
  undefined1 auVar133 [28];
  undefined1 auVar134 [28];
  undefined1 auVar135 [24];
  uint uVar136;
  uint uVar137;
  uint uVar138;
  ulong uVar139;
  uint uVar140;
  ulong uVar141;
  long lVar142;
  long lVar143;
  undefined1 auVar144 [8];
  float fVar145;
  float fVar161;
  float fVar163;
  vint4 bi_1;
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  float fVar166;
  float fVar167;
  float fVar169;
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  float fVar162;
  float fVar164;
  float fVar165;
  float fVar168;
  float fVar170;
  float fVar171;
  float fVar172;
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [64];
  float fVar173;
  float fVar189;
  float fVar190;
  vint4 bi;
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  float fVar192;
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  float fVar193;
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  float fVar191;
  undefined1 auVar188 [64];
  float fVar194;
  float fVar207;
  float fVar208;
  vint4 bi_2;
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  float fVar209;
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  float fVar210;
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  float fVar211;
  float fVar225;
  float fVar227;
  vint4 ai_1;
  undefined1 auVar213 [16];
  float fVar229;
  undefined1 auVar214 [16];
  float fVar212;
  float fVar231;
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar215 [16];
  float fVar232;
  float fVar233;
  float fVar235;
  float fVar236;
  undefined1 auVar219 [32];
  float fVar226;
  float fVar228;
  float fVar230;
  float fVar234;
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  undefined1 auVar224 [64];
  float fVar237;
  float fVar247;
  float fVar248;
  vint4 ai_2;
  undefined1 auVar238 [16];
  float fVar249;
  undefined1 auVar239 [16];
  undefined1 auVar241 [16];
  undefined1 auVar255 [16];
  undefined1 auVar240 [16];
  undefined1 auVar242 [32];
  float fVar250;
  undefined1 auVar243 [32];
  undefined1 auVar244 [32];
  float fVar251;
  float fVar252;
  undefined1 auVar245 [32];
  undefined1 auVar246 [32];
  float fVar253;
  float fVar262;
  float fVar263;
  undefined1 auVar254 [16];
  float fVar264;
  float fVar266;
  float fVar267;
  undefined1 auVar256 [32];
  undefined1 auVar257 [32];
  float fVar265;
  undefined1 auVar258 [32];
  undefined1 auVar259 [32];
  undefined1 auVar260 [32];
  undefined1 auVar261 [32];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [32];
  undefined1 auVar271 [32];
  undefined1 auVar272 [32];
  float fVar274;
  undefined1 auVar273 [32];
  vint4 ai;
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [32];
  undefined1 auVar282 [32];
  undefined1 auVar283 [32];
  undefined1 auVar284 [32];
  float fVar285;
  float fVar292;
  float fVar293;
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar290 [16];
  float fVar294;
  float fVar295;
  float fVar296;
  float fVar297;
  undefined1 auVar291 [32];
  float fVar298;
  float fVar299;
  float fVar304;
  undefined1 auVar300 [16];
  float fVar306;
  float fVar308;
  float fVar309;
  float fVar310;
  float fVar311;
  undefined1 auVar301 [32];
  float fVar305;
  float fVar307;
  undefined1 auVar302 [32];
  undefined1 auVar303 [32];
  float fVar318;
  float fVar319;
  undefined1 auVar312 [16];
  undefined1 auVar313 [32];
  float fVar320;
  undefined1 auVar314 [32];
  undefined1 auVar315 [32];
  undefined1 auVar316 [32];
  undefined1 auVar317 [64];
  float fVar321;
  float fVar324;
  float fVar325;
  float fVar326;
  float fVar327;
  undefined1 auVar322 [16];
  float fVar328;
  float fVar329;
  float fVar330;
  float fVar331;
  float fVar332;
  undefined1 auVar323 [32];
  float fVar333;
  float fVar341;
  undefined1 auVar334 [16];
  undefined1 auVar336 [32];
  undefined1 auVar337 [32];
  undefined1 auVar338 [32];
  undefined1 auVar339 [32];
  undefined1 auVar340 [32];
  float fVar342;
  float fVar343;
  float fVar348;
  float fVar351;
  undefined1 auVar344 [16];
  float fVar349;
  float fVar350;
  float fVar352;
  float fVar354;
  undefined1 auVar345 [32];
  undefined1 auVar346 [32];
  float fVar353;
  undefined1 auVar347 [64];
  float fVar355;
  float fVar356;
  float fVar362;
  undefined1 auVar358 [32];
  float fVar361;
  float fVar363;
  float fVar364;
  undefined1 auVar359 [64];
  undefined1 auVar360 [64];
  float fVar365;
  float fVar368;
  float fVar369;
  float fVar370;
  undefined1 auVar366 [32];
  undefined1 auVar367 [32];
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  RibbonHit<embree::HermiteCurveT<embree::Vec3fx>,_8> bhit;
  int local_7ec;
  Primitive *local_7e8;
  ulong local_7e0;
  ulong local_7d8;
  undefined1 local_7d0 [8];
  undefined8 uStack_7c8;
  Precalculations *local_7b8;
  RTCFilterFunctionNArguments local_7b0;
  undefined1 local_780 [8];
  float fStack_778;
  float fStack_774;
  float fStack_770;
  float fStack_76c;
  float fStack_768;
  float fStack_764;
  undefined1 local_760 [8];
  float fStack_758;
  float fStack_754;
  float fStack_750;
  float fStack_74c;
  float fStack_748;
  float local_740;
  float fStack_73c;
  float fStack_738;
  float fStack_734;
  float fStack_730;
  float fStack_72c;
  float fStack_728;
  float fStack_724;
  undefined1 local_720 [8];
  float fStack_718;
  float fStack_714;
  undefined1 auStack_710 [8];
  float fStack_708;
  float fStack_704;
  undefined1 local_700 [8];
  float fStack_6f8;
  float fStack_6f4;
  undefined1 auStack_6f0 [16];
  undefined8 local_6d0;
  undefined4 local_6c8;
  float local_6c4;
  undefined4 local_6c0;
  undefined4 local_6bc;
  undefined4 local_6b8;
  uint local_6b4;
  uint local_6b0;
  undefined1 local_6a0 [8];
  float fStack_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  float fStack_684;
  undefined1 local_680 [8];
  float fStack_678;
  float fStack_674;
  undefined1 auStack_670 [16];
  undefined1 local_660 [8];
  float fStack_658;
  float fStack_654;
  float fStack_650;
  float fStack_64c;
  float fStack_648;
  undefined1 local_640 [32];
  undefined1 local_620 [8];
  undefined8 uStack_618;
  undefined1 auStack_610 [8];
  float fStack_608;
  undefined1 local_600 [8];
  undefined8 uStack_5f8;
  undefined1 auStack_5f0 [16];
  undefined1 local_5e0 [8];
  float fStack_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  float fStack_5c8;
  undefined1 local_5c0 [8];
  float fStack_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float fStack_5a8;
  float fStack_5a4;
  undefined1 local_590 [8];
  undefined8 uStack_588;
  undefined1 local_580 [8];
  undefined8 uStack_578;
  undefined1 local_570 [8];
  undefined8 uStack_568;
  undefined1 local_560 [8];
  float fStack_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  undefined1 local_540 [8];
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  float local_520;
  float fStack_51c;
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  float fStack_504;
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float fStack_4e4;
  float local_4e0;
  float fStack_4dc;
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  float fStack_4c4;
  undefined1 local_4c0 [8];
  float fStack_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  float fStack_4a4;
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [2] [32];
  undefined1 local_420 [32];
  undefined1 local_400 [8];
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  float fStack_3e4;
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [8];
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  float fStack_3a4;
  undefined1 local_3a0 [8];
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  float fStack_384;
  undefined1 local_380 [32];
  float local_360;
  float fStack_35c;
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  float fStack_344;
  undefined1 local_340 [32];
  uint local_320;
  uint local_31c;
  undefined8 local_310;
  undefined8 uStack_308;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 local_2f0;
  undefined8 uStack_2e8;
  undefined1 local_2e0 [16];
  undefined1 local_2c0 [32];
  float local_2a0 [4];
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  float fStack_284;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 uStack_270;
  undefined8 uStack_268;
  undefined1 local_260 [32];
  undefined1 local_240 [8];
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined1 local_220 [32];
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  undefined4 uStack_1e4;
  undefined1 local_1e0 [8];
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  undefined1 local_1b0 [16];
  undefined1 local_1a0 [8];
  float fStack_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  undefined1 local_180 [8];
  float fStack_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float fStack_168;
  undefined1 local_160 [8];
  float fStack_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  undefined1 local_140 [8];
  float fStack_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  float fStack_124;
  undefined1 local_120 [8];
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  undefined1 local_c0 [8];
  float fStack_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float fStack_a8;
  undefined1 local_a0 [8];
  float fStack_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  undefined1 local_80 [8];
  float fStack_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float fStack_68;
  undefined1 auVar289 [16];
  undefined1 auVar335 [16];
  undefined1 auVar357 [16];
  
  local_7b8 = pre;
  PVar16 = prim[1];
  uVar139 = (ulong)(byte)PVar16;
  lVar24 = uVar139 * 0x25;
  fVar192 = *(float *)(prim + lVar24 + 0x12);
  auVar255 = vsubps_avx((undefined1  [16])(ray->super_RayK<1>).org.field_0,
                        *(undefined1 (*) [16])(prim + lVar24 + 6));
  auVar174._0_4_ = fVar192 * auVar255._0_4_;
  auVar174._4_4_ = fVar192 * auVar255._4_4_;
  auVar174._8_4_ = fVar192 * auVar255._8_4_;
  auVar174._12_4_ = fVar192 * auVar255._12_4_;
  auVar275._0_4_ = fVar192 * (ray->super_RayK<1>).dir.field_0.m128[0];
  auVar275._4_4_ = fVar192 * (ray->super_RayK<1>).dir.field_0.m128[1];
  auVar275._8_4_ = fVar192 * (ray->super_RayK<1>).dir.field_0.m128[2];
  auVar275._12_4_ = fVar192 * (ray->super_RayK<1>).dir.field_0.m128[3];
  auVar255 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar139 * 4 + 6)));
  auVar255 = vcvtdq2ps_avx(auVar255);
  auVar201 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar139 * 5 + 6)));
  auVar201 = vcvtdq2ps_avx(auVar201);
  auVar241 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar139 * 6 + 6)));
  auVar241 = vcvtdq2ps_avx(auVar241);
  auVar216 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar139 * 0xf + 6)));
  auVar26 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar16 * 0x10 + 6)));
  auVar216 = vcvtdq2ps_avx(auVar216);
  auVar27 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar16 * 0x10 + uVar139 + 6)));
  auVar26 = vcvtdq2ps_avx(auVar26);
  auVar27 = vcvtdq2ps_avx(auVar27);
  auVar28 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar139 * 0x1a + 6)));
  auVar28 = vcvtdq2ps_avx(auVar28);
  auVar29 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar139 * 0x1b + 6)));
  auVar29 = vcvtdq2ps_avx(auVar29);
  auVar30 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar139 * 0x1c + 6)));
  auVar30 = vcvtdq2ps_avx(auVar30);
  auVar31 = vshufps_avx(auVar275,auVar275,0);
  auVar32 = vshufps_avx(auVar275,auVar275,0x55);
  auVar33 = vshufps_avx(auVar275,auVar275,0xaa);
  fVar192 = auVar33._0_4_;
  fVar350 = auVar33._4_4_;
  fVar209 = auVar33._8_4_;
  fVar265 = auVar33._12_4_;
  fVar237 = auVar32._0_4_;
  fVar247 = auVar32._4_4_;
  fVar248 = auVar32._8_4_;
  fVar249 = auVar32._12_4_;
  fVar211 = auVar31._0_4_;
  fVar225 = auVar31._4_4_;
  fVar227 = auVar31._8_4_;
  fVar229 = auVar31._12_4_;
  auVar334._0_4_ = fVar211 * auVar255._0_4_ + fVar237 * auVar201._0_4_ + fVar192 * auVar241._0_4_;
  auVar334._4_4_ = fVar225 * auVar255._4_4_ + fVar247 * auVar201._4_4_ + fVar350 * auVar241._4_4_;
  auVar334._8_4_ = fVar227 * auVar255._8_4_ + fVar248 * auVar201._8_4_ + fVar209 * auVar241._8_4_;
  auVar334._12_4_ =
       fVar229 * auVar255._12_4_ + fVar249 * auVar201._12_4_ + fVar265 * auVar241._12_4_;
  auVar344._0_4_ = fVar211 * auVar216._0_4_ + fVar237 * auVar26._0_4_ + auVar27._0_4_ * fVar192;
  auVar344._4_4_ = fVar225 * auVar216._4_4_ + fVar247 * auVar26._4_4_ + auVar27._4_4_ * fVar350;
  auVar344._8_4_ = fVar227 * auVar216._8_4_ + fVar248 * auVar26._8_4_ + auVar27._8_4_ * fVar209;
  auVar344._12_4_ = fVar229 * auVar216._12_4_ + fVar249 * auVar26._12_4_ + auVar27._12_4_ * fVar265;
  auVar276._0_4_ = fVar211 * auVar28._0_4_ + fVar237 * auVar29._0_4_ + auVar30._0_4_ * fVar192;
  auVar276._4_4_ = fVar225 * auVar28._4_4_ + fVar247 * auVar29._4_4_ + auVar30._4_4_ * fVar350;
  auVar276._8_4_ = fVar227 * auVar28._8_4_ + fVar248 * auVar29._8_4_ + auVar30._8_4_ * fVar209;
  auVar276._12_4_ = fVar229 * auVar28._12_4_ + fVar249 * auVar29._12_4_ + auVar30._12_4_ * fVar265;
  auVar31 = vshufps_avx(auVar174,auVar174,0);
  auVar32 = vshufps_avx(auVar174,auVar174,0x55);
  auVar33 = vshufps_avx(auVar174,auVar174,0xaa);
  fVar192 = auVar33._0_4_;
  fVar350 = auVar33._4_4_;
  fVar209 = auVar33._8_4_;
  fVar265 = auVar33._12_4_;
  fVar237 = auVar32._0_4_;
  fVar247 = auVar32._4_4_;
  fVar248 = auVar32._8_4_;
  fVar249 = auVar32._12_4_;
  fVar211 = auVar31._0_4_;
  fVar225 = auVar31._4_4_;
  fVar227 = auVar31._8_4_;
  fVar229 = auVar31._12_4_;
  auVar175._0_4_ = fVar211 * auVar255._0_4_ + fVar237 * auVar201._0_4_ + fVar192 * auVar241._0_4_;
  auVar175._4_4_ = fVar225 * auVar255._4_4_ + fVar247 * auVar201._4_4_ + fVar350 * auVar241._4_4_;
  auVar175._8_4_ = fVar227 * auVar255._8_4_ + fVar248 * auVar201._8_4_ + fVar209 * auVar241._8_4_;
  auVar175._12_4_ =
       fVar229 * auVar255._12_4_ + fVar249 * auVar201._12_4_ + fVar265 * auVar241._12_4_;
  auVar146._0_4_ = fVar211 * auVar216._0_4_ + auVar27._0_4_ * fVar192 + fVar237 * auVar26._0_4_;
  auVar146._4_4_ = fVar225 * auVar216._4_4_ + auVar27._4_4_ * fVar350 + fVar247 * auVar26._4_4_;
  auVar146._8_4_ = fVar227 * auVar216._8_4_ + auVar27._8_4_ * fVar209 + fVar248 * auVar26._8_4_;
  auVar146._12_4_ = fVar229 * auVar216._12_4_ + auVar27._12_4_ * fVar265 + fVar249 * auVar26._12_4_;
  auVar286._8_4_ = 0x7fffffff;
  auVar286._0_8_ = 0x7fffffff7fffffff;
  auVar286._12_4_ = 0x7fffffff;
  auVar255 = vandps_avx(auVar334,auVar286);
  auVar238._8_4_ = 0x219392ef;
  auVar238._0_8_ = 0x219392ef219392ef;
  auVar238._12_4_ = 0x219392ef;
  auVar255 = vcmpps_avx(auVar255,auVar238,1);
  auVar201 = vblendvps_avx(auVar334,auVar238,auVar255);
  auVar255 = vandps_avx(auVar344,auVar286);
  auVar255 = vcmpps_avx(auVar255,auVar238,1);
  auVar241 = vblendvps_avx(auVar344,auVar238,auVar255);
  auVar255 = vandps_avx(auVar286,auVar276);
  auVar255 = vcmpps_avx(auVar255,auVar238,1);
  auVar255 = vblendvps_avx(auVar276,auVar238,auVar255);
  auVar195._0_4_ = fVar211 * auVar28._0_4_ + fVar237 * auVar29._0_4_ + auVar30._0_4_ * fVar192;
  auVar195._4_4_ = fVar225 * auVar28._4_4_ + fVar247 * auVar29._4_4_ + auVar30._4_4_ * fVar350;
  auVar195._8_4_ = fVar227 * auVar28._8_4_ + fVar248 * auVar29._8_4_ + auVar30._8_4_ * fVar209;
  auVar195._12_4_ = fVar229 * auVar28._12_4_ + fVar249 * auVar29._12_4_ + auVar30._12_4_ * fVar265;
  auVar216 = vrcpps_avx(auVar201);
  fVar211 = auVar216._0_4_;
  auVar213._0_4_ = fVar211 * auVar201._0_4_;
  fVar225 = auVar216._4_4_;
  auVar213._4_4_ = fVar225 * auVar201._4_4_;
  fVar227 = auVar216._8_4_;
  auVar213._8_4_ = fVar227 * auVar201._8_4_;
  fVar229 = auVar216._12_4_;
  auVar213._12_4_ = fVar229 * auVar201._12_4_;
  auVar268._8_4_ = 0x3f800000;
  auVar268._0_8_ = &DAT_3f8000003f800000;
  auVar268._12_4_ = 0x3f800000;
  auVar201 = vsubps_avx(auVar268,auVar213);
  fVar211 = fVar211 + fVar211 * auVar201._0_4_;
  fVar225 = fVar225 + fVar225 * auVar201._4_4_;
  fVar227 = fVar227 + fVar227 * auVar201._8_4_;
  fVar229 = fVar229 + fVar229 * auVar201._12_4_;
  auVar201 = vrcpps_avx(auVar241);
  fVar237 = auVar201._0_4_;
  auVar254._0_4_ = fVar237 * auVar241._0_4_;
  fVar247 = auVar201._4_4_;
  auVar254._4_4_ = fVar247 * auVar241._4_4_;
  fVar248 = auVar201._8_4_;
  auVar254._8_4_ = fVar248 * auVar241._8_4_;
  fVar249 = auVar201._12_4_;
  auVar254._12_4_ = fVar249 * auVar241._12_4_;
  auVar201 = vsubps_avx(auVar268,auVar254);
  fVar237 = fVar237 + fVar237 * auVar201._0_4_;
  fVar247 = fVar247 + fVar247 * auVar201._4_4_;
  fVar248 = fVar248 + fVar248 * auVar201._8_4_;
  fVar249 = fVar249 + fVar249 * auVar201._12_4_;
  auVar201 = vrcpps_avx(auVar255);
  fVar253 = auVar201._0_4_;
  auVar277._0_4_ = fVar253 * auVar255._0_4_;
  fVar262 = auVar201._4_4_;
  auVar277._4_4_ = fVar262 * auVar255._4_4_;
  fVar263 = auVar201._8_4_;
  auVar277._8_4_ = fVar263 * auVar255._8_4_;
  fVar264 = auVar201._12_4_;
  auVar277._12_4_ = fVar264 * auVar255._12_4_;
  auVar255 = vsubps_avx(auVar268,auVar277);
  fVar253 = fVar253 + fVar253 * auVar255._0_4_;
  fVar262 = fVar262 + fVar262 * auVar255._4_4_;
  fVar263 = fVar263 + fVar263 * auVar255._8_4_;
  fVar264 = fVar264 + fVar264 * auVar255._12_4_;
  auVar255 = ZEXT416((uint)(((ray->super_RayK<1>).dir.field_0.m128[3] -
                            *(float *)(prim + lVar24 + 0x16)) * *(float *)(prim + lVar24 + 0x1a)));
  auVar241 = vshufps_avx(auVar255,auVar255,0);
  auVar255._8_8_ = 0;
  auVar255._0_8_ = *(ulong *)(prim + uVar139 * 7 + 6);
  auVar255 = vpmovsxwd_avx(auVar255);
  auVar255 = vcvtdq2ps_avx(auVar255);
  auVar201._8_8_ = 0;
  auVar201._0_8_ = *(ulong *)(prim + uVar139 * 0xb + 6);
  auVar201 = vpmovsxwd_avx(auVar201);
  auVar201 = vcvtdq2ps_avx(auVar201);
  auVar216 = vsubps_avx(auVar201,auVar255);
  fVar192 = auVar241._0_4_;
  fVar350 = auVar241._4_4_;
  fVar209 = auVar241._8_4_;
  fVar265 = auVar241._12_4_;
  auVar241._8_8_ = 0;
  auVar241._0_8_ = *(ulong *)(prim + uVar139 * 9 + 6);
  auVar201 = vpmovsxwd_avx(auVar241);
  auVar278._0_4_ = auVar216._0_4_ * fVar192 + auVar255._0_4_;
  auVar278._4_4_ = auVar216._4_4_ * fVar350 + auVar255._4_4_;
  auVar278._8_4_ = auVar216._8_4_ * fVar209 + auVar255._8_4_;
  auVar278._12_4_ = auVar216._12_4_ * fVar265 + auVar255._12_4_;
  auVar216._8_8_ = 0;
  auVar216._0_8_ = *(ulong *)(prim + uVar139 * 0xd + 6);
  auVar241 = vpmovsxwd_avx(auVar216);
  auVar255 = vcvtdq2ps_avx(auVar201);
  auVar201 = vcvtdq2ps_avx(auVar241);
  auVar201 = vsubps_avx(auVar201,auVar255);
  auVar287._0_4_ = auVar201._0_4_ * fVar192 + auVar255._0_4_;
  auVar287._4_4_ = auVar201._4_4_ * fVar350 + auVar255._4_4_;
  auVar287._8_4_ = auVar201._8_4_ * fVar209 + auVar255._8_4_;
  auVar287._12_4_ = auVar201._12_4_ * fVar265 + auVar255._12_4_;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = *(ulong *)(prim + uVar139 * 0x12 + 6);
  auVar255 = vpmovsxwd_avx(auVar26);
  uVar141 = (ulong)(uint)((int)(uVar139 * 5) << 2);
  auVar27._8_8_ = 0;
  auVar27._0_8_ = *(ulong *)(prim + uVar139 * 2 + uVar141 + 6);
  auVar201 = vpmovsxwd_avx(auVar27);
  auVar255 = vcvtdq2ps_avx(auVar255);
  auVar201 = vcvtdq2ps_avx(auVar201);
  auVar201 = vsubps_avx(auVar201,auVar255);
  auVar300._0_4_ = auVar201._0_4_ * fVar192 + auVar255._0_4_;
  auVar300._4_4_ = auVar201._4_4_ * fVar350 + auVar255._4_4_;
  auVar300._8_4_ = auVar201._8_4_ * fVar209 + auVar255._8_4_;
  auVar300._12_4_ = auVar201._12_4_ * fVar265 + auVar255._12_4_;
  auVar28._8_8_ = 0;
  auVar28._0_8_ = *(ulong *)(prim + uVar141 + 6);
  auVar255 = vpmovsxwd_avx(auVar28);
  auVar255 = vcvtdq2ps_avx(auVar255);
  auVar29._8_8_ = 0;
  auVar29._0_8_ = *(ulong *)(prim + uVar139 * 0x18 + 6);
  auVar201 = vpmovsxwd_avx(auVar29);
  auVar201 = vcvtdq2ps_avx(auVar201);
  auVar241 = vsubps_avx(auVar201,auVar255);
  auVar30._8_8_ = 0;
  auVar30._0_8_ = *(ulong *)(prim + uVar139 * 0x1d + 6);
  auVar201 = vpmovsxwd_avx(auVar30);
  auVar312._0_4_ = auVar241._0_4_ * fVar192 + auVar255._0_4_;
  auVar312._4_4_ = auVar241._4_4_ * fVar350 + auVar255._4_4_;
  auVar312._8_4_ = auVar241._8_4_ * fVar209 + auVar255._8_4_;
  auVar312._12_4_ = auVar241._12_4_ * fVar265 + auVar255._12_4_;
  auVar255 = vcvtdq2ps_avx(auVar201);
  auVar31._8_8_ = 0;
  auVar31._0_8_ = *(ulong *)(prim + uVar139 + (ulong)(byte)PVar16 * 0x20 + 6);
  auVar201 = vpmovsxwd_avx(auVar31);
  auVar201 = vcvtdq2ps_avx(auVar201);
  auVar201 = vsubps_avx(auVar201,auVar255);
  auVar322._0_4_ = auVar201._0_4_ * fVar192 + auVar255._0_4_;
  auVar322._4_4_ = auVar201._4_4_ * fVar350 + auVar255._4_4_;
  auVar322._8_4_ = auVar201._8_4_ * fVar209 + auVar255._8_4_;
  auVar322._12_4_ = auVar201._12_4_ * fVar265 + auVar255._12_4_;
  auVar32._8_8_ = 0;
  auVar32._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar16 * 0x20 - uVar139) + 6);
  auVar255 = vpmovsxwd_avx(auVar32);
  auVar255 = vcvtdq2ps_avx(auVar255);
  auVar33._8_8_ = 0;
  auVar33._0_8_ = *(ulong *)(prim + uVar139 * 0x23 + 6);
  auVar201 = vpmovsxwd_avx(auVar33);
  auVar201 = vcvtdq2ps_avx(auVar201);
  auVar201 = vsubps_avx(auVar201,auVar255);
  auVar269._0_4_ = auVar255._0_4_ + auVar201._0_4_ * fVar192;
  auVar269._4_4_ = auVar255._4_4_ + auVar201._4_4_ * fVar350;
  auVar269._8_4_ = auVar255._8_4_ + auVar201._8_4_ * fVar209;
  auVar269._12_4_ = auVar255._12_4_ + auVar201._12_4_ * fVar265;
  auVar255 = vsubps_avx(auVar278,auVar175);
  auVar279._0_4_ = fVar211 * auVar255._0_4_;
  auVar279._4_4_ = fVar225 * auVar255._4_4_;
  auVar279._8_4_ = fVar227 * auVar255._8_4_;
  auVar279._12_4_ = fVar229 * auVar255._12_4_;
  auVar255 = vsubps_avx(auVar287,auVar175);
  auVar176._0_4_ = fVar211 * auVar255._0_4_;
  auVar176._4_4_ = fVar225 * auVar255._4_4_;
  auVar176._8_4_ = fVar227 * auVar255._8_4_;
  auVar176._12_4_ = fVar229 * auVar255._12_4_;
  auVar255 = vsubps_avx(auVar300,auVar146);
  auVar214._0_4_ = fVar237 * auVar255._0_4_;
  auVar214._4_4_ = fVar247 * auVar255._4_4_;
  auVar214._8_4_ = fVar248 * auVar255._8_4_;
  auVar214._12_4_ = fVar249 * auVar255._12_4_;
  auVar255 = vsubps_avx(auVar312,auVar146);
  auVar147._0_4_ = fVar237 * auVar255._0_4_;
  auVar147._4_4_ = fVar247 * auVar255._4_4_;
  auVar147._8_4_ = fVar248 * auVar255._8_4_;
  auVar147._12_4_ = fVar249 * auVar255._12_4_;
  auVar255 = vsubps_avx(auVar322,auVar195);
  auVar239._0_4_ = fVar253 * auVar255._0_4_;
  auVar239._4_4_ = fVar262 * auVar255._4_4_;
  auVar239._8_4_ = fVar263 * auVar255._8_4_;
  auVar239._12_4_ = fVar264 * auVar255._12_4_;
  auVar255 = vsubps_avx(auVar269,auVar195);
  auVar196._0_4_ = fVar253 * auVar255._0_4_;
  auVar196._4_4_ = fVar262 * auVar255._4_4_;
  auVar196._8_4_ = fVar263 * auVar255._8_4_;
  auVar196._12_4_ = fVar264 * auVar255._12_4_;
  auVar255 = vpminsd_avx(auVar279,auVar176);
  auVar201 = vpminsd_avx(auVar214,auVar147);
  auVar255 = vmaxps_avx(auVar255,auVar201);
  auVar201 = vpminsd_avx(auVar239,auVar196);
  uVar13 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar288._4_4_ = uVar13;
  auVar288._0_4_ = uVar13;
  auVar288._8_4_ = uVar13;
  auVar288._12_4_ = uVar13;
  auVar201 = vmaxps_avx(auVar201,auVar288);
  auVar255 = vmaxps_avx(auVar255,auVar201);
  local_1b0._0_4_ = auVar255._0_4_ * 0.99999964;
  local_1b0._4_4_ = auVar255._4_4_ * 0.99999964;
  local_1b0._8_4_ = auVar255._8_4_ * 0.99999964;
  local_1b0._12_4_ = auVar255._12_4_ * 0.99999964;
  auVar255 = vpmaxsd_avx(auVar279,auVar176);
  auVar201 = vpmaxsd_avx(auVar214,auVar147);
  auVar255 = vminps_avx(auVar255,auVar201);
  auVar201 = vpmaxsd_avx(auVar239,auVar196);
  fVar192 = (ray->super_RayK<1>).tfar;
  auVar197._4_4_ = fVar192;
  auVar197._0_4_ = fVar192;
  auVar197._8_4_ = fVar192;
  auVar197._12_4_ = fVar192;
  auVar201 = vminps_avx(auVar201,auVar197);
  auVar255 = vminps_avx(auVar255,auVar201);
  auVar148._0_4_ = auVar255._0_4_ * 1.0000004;
  auVar148._4_4_ = auVar255._4_4_ * 1.0000004;
  auVar148._8_4_ = auVar255._8_4_ * 1.0000004;
  auVar148._12_4_ = auVar255._12_4_ * 1.0000004;
  auVar255 = vpshufd_avx(ZEXT116((byte)PVar16),0);
  auVar201 = vpcmpgtd_avx(auVar255,_DAT_01ff0cf0);
  auVar255 = vcmpps_avx(local_1b0,auVar148,2);
  auVar255 = vandps_avx(auVar255,auVar201);
  uVar136 = vmovmskps_avx(auVar255);
  if (uVar136 != 0) {
    uVar136 = uVar136 & 0xff;
    local_460[1]._0_8_ = mm_lookupmask_ps._16_8_;
    local_460[1]._8_8_ = mm_lookupmask_ps._24_8_;
    local_460[1]._16_8_ = mm_lookupmask_ps._16_8_;
    local_460[1]._24_8_ = mm_lookupmask_ps._24_8_;
    do {
      lVar24 = 0;
      if (uVar136 != 0) {
        for (; (uVar136 >> lVar24 & 1) == 0; lVar24 = lVar24 + 1) {
        }
      }
      uVar140 = *(uint *)(prim + 2);
      uVar138 = *(uint *)(prim + lVar24 * 4 + 6);
      local_7e0 = (ulong)uVar140;
      pGVar18 = (context->scene->geometries).items[uVar140].ptr;
      local_7d8 = (ulong)uVar138;
      uVar139 = (ulong)*(uint *)(*(long *)&pGVar18->field_0x58 +
                                (ulong)uVar138 *
                                pGVar18[1].super_RefCount.refCounter.
                                super___atomic_base<unsigned_long>._M_i);
      fVar192 = (pGVar18->time_range).lower;
      fVar192 = pGVar18->fnumTimeSegments *
                (((ray->super_RayK<1>).dir.field_0.m128[3] - fVar192) /
                ((pGVar18->time_range).upper - fVar192));
      auVar255 = vroundss_avx(ZEXT416((uint)fVar192),ZEXT416((uint)fVar192),9);
      auVar255 = vminss_avx(auVar255,ZEXT416((uint)(pGVar18->fnumTimeSegments + -1.0)));
      auVar255 = vmaxss_avx(ZEXT816(0) << 0x20,auVar255);
      fVar192 = fVar192 - auVar255._0_4_;
      _Var19 = pGVar18[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar142 = (long)(int)auVar255._0_4_ * 0x38;
      lVar143 = *(long *)(_Var19 + 0x10 + lVar142);
      lVar20 = *(long *)(_Var19 + 0x38 + lVar142);
      lVar21 = *(long *)(_Var19 + 0x48 + lVar142);
      auVar255 = vshufps_avx(ZEXT416((uint)fVar192),ZEXT416((uint)fVar192),0);
      pfVar1 = (float *)(lVar20 + lVar21 * uVar139);
      fVar350 = auVar255._0_4_;
      fVar209 = auVar255._4_4_;
      fVar265 = auVar255._8_4_;
      fVar211 = auVar255._12_4_;
      lVar24 = uVar139 + 1;
      pfVar2 = (float *)(lVar20 + lVar21 * lVar24);
      p_Var22 = pGVar18[4].occlusionFilterN;
      auVar255 = vshufps_avx(ZEXT416((uint)(1.0 - fVar192)),ZEXT416((uint)(1.0 - fVar192)),0);
      pfVar3 = (float *)(*(long *)(_Var19 + lVar142) + lVar143 * uVar139);
      fVar192 = auVar255._0_4_;
      fVar225 = auVar255._4_4_;
      fVar227 = auVar255._8_4_;
      fVar229 = auVar255._12_4_;
      pfVar4 = (float *)(*(long *)(_Var19 + lVar142) + lVar143 * lVar24);
      pfVar5 = (float *)(*(long *)(p_Var22 + lVar142 + 0x38) +
                        uVar139 * *(long *)(p_Var22 + lVar142 + 0x48));
      pfVar6 = (float *)(*(long *)(p_Var22 + lVar142 + 0x38) +
                        *(long *)(p_Var22 + lVar142 + 0x48) * lVar24);
      pfVar7 = (float *)(*(long *)(p_Var22 + lVar142) +
                        *(long *)(p_Var22 + lVar142 + 0x10) * uVar139);
      pfVar8 = (float *)(*(long *)(p_Var22 + lVar142) + *(long *)(p_Var22 + lVar142 + 0x10) * lVar24
                        );
      uVar17 = (uint)pGVar18[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar24 = (long)(int)uVar17 * 0x44;
      fVar285 = fVar192 * *pfVar3 + fVar350 * *pfVar1;
      fVar292 = fVar225 * pfVar3[1] + fVar209 * pfVar1[1];
      auVar289._0_8_ = CONCAT44(fVar292,fVar285);
      auVar289._8_4_ = fVar227 * pfVar3[2] + fVar265 * pfVar1[2];
      auVar289._12_4_ = fVar229 * pfVar3[3] + fVar211 * pfVar1[3];
      fVar355 = fVar192 * *pfVar4 + fVar350 * *pfVar2;
      fVar361 = fVar225 * pfVar4[1] + fVar209 * pfVar2[1];
      auVar357._0_8_ = CONCAT44(fVar361,fVar355);
      auVar357._8_4_ = fVar227 * pfVar4[2] + fVar265 * pfVar2[2];
      auVar357._12_4_ = fVar229 * pfVar4[3] + fVar211 * pfVar2[3];
      fVar333 = fVar285 + (fVar192 * *pfVar7 + fVar350 * *pfVar5) * 0.33333334;
      fVar341 = fVar292 + (fVar225 * pfVar7[1] + fVar209 * pfVar5[1]) * 0.33333334;
      auVar335._0_8_ = CONCAT44(fVar341,fVar333);
      auVar335._8_4_ = auVar289._8_4_ + (fVar227 * pfVar7[2] + fVar265 * pfVar5[2]) * 0.33333334;
      auVar335._12_4_ = auVar289._12_4_ + (fVar229 * pfVar7[3] + fVar211 * pfVar5[3]) * 0.33333334;
      auVar149._0_4_ = (fVar192 * *pfVar8 + fVar350 * *pfVar6) * 0.33333334;
      auVar149._4_4_ = (fVar225 * pfVar8[1] + fVar209 * pfVar6[1]) * 0.33333334;
      auVar149._8_4_ = (fVar227 * pfVar8[2] + fVar265 * pfVar6[2]) * 0.33333334;
      auVar149._12_4_ = (fVar229 * pfVar8[3] + fVar211 * pfVar6[3]) * 0.33333334;
      _local_590 = vsubps_avx(auVar357,auVar149);
      aVar15 = (ray->super_RayK<1>).org.field_0;
      auVar241 = vsubps_avx(auVar289,(undefined1  [16])aVar15);
      _local_7d0 = auVar289;
      auVar255 = vshufps_avx(auVar241,auVar241,0);
      auVar201 = vshufps_avx(auVar241,auVar241,0x55);
      auVar241 = vshufps_avx(auVar241,auVar241,0xaa);
      fVar192 = (local_7b8->ray_space).vx.field_0.m128[0];
      fVar350 = (local_7b8->ray_space).vx.field_0.m128[1];
      fVar209 = (local_7b8->ray_space).vx.field_0.m128[2];
      fVar265 = (local_7b8->ray_space).vx.field_0.m128[3];
      fVar211 = (local_7b8->ray_space).vy.field_0.m128[0];
      fVar225 = (local_7b8->ray_space).vy.field_0.m128[1];
      fVar227 = (local_7b8->ray_space).vy.field_0.m128[2];
      fVar229 = (local_7b8->ray_space).vy.field_0.m128[3];
      fVar237 = (local_7b8->ray_space).vz.field_0.m128[0];
      fVar247 = (local_7b8->ray_space).vz.field_0.m128[1];
      fVar248 = (local_7b8->ray_space).vz.field_0.m128[2];
      fVar249 = (local_7b8->ray_space).vz.field_0.m128[3];
      auVar215._0_8_ =
           CONCAT44(auVar255._4_4_ * fVar350 + auVar241._4_4_ * fVar247 + auVar201._4_4_ * fVar225,
                    auVar255._0_4_ * fVar192 + auVar241._0_4_ * fVar237 + auVar201._0_4_ * fVar211);
      auVar215._8_4_ =
           auVar255._8_4_ * fVar209 + auVar241._8_4_ * fVar248 + auVar201._8_4_ * fVar227;
      auVar215._12_4_ =
           auVar255._12_4_ * fVar265 + auVar241._12_4_ * fVar249 + auVar201._12_4_ * fVar229;
      auVar255 = vblendps_avx(auVar215,auVar289,8);
      auVar216 = vsubps_avx(auVar335,(undefined1  [16])aVar15);
      auVar201 = vshufps_avx(auVar216,auVar216,0);
      auVar241 = vshufps_avx(auVar216,auVar216,0x55);
      auVar216 = vshufps_avx(auVar216,auVar216,0xaa);
      auVar280._0_4_ =
           auVar201._0_4_ * fVar192 + auVar241._0_4_ * fVar211 + fVar237 * auVar216._0_4_;
      auVar280._4_4_ =
           auVar201._4_4_ * fVar350 + auVar241._4_4_ * fVar225 + fVar247 * auVar216._4_4_;
      auVar280._8_4_ =
           auVar201._8_4_ * fVar209 + auVar241._8_4_ * fVar227 + fVar248 * auVar216._8_4_;
      auVar280._12_4_ =
           auVar201._12_4_ * fVar265 + auVar241._12_4_ * fVar229 + fVar249 * auVar216._12_4_;
      auVar201 = vblendps_avx(auVar280,auVar335,8);
      auVar26 = vsubps_avx(_local_590,(undefined1  [16])aVar15);
      auVar241 = vshufps_avx(auVar26,auVar26,0);
      auVar216 = vshufps_avx(auVar26,auVar26,0x55);
      auVar26 = vshufps_avx(auVar26,auVar26,0xaa);
      auVar290._0_4_ = auVar241._0_4_ * fVar192 + auVar216._0_4_ * fVar211 + auVar26._0_4_ * fVar237
      ;
      auVar290._4_4_ = auVar241._4_4_ * fVar350 + auVar216._4_4_ * fVar225 + auVar26._4_4_ * fVar247
      ;
      auVar290._8_4_ = auVar241._8_4_ * fVar209 + auVar216._8_4_ * fVar227 + auVar26._8_4_ * fVar248
      ;
      auVar290._12_4_ =
           auVar241._12_4_ * fVar265 + auVar216._12_4_ * fVar229 + auVar26._12_4_ * fVar249;
      auVar241 = vblendps_avx(auVar290,_local_590,8);
      auVar27 = vsubps_avx(auVar357,(undefined1  [16])aVar15);
      auVar216 = vshufps_avx(auVar27,auVar27,0);
      auVar26 = vshufps_avx(auVar27,auVar27,0x55);
      auVar27 = vshufps_avx(auVar27,auVar27,0xaa);
      auVar177._0_4_ = auVar216._0_4_ * fVar192 + auVar27._0_4_ * fVar237 + auVar26._0_4_ * fVar211;
      auVar177._4_4_ = auVar216._4_4_ * fVar350 + auVar27._4_4_ * fVar247 + auVar26._4_4_ * fVar225;
      auVar177._8_4_ = auVar216._8_4_ * fVar209 + auVar27._8_4_ * fVar248 + auVar26._8_4_ * fVar227;
      auVar177._12_4_ =
           auVar216._12_4_ * fVar265 + auVar27._12_4_ * fVar249 + auVar26._12_4_ * fVar229;
      auVar216 = vblendps_avx(auVar177,auVar357,8);
      auVar240._8_4_ = 0x7fffffff;
      auVar240._0_8_ = 0x7fffffff7fffffff;
      auVar240._12_4_ = 0x7fffffff;
      auVar255 = vandps_avx(auVar255,auVar240);
      auVar201 = vandps_avx(auVar201,auVar240);
      auVar26 = vmaxps_avx(auVar255,auVar201);
      auVar255 = vandps_avx(auVar241,auVar240);
      auVar201 = vandps_avx(auVar216,auVar240);
      auVar255 = vmaxps_avx(auVar255,auVar201);
      auVar255 = vmaxps_avx(auVar26,auVar255);
      auVar201 = vmovshdup_avx(auVar255);
      auVar201 = vmaxss_avx(auVar201,auVar255);
      auVar255 = vshufpd_avx(auVar255,auVar255,1);
      auVar255 = vmaxss_avx(auVar255,auVar201);
      fVar263 = *(float *)(bezier_basis0 + lVar24 + 0x908);
      fVar264 = *(float *)(bezier_basis0 + lVar24 + 0x90c);
      fVar325 = *(float *)(bezier_basis0 + lVar24 + 0x910);
      fVar231 = *(float *)(bezier_basis0 + lVar24 + 0x914);
      fVar327 = *(float *)(bezier_basis0 + lVar24 + 0x918);
      fVar235 = *(float *)(bezier_basis0 + lVar24 + 0x91c);
      fVar329 = *(float *)(bezier_basis0 + lVar24 + 0x920);
      _local_700 = auVar290;
      auVar201 = vshufps_avx(auVar290,auVar290,0);
      register0x00001250 = auVar201;
      _local_5c0 = auVar201;
      auVar241 = vshufps_avx(auVar290,auVar290,0x55);
      register0x00001290 = auVar241;
      _local_5e0 = auVar241;
      fVar192 = *(float *)*(undefined1 (*) [28])(bezier_basis0 + lVar24 + 0xd8c);
      fVar350 = *(float *)(bezier_basis0 + lVar24 + 0xd90);
      fVar209 = *(float *)(bezier_basis0 + lVar24 + 0xd94);
      fVar265 = *(float *)(bezier_basis0 + lVar24 + 0xd98);
      fVar211 = *(float *)(bezier_basis0 + lVar24 + 0xd9c);
      fVar225 = *(float *)(bezier_basis0 + lVar24 + 0xda0);
      fVar227 = *(float *)(bezier_basis0 + lVar24 + 0xda4);
      auVar129 = *(undefined1 (*) [28])(bezier_basis0 + lVar24 + 0xd8c);
      auVar216 = vshufps_avx(auVar177,auVar177,0);
      register0x00001550 = auVar216;
      _local_3c0 = auVar216;
      fVar342 = auVar216._0_4_;
      fVar348 = auVar216._4_4_;
      fVar351 = auVar216._8_4_;
      fVar353 = auVar216._12_4_;
      fVar173 = auVar201._0_4_;
      fVar189 = auVar201._4_4_;
      fVar190 = auVar201._8_4_;
      fVar191 = auVar201._12_4_;
      auVar201 = vshufps_avx(auVar177,auVar177,0x55);
      register0x000014d0 = auVar201;
      _local_760 = auVar201;
      fVar321 = auVar201._0_4_;
      fVar324 = auVar201._4_4_;
      fVar326 = auVar201._8_4_;
      fVar328 = auVar201._12_4_;
      fVar194 = auVar241._0_4_;
      fVar207 = auVar241._4_4_;
      fVar208 = auVar241._8_4_;
      fVar210 = auVar241._12_4_;
      auVar27 = _local_590;
      auVar201 = vshufps_avx(_local_590,_local_590,0xff);
      register0x00001390 = auVar201;
      _local_80 = auVar201;
      _local_570 = auVar357;
      auVar29 = _local_570;
      auVar241 = vshufps_avx(auVar357,auVar357,0xff);
      register0x00001590 = auVar241;
      _local_160 = auVar241;
      fVar319 = auVar241._0_4_;
      fVar320 = auVar241._4_4_;
      fVar343 = auVar241._8_4_;
      fVar349 = auVar241._12_4_;
      fVar262 = auVar201._0_4_;
      fVar310 = auVar201._4_4_;
      fVar145 = auVar201._8_4_;
      fVar162 = auVar201._12_4_;
      auVar201 = vshufps_avx(auVar280,auVar280,0);
      register0x00001450 = auVar201;
      _local_560 = auVar201;
      fVar266 = *(float *)(bezier_basis0 + lVar24 + 0x484);
      fVar330 = *(float *)(bezier_basis0 + lVar24 + 0x488);
      fVar234 = *(float *)(bezier_basis0 + lVar24 + 0x48c);
      fVar331 = *(float *)(bezier_basis0 + lVar24 + 0x490);
      fVar267 = *(float *)(bezier_basis0 + lVar24 + 0x494);
      fVar332 = *(float *)(bezier_basis0 + lVar24 + 0x498);
      fVar236 = *(float *)(bezier_basis0 + lVar24 + 0x49c);
      fVar193 = auVar201._0_4_;
      fVar274 = auVar201._4_4_;
      fVar304 = auVar201._8_4_;
      fVar306 = auVar201._12_4_;
      auVar201 = vshufps_avx(auVar280,auVar280,0x55);
      local_640._16_16_ = auVar201;
      local_640._0_16_ = auVar201;
      fVar365 = auVar201._0_4_;
      fVar368 = auVar201._4_4_;
      fVar369 = auVar201._8_4_;
      fVar370 = auVar201._12_4_;
      _local_580 = auVar335;
      auVar28 = _local_580;
      auVar201 = vshufps_avx(auVar335,auVar335,0xff);
      register0x00001310 = auVar201;
      _local_a0 = auVar201;
      fVar248 = auVar201._0_4_;
      fVar249 = auVar201._4_4_;
      fVar253 = auVar201._8_4_;
      auVar121._8_4_ = auVar215._8_4_;
      auVar121._0_8_ = auVar215._0_8_;
      auVar121._12_4_ = auVar215._12_4_;
      auVar241 = vshufps_avx(auVar121,auVar121,0);
      register0x00001350 = auVar241;
      _local_3a0 = auVar241;
      pauVar9 = (undefined1 (*) [16])(bezier_basis0 + lVar24);
      fVar229 = *(float *)*pauVar9;
      fVar237 = *(float *)(bezier_basis0 + lVar24 + 4);
      fVar247 = *(float *)(bezier_basis0 + lVar24 + 8);
      auVar130 = *(undefined1 (*) [12])*pauVar9;
      fVar252 = *(float *)(bezier_basis0 + lVar24 + 0xc);
      fStack_1f0 = *(float *)(bezier_basis0 + lVar24 + 0x10);
      fStack_1ec = *(float *)(bezier_basis0 + lVar24 + 0x14);
      fStack_1e8 = *(float *)(bezier_basis0 + lVar24 + 0x18);
      fVar305 = auVar241._0_4_;
      fVar307 = auVar241._4_4_;
      fVar308 = auVar241._8_4_;
      fVar309 = auVar241._12_4_;
      auVar281._0_4_ = fVar305 * fVar229 + fVar193 * fVar266 + fVar173 * fVar263 + fVar342 * fVar192
      ;
      auVar281._4_4_ = fVar307 * fVar237 + fVar274 * fVar330 + fVar189 * fVar264 + fVar348 * fVar350
      ;
      auVar281._8_4_ = fVar308 * fVar247 + fVar304 * fVar234 + fVar190 * fVar325 + fVar351 * fVar209
      ;
      auVar281._12_4_ =
           fVar309 * fVar252 + fVar306 * fVar331 + fVar191 * fVar231 + fVar353 * fVar265;
      auVar281._16_4_ =
           fVar305 * fStack_1f0 + fVar193 * fVar267 + fVar173 * fVar327 + fVar342 * fVar211;
      auVar281._20_4_ =
           fVar307 * fStack_1ec + fVar274 * fVar332 + fVar189 * fVar235 + fVar348 * fVar225;
      auVar281._24_4_ =
           fVar308 * fStack_1e8 + fVar304 * fVar236 + fVar190 * fVar329 + fVar351 * fVar227;
      auVar281._28_4_ = fVar309 + fVar191 + 0.0 + 0.0;
      auVar241 = vshufps_avx(auVar121,auVar121,0x55);
      register0x00001410 = auVar241;
      _local_140 = auVar241;
      fVar165 = auVar241._0_4_;
      fVar168 = auVar241._4_4_;
      fVar171 = auVar241._8_4_;
      fVar172 = auVar241._12_4_;
      auVar336._0_4_ = fVar165 * fVar229 + fVar365 * fVar266 + fVar194 * fVar263 + fVar321 * fVar192
      ;
      auVar336._4_4_ = fVar168 * fVar237 + fVar368 * fVar330 + fVar207 * fVar264 + fVar324 * fVar350
      ;
      auVar336._8_4_ = fVar171 * fVar247 + fVar369 * fVar234 + fVar208 * fVar325 + fVar326 * fVar209
      ;
      auVar336._12_4_ =
           fVar172 * fVar252 + fVar370 * fVar331 + fVar210 * fVar231 + fVar328 * fVar265;
      auVar336._16_4_ =
           fVar165 * fStack_1f0 + fVar365 * fVar267 + fVar194 * fVar327 + fVar321 * fVar211;
      auVar336._20_4_ =
           fVar168 * fStack_1ec + fVar368 * fVar332 + fVar207 * fVar235 + fVar324 * fVar225;
      auVar336._24_4_ =
           fVar171 * fStack_1e8 + fVar369 * fVar236 + fVar208 * fVar329 + fVar326 * fVar227;
      auVar336._28_4_ = fVar210 + 0.0 + 0.0 + 0.0;
      auVar241 = vpermilps_avx(auVar289,0xff);
      register0x00001490 = auVar241;
      _local_180 = auVar241;
      _local_200 = *pauVar9;
      auVar30 = _local_200;
      uStack_1e4 = *(undefined4 *)(bezier_basis0 + lVar24 + 0x1c);
      fVar250 = auVar241._0_4_;
      fVar311 = auVar241._4_4_;
      fVar318 = auVar241._8_4_;
      local_780._0_4_ =
           fVar250 * fVar229 + fVar248 * fVar266 + fVar262 * fVar263 + fVar319 * fVar192;
      local_780._4_4_ =
           fVar311 * fVar237 + fVar249 * fVar330 + fVar310 * fVar264 + fVar320 * fVar350;
      fStack_778 = fVar318 * fVar247 + fVar253 * fVar234 + fVar145 * fVar325 + fVar343 * fVar209;
      fStack_774 = auVar241._12_4_ * fVar252 +
                   auVar201._12_4_ * fVar331 + fVar162 * fVar231 + fVar349 * fVar265;
      fStack_770 = fVar250 * fStack_1f0 + fVar248 * fVar267 + fVar262 * fVar327 + fVar319 * fVar211;
      fStack_76c = fVar311 * fStack_1ec + fVar249 * fVar332 + fVar310 * fVar235 + fVar320 * fVar225;
      fStack_768 = fVar318 * fStack_1e8 + fVar253 * fVar236 + fVar145 * fVar329 + fVar343 * fVar227;
      fStack_764 = *(float *)(bezier_basis0 + lVar24 + 0x924) + 0.0 + 0.0 + 0.0;
      fVar161 = *(float *)(bezier_basis1 + lVar24 + 0x908);
      fVar163 = *(float *)(bezier_basis1 + lVar24 + 0x90c);
      fVar164 = *(float *)(bezier_basis1 + lVar24 + 0x910);
      fVar166 = *(float *)(bezier_basis1 + lVar24 + 0x914);
      fVar167 = *(float *)(bezier_basis1 + lVar24 + 0x918);
      fVar170 = *(float *)(bezier_basis1 + lVar24 + 0x91c);
      fVar169 = *(float *)(bezier_basis1 + lVar24 + 0x920);
      fVar192 = *(float *)*(undefined1 (*) [28])(bezier_basis1 + lVar24 + 0xd8c);
      fVar350 = *(float *)(bezier_basis1 + lVar24 + 0xd90);
      fVar209 = *(float *)(bezier_basis1 + lVar24 + 0xd94);
      fVar265 = *(float *)(bezier_basis1 + lVar24 + 0xd98);
      fVar211 = *(float *)(bezier_basis1 + lVar24 + 0xd9c);
      fVar225 = *(float *)(bezier_basis1 + lVar24 + 0xda0);
      fVar227 = *(float *)(bezier_basis1 + lVar24 + 0xda4);
      auVar131 = *(undefined1 (*) [28])(bezier_basis1 + lVar24 + 0xd8c);
      fVar212 = *(float *)(bezier_basis1 + lVar24 + 0x484);
      fVar226 = *(float *)(bezier_basis1 + lVar24 + 0x488);
      fVar228 = *(float *)(bezier_basis1 + lVar24 + 0x48c);
      fVar230 = *(float *)(bezier_basis1 + lVar24 + 0x490);
      fVar232 = *(float *)(bezier_basis1 + lVar24 + 0x494);
      fVar233 = *(float *)(bezier_basis1 + lVar24 + 0x498);
      fVar299 = *(float *)(bezier_basis1 + lVar24 + 0x49c);
      fVar229 = fVar353 + fVar309 + 0.0;
      fVar251 = *(float *)(bezier_basis1 + lVar24);
      fVar293 = *(float *)(bezier_basis1 + lVar24 + 4);
      fVar294 = *(float *)(bezier_basis1 + lVar24 + 8);
      fVar295 = *(float *)(bezier_basis1 + lVar24 + 0xc);
      fVar296 = *(float *)(bezier_basis1 + lVar24 + 0x10);
      fVar297 = *(float *)(bezier_basis1 + lVar24 + 0x14);
      fVar298 = *(float *)(bezier_basis1 + lVar24 + 0x18);
      auVar242._0_4_ = fVar305 * fVar251 + fVar193 * fVar212 + fVar161 * fVar173 + fVar342 * fVar192
      ;
      auVar242._4_4_ = fVar307 * fVar293 + fVar274 * fVar226 + fVar163 * fVar189 + fVar348 * fVar350
      ;
      auVar242._8_4_ = fVar308 * fVar294 + fVar304 * fVar228 + fVar164 * fVar190 + fVar351 * fVar209
      ;
      auVar242._12_4_ =
           fVar309 * fVar295 + fVar306 * fVar230 + fVar166 * fVar191 + fVar353 * fVar265;
      auVar242._16_4_ =
           fVar305 * fVar296 + fVar193 * fVar232 + fVar167 * fVar173 + fVar342 * fVar211;
      auVar242._20_4_ =
           fVar307 * fVar297 + fVar274 * fVar233 + fVar170 * fVar189 + fVar348 * fVar225;
      auVar242._24_4_ =
           fVar308 * fVar298 + fVar304 * fVar299 + fVar169 * fVar190 + fVar351 * fVar227;
      auVar242._28_4_ = fVar349 + fVar229;
      local_4c0._0_4_ =
           fVar165 * fVar251 + fVar365 * fVar212 + fVar194 * fVar161 + fVar321 * fVar192;
      local_4c0._4_4_ =
           fVar168 * fVar293 + fVar368 * fVar226 + fVar207 * fVar163 + fVar324 * fVar350;
      fStack_4b8 = fVar171 * fVar294 + fVar369 * fVar228 + fVar208 * fVar164 + fVar326 * fVar209;
      fStack_4b4 = fVar172 * fVar295 + fVar370 * fVar230 + fVar210 * fVar166 + fVar328 * fVar265;
      fStack_4b0 = fVar165 * fVar296 + fVar365 * fVar232 + fVar194 * fVar167 + fVar321 * fVar211;
      fStack_4ac = fVar168 * fVar297 + fVar368 * fVar233 + fVar207 * fVar170 + fVar324 * fVar225;
      fStack_4a8 = fVar171 * fVar298 + fVar369 * fVar299 + fVar208 * fVar169 + fVar326 * fVar227;
      fStack_4a4 = fVar229 + fVar353 + fVar309 + 0.0;
      local_680._0_4_ =
           fVar248 * fVar212 + fVar262 * fVar161 + fVar319 * fVar192 + fVar250 * fVar251;
      local_680._4_4_ =
           fVar249 * fVar226 + fVar310 * fVar163 + fVar320 * fVar350 + fVar311 * fVar293;
      fStack_678 = fVar253 * fVar228 + fVar145 * fVar164 + fVar343 * fVar209 + fVar318 * fVar294;
      fStack_674 = auVar201._12_4_ * fVar230 + fVar162 * fVar166 + fVar349 * fVar265 +
                   auVar241._12_4_ * fVar295;
      register0x00001450 =
           fVar248 * fVar232 + fVar262 * fVar167 + fVar319 * fVar211 + fVar250 * fVar296;
      register0x00001454 =
           fVar249 * fVar233 + fVar310 * fVar170 + fVar320 * fVar225 + fVar311 * fVar297;
      register0x00001458 =
           fVar253 * fVar299 + fVar145 * fVar169 + fVar343 * fVar227 + fVar318 * fVar298;
      register0x0000145c = fVar353 + fVar162 + fVar309 + fVar229;
      auVar260 = vsubps_avx(auVar242,auVar281);
      auVar34 = vsubps_avx(_local_4c0,auVar336);
      fVar192 = auVar260._0_4_;
      fVar209 = auVar260._4_4_;
      auVar184._4_4_ = auVar336._4_4_ * fVar209;
      auVar184._0_4_ = auVar336._0_4_ * fVar192;
      fVar211 = auVar260._8_4_;
      auVar184._8_4_ = auVar336._8_4_ * fVar211;
      fVar227 = auVar260._12_4_;
      auVar184._12_4_ = auVar336._12_4_ * fVar227;
      fVar237 = auVar260._16_4_;
      auVar184._16_4_ = auVar336._16_4_ * fVar237;
      fVar248 = auVar260._20_4_;
      auVar184._20_4_ = auVar336._20_4_ * fVar248;
      fVar253 = auVar260._24_4_;
      auVar184._24_4_ = auVar336._24_4_ * fVar253;
      auVar184._28_4_ = fVar229;
      fVar350 = auVar34._0_4_;
      fVar265 = auVar34._4_4_;
      auVar283._4_4_ = auVar281._4_4_ * fVar265;
      auVar283._0_4_ = auVar281._0_4_ * fVar350;
      fVar225 = auVar34._8_4_;
      auVar283._8_4_ = auVar281._8_4_ * fVar225;
      fVar229 = auVar34._12_4_;
      auVar283._12_4_ = auVar281._12_4_ * fVar229;
      fVar247 = auVar34._16_4_;
      auVar283._16_4_ = auVar281._16_4_ * fVar247;
      fVar249 = auVar34._20_4_;
      auVar283._20_4_ = auVar281._20_4_ * fVar249;
      fVar262 = auVar34._24_4_;
      auVar283._24_4_ = auVar281._24_4_ * fVar262;
      auVar283._28_4_ = fStack_4a4;
      auVar283 = vsubps_avx(auVar184,auVar283);
      auVar184 = vmaxps_avx(_local_780,_local_680);
      auVar39._4_4_ = auVar184._4_4_ * auVar184._4_4_ * (fVar209 * fVar209 + fVar265 * fVar265);
      auVar39._0_4_ = auVar184._0_4_ * auVar184._0_4_ * (fVar192 * fVar192 + fVar350 * fVar350);
      auVar39._8_4_ = auVar184._8_4_ * auVar184._8_4_ * (fVar211 * fVar211 + fVar225 * fVar225);
      auVar39._12_4_ = auVar184._12_4_ * auVar184._12_4_ * (fVar227 * fVar227 + fVar229 * fVar229);
      auVar39._16_4_ = auVar184._16_4_ * auVar184._16_4_ * (fVar237 * fVar237 + fVar247 * fVar247);
      auVar39._20_4_ = auVar184._20_4_ * auVar184._20_4_ * (fVar248 * fVar248 + fVar249 * fVar249);
      auVar39._24_4_ = auVar184._24_4_ * auVar184._24_4_ * (fVar253 * fVar253 + fVar262 * fVar262);
      auVar39._28_4_ = auVar242._28_4_ + fStack_4a4;
      auVar25._4_4_ = auVar283._4_4_ * auVar283._4_4_;
      auVar25._0_4_ = auVar283._0_4_ * auVar283._0_4_;
      auVar25._8_4_ = auVar283._8_4_ * auVar283._8_4_;
      auVar25._12_4_ = auVar283._12_4_ * auVar283._12_4_;
      auVar25._16_4_ = auVar283._16_4_ * auVar283._16_4_;
      auVar25._20_4_ = auVar283._20_4_ * auVar283._20_4_;
      auVar25._24_4_ = auVar283._24_4_ * auVar283._24_4_;
      auVar25._28_4_ = auVar283._28_4_;
      auVar184 = vcmpps_avx(auVar25,auVar39,2);
      auVar201 = ZEXT416((uint)(float)(int)uVar17);
      local_3e0._0_16_ = auVar201;
      auVar201 = vshufps_avx(auVar201,auVar201,0);
      auVar219._16_16_ = auVar201;
      auVar219._0_16_ = auVar201;
      auVar283 = vcmpps_avx(_DAT_02020f40,auVar219,1);
      auVar224 = ZEXT3264(auVar283);
      auVar122._8_4_ = auVar215._8_4_;
      auVar122._0_8_ = auVar215._0_8_;
      auVar122._12_4_ = auVar215._12_4_;
      auVar201 = vpermilps_avx(auVar122,0xaa);
      auVar313._16_16_ = auVar201;
      auVar313._0_16_ = auVar201;
      auVar241 = vpermilps_avx(auVar280,0xaa);
      register0x00001550 = auVar241;
      _local_1e0 = auVar241;
      auVar216 = vpermilps_avx(auVar290,0xaa);
      register0x00001590 = auVar216;
      _local_c0 = auVar216;
      auVar26 = vpermilps_avx(auVar177,0xaa);
      register0x00001310 = auVar26;
      _local_540 = auVar26;
      auVar39 = auVar283 & auVar184;
      local_740 = *(float *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
      fStack_73c = 0.0;
      fStack_738 = 0.0;
      fStack_734 = 0.0;
      auVar255 = ZEXT416((uint)(auVar255._0_4_ * 4.7683716e-07));
      if ((((((((auVar39 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar39 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar39 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar39 >> 0x7f,0) == '\0') &&
            (auVar39 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar39 >> 0xbf,0) == '\0') &&
          (auVar39 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar39[0x1f])
      {
        auVar359 = ZEXT3264(_local_760);
        auVar347 = ZEXT3264(local_640);
      }
      else {
        local_220 = vandps_avx(auVar184,auVar283);
        fVar311 = auVar201._0_4_;
        fVar318 = auVar201._4_4_;
        fVar319 = auVar201._8_4_;
        fVar320 = auVar201._12_4_;
        fVar343 = auVar241._0_4_;
        fVar349 = auVar241._4_4_;
        fVar352 = auVar241._8_4_;
        fVar354 = auVar241._12_4_;
        fVar356 = auVar216._0_4_;
        fVar362 = auVar216._4_4_;
        fVar363 = auVar216._8_4_;
        fVar364 = auVar216._12_4_;
        local_400._0_4_ = auVar131._0_4_;
        local_400._4_4_ = auVar131._4_4_;
        fStack_3f8 = auVar131._8_4_;
        fStack_3f4 = auVar131._12_4_;
        fStack_3f0 = auVar131._16_4_;
        fStack_3ec = auVar131._20_4_;
        fStack_3e8 = auVar131._24_4_;
        fVar310 = auVar26._0_4_;
        fVar145 = auVar26._4_4_;
        fVar162 = auVar26._8_4_;
        fVar250 = auVar26._12_4_;
        fVar192 = auVar283._28_4_ +
                  *(float *)(bezier_basis1 + lVar24 + 0x924) +
                  *(float *)(bezier_basis1 + lVar24 + 0x4a0);
        _local_700 = auVar255;
        local_400._0_4_ =
             fVar311 * fVar251 +
             fVar343 * fVar212 + fVar356 * fVar161 + fVar310 * (float)local_400._0_4_;
        local_400._4_4_ =
             fVar318 * fVar293 +
             fVar349 * fVar226 + fVar362 * fVar163 + fVar145 * (float)local_400._4_4_;
        fStack_3f8 = fVar319 * fVar294 +
                     fVar352 * fVar228 + fVar363 * fVar164 + fVar162 * fStack_3f8;
        fStack_3f4 = fVar320 * fVar295 +
                     fVar354 * fVar230 + fVar364 * fVar166 + fVar250 * fStack_3f4;
        fStack_3f0 = fVar311 * fVar296 +
                     fVar343 * fVar232 + fVar356 * fVar167 + fVar310 * fStack_3f0;
        fStack_3ec = fVar318 * fVar297 +
                     fVar349 * fVar233 + fVar362 * fVar170 + fVar145 * fStack_3ec;
        fStack_3e8 = fVar319 * fVar298 +
                     fVar352 * fVar299 + fVar363 * fVar169 + fVar162 * fStack_3e8;
        fStack_3e4 = local_220._28_4_ + fVar192;
        local_200._0_4_ = auVar130._0_4_;
        local_200._4_4_ = auVar130._4_4_;
        fStack_1f8 = auVar130._8_4_;
        local_6a0._0_4_ = auVar129._0_4_;
        local_6a0._4_4_ = auVar129._4_4_;
        fStack_698 = auVar129._8_4_;
        fStack_694 = auVar129._12_4_;
        fStack_690 = auVar129._16_4_;
        fStack_68c = auVar129._20_4_;
        fStack_688 = auVar129._24_4_;
        local_4e0 = fVar311 * (float)local_200._0_4_ +
                    fVar343 * fVar266 + fVar356 * fVar263 + fVar310 * (float)local_6a0._0_4_;
        fStack_4dc = fVar318 * (float)local_200._4_4_ +
                     fVar349 * fVar330 + fVar362 * fVar264 + fVar145 * (float)local_6a0._4_4_;
        fStack_4d8 = fVar319 * fStack_1f8 +
                     fVar352 * fVar234 + fVar363 * fVar325 + fVar162 * fStack_698;
        fStack_4d4 = fVar320 * fVar252 +
                     fVar354 * fVar331 + fVar364 * fVar231 + fVar250 * fStack_694;
        fStack_4d0 = fVar311 * fStack_1f0 +
                     fVar343 * fVar267 + fVar356 * fVar327 + fVar310 * fStack_690;
        fStack_4cc = fVar318 * fStack_1ec +
                     fVar349 * fVar332 + fVar362 * fVar235 + fVar145 * fStack_68c;
        fStack_4c8 = fVar319 * fStack_1e8 +
                     fVar352 * fVar236 + fVar363 * fVar329 + fVar162 * fStack_688;
        fStack_4c4 = fStack_3e4 + fVar192 + local_220._28_4_ + auVar283._28_4_;
        fVar192 = *(float *)(bezier_basis0 + lVar24 + 0x1210);
        fVar350 = *(float *)(bezier_basis0 + lVar24 + 0x1214);
        fVar209 = *(float *)(bezier_basis0 + lVar24 + 0x1218);
        fVar265 = *(float *)(bezier_basis0 + lVar24 + 0x121c);
        fVar211 = *(float *)(bezier_basis0 + lVar24 + 0x1220);
        fVar225 = *(float *)(bezier_basis0 + lVar24 + 0x1224);
        fVar227 = *(float *)(bezier_basis0 + lVar24 + 0x1228);
        fVar229 = *(float *)(bezier_basis0 + lVar24 + 0x1694);
        fVar237 = *(float *)(bezier_basis0 + lVar24 + 0x1698);
        fVar247 = *(float *)(bezier_basis0 + lVar24 + 0x169c);
        fVar248 = *(float *)(bezier_basis0 + lVar24 + 0x16a0);
        fVar249 = *(float *)(bezier_basis0 + lVar24 + 0x16a4);
        fVar253 = *(float *)(bezier_basis0 + lVar24 + 0x16a8);
        fVar262 = *(float *)(bezier_basis0 + lVar24 + 0x16ac);
        fVar263 = *(float *)(bezier_basis0 + lVar24 + 0x1b18);
        fVar264 = *(float *)(bezier_basis0 + lVar24 + 0x1b1c);
        fVar325 = *(float *)(bezier_basis0 + lVar24 + 0x1b20);
        fVar231 = *(float *)(bezier_basis0 + lVar24 + 0x1b24);
        fVar327 = *(float *)(bezier_basis0 + lVar24 + 0x1b28);
        fVar235 = *(float *)(bezier_basis0 + lVar24 + 0x1b2c);
        fVar329 = *(float *)(bezier_basis0 + lVar24 + 0x1b30);
        fVar266 = *(float *)(bezier_basis0 + lVar24 + 0x1f9c);
        fVar330 = *(float *)(bezier_basis0 + lVar24 + 0x1fa0);
        fVar234 = *(float *)(bezier_basis0 + lVar24 + 0x1fa4);
        fVar331 = *(float *)(bezier_basis0 + lVar24 + 0x1fa8);
        fVar267 = *(float *)(bezier_basis0 + lVar24 + 0x1fac);
        fVar332 = *(float *)(bezier_basis0 + lVar24 + 0x1fb0);
        fVar236 = *(float *)(bezier_basis0 + lVar24 + 0x1fb4);
        fVar161 = *(float *)(bezier_basis1 + lVar24 + 0x4a0) + 0.0;
        fVar252 = *(float *)(bezier_basis0 + lVar24 + 0x1b34) +
                  *(float *)(bezier_basis0 + lVar24 + 0x1fb8);
        fVar163 = *(float *)(bezier_basis0 + lVar24 + 0x16b0) + fVar252;
        local_520 = fVar305 * fVar192 + fVar193 * fVar229 + fVar173 * fVar263 + fVar342 * fVar266;
        fStack_51c = fVar307 * fVar350 + fVar274 * fVar237 + fVar189 * fVar264 + fVar348 * fVar330;
        fStack_518 = fVar308 * fVar209 + fVar304 * fVar247 + fVar190 * fVar325 + fVar351 * fVar234;
        fStack_514 = fVar309 * fVar265 + fVar306 * fVar248 + fVar191 * fVar231 + fVar353 * fVar331;
        fStack_510 = fVar305 * fVar211 + fVar193 * fVar249 + fVar173 * fVar327 + fVar342 * fVar267;
        fStack_50c = fVar307 * fVar225 + fVar274 * fVar253 + fVar189 * fVar235 + fVar348 * fVar332;
        fStack_508 = fVar308 * fVar227 + fVar304 * fVar262 + fVar190 * fVar329 + fVar351 * fVar236;
        fStack_504 = *(float *)(bezier_basis0 + lVar24 + 0x16b0) +
                     *(float *)(bezier_basis0 + lVar24 + 0x1fb8) + fVar161;
        auVar178._0_4_ =
             fVar165 * fVar192 + fVar365 * fVar229 + fVar194 * fVar263 + fVar321 * fVar266;
        auVar178._4_4_ =
             fVar168 * fVar350 + fVar368 * fVar237 + fVar207 * fVar264 + fVar324 * fVar330;
        auVar178._8_4_ =
             fVar171 * fVar209 + fVar369 * fVar247 + fVar208 * fVar325 + fVar326 * fVar234;
        auVar178._12_4_ =
             fVar172 * fVar265 + fVar370 * fVar248 + fVar210 * fVar231 + fVar328 * fVar331;
        auVar178._16_4_ =
             fVar165 * fVar211 + fVar365 * fVar249 + fVar194 * fVar327 + fVar321 * fVar267;
        auVar178._20_4_ =
             fVar168 * fVar225 + fVar368 * fVar253 + fVar207 * fVar235 + fVar324 * fVar332;
        auVar178._24_4_ =
             fVar171 * fVar227 + fVar369 * fVar262 + fVar208 * fVar329 + fVar326 * fVar236;
        auVar178._28_4_ = fVar252 + fVar161 + *(float *)(bezier_basis1 + lVar24 + 0x1c) + 0.0;
        auVar256._0_4_ =
             fVar311 * fVar192 + fVar343 * fVar229 + fVar356 * fVar263 + fVar310 * fVar266;
        auVar256._4_4_ =
             fVar318 * fVar350 + fVar349 * fVar237 + fVar362 * fVar264 + fVar145 * fVar330;
        auVar256._8_4_ =
             fVar319 * fVar209 + fVar352 * fVar247 + fVar363 * fVar325 + fVar162 * fVar234;
        auVar256._12_4_ =
             fVar320 * fVar265 + fVar354 * fVar248 + fVar364 * fVar231 + fVar250 * fVar331;
        auVar256._16_4_ =
             fVar311 * fVar211 + fVar343 * fVar249 + fVar356 * fVar327 + fVar310 * fVar267;
        auVar256._20_4_ =
             fVar318 * fVar225 + fVar349 * fVar253 + fVar362 * fVar235 + fVar145 * fVar332;
        auVar256._24_4_ =
             fVar319 * fVar227 + fVar352 * fVar262 + fVar363 * fVar329 + fVar162 * fVar236;
        auVar256._28_4_ = *(float *)(bezier_basis0 + lVar24 + 0x122c) + fVar163;
        fVar192 = *(float *)(bezier_basis1 + lVar24 + 0x1b18);
        fVar350 = *(float *)(bezier_basis1 + lVar24 + 0x1b1c);
        fVar209 = *(float *)(bezier_basis1 + lVar24 + 0x1b20);
        fVar265 = *(float *)(bezier_basis1 + lVar24 + 0x1b24);
        fVar211 = *(float *)(bezier_basis1 + lVar24 + 0x1b28);
        fVar225 = *(float *)(bezier_basis1 + lVar24 + 0x1b2c);
        fVar227 = *(float *)(bezier_basis1 + lVar24 + 0x1b30);
        fVar229 = *(float *)(bezier_basis1 + lVar24 + 0x1f9c);
        fVar237 = *(float *)(bezier_basis1 + lVar24 + 0x1fa0);
        fVar247 = *(float *)(bezier_basis1 + lVar24 + 0x1fa4);
        fVar248 = *(float *)(bezier_basis1 + lVar24 + 0x1fa8);
        fVar249 = *(float *)(bezier_basis1 + lVar24 + 0x1fac);
        fVar253 = *(float *)(bezier_basis1 + lVar24 + 0x1fb0);
        fVar262 = *(float *)(bezier_basis1 + lVar24 + 0x1fb4);
        fVar263 = *(float *)(bezier_basis1 + lVar24 + 0x1694);
        fVar264 = *(float *)(bezier_basis1 + lVar24 + 0x1698);
        fVar325 = *(float *)(bezier_basis1 + lVar24 + 0x169c);
        fVar231 = *(float *)(bezier_basis1 + lVar24 + 0x16a0);
        fVar327 = *(float *)(bezier_basis1 + lVar24 + 0x16a4);
        fVar235 = *(float *)(bezier_basis1 + lVar24 + 0x16a8);
        fVar329 = *(float *)(bezier_basis1 + lVar24 + 0x16ac);
        fVar266 = *(float *)(bezier_basis1 + lVar24 + 0x1210);
        fVar330 = *(float *)(bezier_basis1 + lVar24 + 0x1214);
        fVar234 = *(float *)(bezier_basis1 + lVar24 + 0x1218);
        fVar331 = *(float *)(bezier_basis1 + lVar24 + 0x121c);
        fVar267 = *(float *)(bezier_basis1 + lVar24 + 0x1220);
        fVar332 = *(float *)(bezier_basis1 + lVar24 + 0x1224);
        fVar236 = *(float *)(bezier_basis1 + lVar24 + 0x1228);
        auVar270._0_4_ =
             fVar266 * fVar305 + fVar193 * fVar263 + fVar173 * fVar192 + fVar342 * fVar229;
        auVar270._4_4_ =
             fVar330 * fVar307 + fVar274 * fVar264 + fVar189 * fVar350 + fVar348 * fVar237;
        auVar270._8_4_ =
             fVar234 * fVar308 + fVar304 * fVar325 + fVar190 * fVar209 + fVar351 * fVar247;
        auVar270._12_4_ =
             fVar331 * fVar309 + fVar306 * fVar231 + fVar191 * fVar265 + fVar353 * fVar248;
        auVar270._16_4_ =
             fVar267 * fVar305 + fVar193 * fVar327 + fVar173 * fVar211 + fVar342 * fVar249;
        auVar270._20_4_ =
             fVar332 * fVar307 + fVar274 * fVar235 + fVar189 * fVar225 + fVar348 * fVar253;
        auVar270._24_4_ =
             fVar236 * fVar308 + fVar304 * fVar329 + fVar190 * fVar227 + fVar351 * fVar262;
        auVar270._28_4_ = fVar210 + fVar210 + fVar309 + fVar163;
        auVar301._0_4_ =
             fVar165 * fVar266 + fVar365 * fVar263 + fVar194 * fVar192 + fVar321 * fVar229;
        auVar301._4_4_ =
             fVar168 * fVar330 + fVar368 * fVar264 + fVar207 * fVar350 + fVar324 * fVar237;
        auVar301._8_4_ =
             fVar171 * fVar234 + fVar369 * fVar325 + fVar208 * fVar209 + fVar326 * fVar247;
        auVar301._12_4_ =
             fVar172 * fVar331 + fVar370 * fVar231 + fVar210 * fVar265 + fVar328 * fVar248;
        auVar301._16_4_ =
             fVar165 * fVar267 + fVar365 * fVar327 + fVar194 * fVar211 + fVar321 * fVar249;
        auVar301._20_4_ =
             fVar168 * fVar332 + fVar368 * fVar235 + fVar207 * fVar225 + fVar324 * fVar253;
        auVar301._24_4_ =
             fVar171 * fVar236 + fVar369 * fVar329 + fVar208 * fVar227 + fVar326 * fVar262;
        auVar301._28_4_ = fVar210 + fVar210 + fVar210 + fVar309;
        _local_660 = auVar313;
        auVar205._0_4_ =
             fVar311 * fVar266 + fVar343 * fVar263 + fVar356 * fVar192 + fVar229 * fVar310;
        auVar205._4_4_ =
             fVar318 * fVar330 + fVar349 * fVar264 + fVar362 * fVar350 + fVar237 * fVar145;
        auVar205._8_4_ =
             fVar319 * fVar234 + fVar352 * fVar325 + fVar363 * fVar209 + fVar247 * fVar162;
        auVar205._12_4_ =
             fVar320 * fVar331 + fVar354 * fVar231 + fVar364 * fVar265 + fVar248 * fVar250;
        auVar205._16_4_ =
             fVar311 * fVar267 + fVar343 * fVar327 + fVar356 * fVar211 + fVar249 * fVar310;
        auVar205._20_4_ =
             fVar318 * fVar332 + fVar349 * fVar235 + fVar362 * fVar225 + fVar253 * fVar145;
        auVar205._24_4_ =
             fVar319 * fVar236 + fVar352 * fVar329 + fVar363 * fVar227 + fVar262 * fVar162;
        auVar205._28_4_ =
             *(float *)(bezier_basis1 + lVar24 + 0x122c) +
             *(float *)(bezier_basis1 + lVar24 + 0x16b0) +
             *(float *)(bezier_basis1 + lVar24 + 0x1b34) +
             *(float *)(bezier_basis1 + lVar24 + 0x1fb8);
        auVar243._8_4_ = 0x7fffffff;
        auVar243._0_8_ = 0x7fffffff7fffffff;
        auVar243._12_4_ = 0x7fffffff;
        auVar243._16_4_ = 0x7fffffff;
        auVar243._20_4_ = 0x7fffffff;
        auVar243._24_4_ = 0x7fffffff;
        auVar243._28_4_ = 0x7fffffff;
        auVar125._4_4_ = fStack_51c;
        auVar125._0_4_ = local_520;
        auVar125._8_4_ = fStack_518;
        auVar125._12_4_ = fStack_514;
        auVar125._16_4_ = fStack_510;
        auVar125._20_4_ = fStack_50c;
        auVar125._24_4_ = fStack_508;
        auVar125._28_4_ = fStack_504;
        auVar184 = vandps_avx(auVar125,auVar243);
        auVar283 = vandps_avx(auVar178,auVar243);
        auVar283 = vmaxps_avx(auVar184,auVar283);
        auVar184 = vandps_avx(auVar256,auVar243);
        auVar184 = vmaxps_avx(auVar283,auVar184);
        auVar255 = vpermilps_avx(auVar255,0);
        auVar257._16_16_ = auVar255;
        auVar257._0_16_ = auVar255;
        auVar184 = vcmpps_avx(auVar184,auVar257,1);
        auVar39 = vblendvps_avx(auVar125,auVar260,auVar184);
        auVar25 = vblendvps_avx(auVar178,auVar34,auVar184);
        auVar184 = vandps_avx(auVar270,auVar243);
        auVar283 = vandps_avx(auVar301,auVar243);
        auVar219 = vmaxps_avx(auVar184,auVar283);
        auVar184 = vandps_avx(auVar205,auVar243);
        auVar184 = vmaxps_avx(auVar219,auVar184);
        auVar219 = vcmpps_avx(auVar184,auVar257,1);
        auVar184 = vblendvps_avx(auVar270,auVar260,auVar219);
        auVar260 = vblendvps_avx(auVar301,auVar34,auVar219);
        fVar161 = auVar39._0_4_;
        fVar163 = auVar39._4_4_;
        fVar164 = auVar39._8_4_;
        fVar166 = auVar39._12_4_;
        fVar167 = auVar39._16_4_;
        fVar170 = auVar39._20_4_;
        fVar169 = auVar39._24_4_;
        fVar251 = -auVar39._28_4_;
        fVar212 = auVar184._0_4_;
        fVar226 = auVar184._4_4_;
        fVar228 = auVar184._8_4_;
        fVar230 = auVar184._12_4_;
        fVar232 = auVar184._16_4_;
        fVar233 = auVar184._20_4_;
        fVar299 = auVar184._24_4_;
        fVar192 = auVar25._0_4_;
        fVar211 = auVar25._4_4_;
        fVar237 = auVar25._8_4_;
        fVar253 = auVar25._12_4_;
        fVar325 = auVar25._16_4_;
        fVar329 = auVar25._20_4_;
        fVar331 = auVar25._24_4_;
        auVar152._0_4_ = fVar192 * fVar192 + fVar161 * fVar161;
        auVar152._4_4_ = fVar211 * fVar211 + fVar163 * fVar163;
        auVar152._8_4_ = fVar237 * fVar237 + fVar164 * fVar164;
        auVar152._12_4_ = fVar253 * fVar253 + fVar166 * fVar166;
        auVar152._16_4_ = fVar325 * fVar325 + fVar167 * fVar167;
        auVar152._20_4_ = fVar329 * fVar329 + fVar170 * fVar170;
        auVar152._24_4_ = fVar331 * fVar331 + fVar169 * fVar169;
        auVar152._28_4_ = auVar301._28_4_ + auVar39._28_4_;
        auVar34 = vrsqrtps_avx(auVar152);
        fVar350 = auVar34._0_4_;
        fVar209 = auVar34._4_4_;
        auVar35._4_4_ = fVar209 * 1.5;
        auVar35._0_4_ = fVar350 * 1.5;
        fVar265 = auVar34._8_4_;
        auVar35._8_4_ = fVar265 * 1.5;
        fVar225 = auVar34._12_4_;
        auVar35._12_4_ = fVar225 * 1.5;
        fVar227 = auVar34._16_4_;
        auVar35._16_4_ = fVar227 * 1.5;
        fVar229 = auVar34._20_4_;
        auVar35._20_4_ = fVar229 * 1.5;
        fVar247 = auVar34._24_4_;
        fVar252 = auVar283._28_4_;
        auVar35._24_4_ = fVar247 * 1.5;
        auVar35._28_4_ = fVar252;
        auVar34._4_4_ = fVar209 * fVar209 * fVar209 * auVar152._4_4_ * 0.5;
        auVar34._0_4_ = fVar350 * fVar350 * fVar350 * auVar152._0_4_ * 0.5;
        auVar34._8_4_ = fVar265 * fVar265 * fVar265 * auVar152._8_4_ * 0.5;
        auVar34._12_4_ = fVar225 * fVar225 * fVar225 * auVar152._12_4_ * 0.5;
        auVar34._16_4_ = fVar227 * fVar227 * fVar227 * auVar152._16_4_ * 0.5;
        auVar34._20_4_ = fVar229 * fVar229 * fVar229 * auVar152._20_4_ * 0.5;
        auVar34._24_4_ = fVar247 * fVar247 * fVar247 * auVar152._24_4_ * 0.5;
        auVar34._28_4_ = auVar152._28_4_;
        auVar283 = vsubps_avx(auVar35,auVar34);
        fVar350 = auVar283._0_4_;
        fVar225 = auVar283._4_4_;
        fVar247 = auVar283._8_4_;
        fVar262 = auVar283._12_4_;
        fVar231 = auVar283._16_4_;
        fVar266 = auVar283._20_4_;
        fVar267 = auVar283._24_4_;
        fVar209 = auVar260._0_4_;
        fVar227 = auVar260._4_4_;
        fVar248 = auVar260._8_4_;
        fVar263 = auVar260._12_4_;
        fVar327 = auVar260._16_4_;
        fVar330 = auVar260._20_4_;
        fVar332 = auVar260._24_4_;
        auVar153._0_4_ = fVar209 * fVar209 + fVar212 * fVar212;
        auVar153._4_4_ = fVar227 * fVar227 + fVar226 * fVar226;
        auVar153._8_4_ = fVar248 * fVar248 + fVar228 * fVar228;
        auVar153._12_4_ = fVar263 * fVar263 + fVar230 * fVar230;
        auVar153._16_4_ = fVar327 * fVar327 + fVar232 * fVar232;
        auVar153._20_4_ = fVar330 * fVar330 + fVar233 * fVar233;
        auVar153._24_4_ = fVar332 * fVar332 + fVar299 * fVar299;
        auVar153._28_4_ = auVar184._28_4_ + auVar283._28_4_;
        auVar184 = vrsqrtps_avx(auVar153);
        fVar265 = auVar184._0_4_;
        fVar229 = auVar184._4_4_;
        auVar36._4_4_ = fVar229 * 1.5;
        auVar36._0_4_ = fVar265 * 1.5;
        fVar249 = auVar184._8_4_;
        auVar36._8_4_ = fVar249 * 1.5;
        fVar264 = auVar184._12_4_;
        auVar36._12_4_ = fVar264 * 1.5;
        fVar235 = auVar184._16_4_;
        auVar36._16_4_ = fVar235 * 1.5;
        fVar234 = auVar184._20_4_;
        auVar36._20_4_ = fVar234 * 1.5;
        fVar236 = auVar184._24_4_;
        auVar36._24_4_ = fVar236 * 1.5;
        auVar36._28_4_ = fVar252;
        auVar37._4_4_ = fVar229 * fVar229 * fVar229 * auVar153._4_4_ * 0.5;
        auVar37._0_4_ = fVar265 * fVar265 * fVar265 * auVar153._0_4_ * 0.5;
        auVar37._8_4_ = fVar249 * fVar249 * fVar249 * auVar153._8_4_ * 0.5;
        auVar37._12_4_ = fVar264 * fVar264 * fVar264 * auVar153._12_4_ * 0.5;
        auVar37._16_4_ = fVar235 * fVar235 * fVar235 * auVar153._16_4_ * 0.5;
        auVar37._20_4_ = fVar234 * fVar234 * fVar234 * auVar153._20_4_ * 0.5;
        auVar37._24_4_ = fVar236 * fVar236 * fVar236 * auVar153._24_4_ * 0.5;
        auVar37._28_4_ = auVar153._28_4_;
        auVar184 = vsubps_avx(auVar36,auVar37);
        fVar265 = auVar184._0_4_;
        fVar229 = auVar184._4_4_;
        fVar249 = auVar184._8_4_;
        fVar264 = auVar184._12_4_;
        fVar235 = auVar184._16_4_;
        fVar234 = auVar184._20_4_;
        fVar236 = auVar184._24_4_;
        fVar192 = (float)local_780._0_4_ * fVar192 * fVar350;
        fVar211 = (float)local_780._4_4_ * fVar211 * fVar225;
        auVar38._4_4_ = fVar211;
        auVar38._0_4_ = fVar192;
        fVar237 = fStack_778 * fVar237 * fVar247;
        auVar38._8_4_ = fVar237;
        fVar253 = fStack_774 * fVar253 * fVar262;
        auVar38._12_4_ = fVar253;
        fVar325 = fStack_770 * fVar325 * fVar231;
        auVar38._16_4_ = fVar325;
        fVar329 = fStack_76c * fVar329 * fVar266;
        auVar38._20_4_ = fVar329;
        fVar331 = fStack_768 * fVar331 * fVar267;
        auVar38._24_4_ = fVar331;
        auVar38._28_4_ = fVar252;
        local_6a0._4_4_ = fVar211 + auVar281._4_4_;
        local_6a0._0_4_ = fVar192 + auVar281._0_4_;
        fStack_698 = fVar237 + auVar281._8_4_;
        fStack_694 = fVar253 + auVar281._12_4_;
        fStack_690 = fVar325 + auVar281._16_4_;
        fStack_68c = fVar329 + auVar281._20_4_;
        fStack_688 = fVar331 + auVar281._24_4_;
        fStack_684 = fVar252 + auVar281._28_4_;
        fVar192 = (float)local_780._0_4_ * fVar350 * -fVar161;
        fVar211 = (float)local_780._4_4_ * fVar225 * -fVar163;
        auVar40._4_4_ = fVar211;
        auVar40._0_4_ = fVar192;
        fVar237 = fStack_778 * fVar247 * -fVar164;
        auVar40._8_4_ = fVar237;
        fVar253 = fStack_774 * fVar262 * -fVar166;
        auVar40._12_4_ = fVar253;
        fVar325 = fStack_770 * fVar231 * -fVar167;
        auVar40._16_4_ = fVar325;
        fVar329 = fStack_76c * fVar266 * -fVar170;
        auVar40._20_4_ = fVar329;
        fVar331 = fStack_768 * fVar267 * -fVar169;
        auVar40._24_4_ = fVar331;
        auVar40._28_4_ = fVar251;
        local_500._4_4_ = auVar336._4_4_ + fVar211;
        local_500._0_4_ = auVar336._0_4_ + fVar192;
        fStack_4f8 = auVar336._8_4_ + fVar237;
        fStack_4f4 = auVar336._12_4_ + fVar253;
        fStack_4f0 = auVar336._16_4_ + fVar325;
        fStack_4ec = auVar336._20_4_ + fVar329;
        fStack_4e8 = auVar336._24_4_ + fVar331;
        fStack_4e4 = auVar336._28_4_ + fVar251;
        fVar192 = fVar350 * 0.0 * (float)local_780._0_4_;
        fVar350 = fVar225 * 0.0 * (float)local_780._4_4_;
        auVar41._4_4_ = fVar350;
        auVar41._0_4_ = fVar192;
        fVar211 = fVar247 * 0.0 * fStack_778;
        auVar41._8_4_ = fVar211;
        fVar225 = fVar262 * 0.0 * fStack_774;
        auVar41._12_4_ = fVar225;
        fVar237 = fVar231 * 0.0 * fStack_770;
        auVar41._16_4_ = fVar237;
        fVar247 = fVar266 * 0.0 * fStack_76c;
        auVar41._20_4_ = fVar247;
        fVar253 = fVar267 * 0.0 * fStack_768;
        auVar41._24_4_ = fVar253;
        auVar41._28_4_ = fVar354;
        auVar127._4_4_ = fStack_4dc;
        auVar127._0_4_ = local_4e0;
        auVar127._8_4_ = fStack_4d8;
        auVar127._12_4_ = fStack_4d4;
        auVar127._16_4_ = fStack_4d0;
        auVar127._20_4_ = fStack_4cc;
        auVar127._24_4_ = fStack_4c8;
        auVar127._28_4_ = fStack_4c4;
        auVar271._0_4_ = local_4e0 + fVar192;
        auVar271._4_4_ = fStack_4dc + fVar350;
        auVar271._8_4_ = fStack_4d8 + fVar211;
        auVar271._12_4_ = fStack_4d4 + fVar225;
        auVar271._16_4_ = fStack_4d0 + fVar237;
        auVar271._20_4_ = fStack_4cc + fVar247;
        auVar271._24_4_ = fStack_4c8 + fVar253;
        auVar271._28_4_ = fStack_4c4 + fVar354;
        fVar192 = (float)local_680._0_4_ * fVar209 * fVar265;
        fVar350 = (float)local_680._4_4_ * fVar227 * fVar229;
        auVar42._4_4_ = fVar350;
        auVar42._0_4_ = fVar192;
        fVar209 = fStack_678 * fVar248 * fVar249;
        auVar42._8_4_ = fVar209;
        fVar211 = fStack_674 * fVar263 * fVar264;
        auVar42._12_4_ = fVar211;
        fVar225 = register0x00001450 * fVar327 * fVar235;
        auVar42._16_4_ = fVar225;
        fVar227 = register0x00001454 * fVar330 * fVar234;
        auVar42._20_4_ = fVar227;
        fVar237 = register0x00001458 * fVar332 * fVar236;
        auVar42._24_4_ = fVar237;
        auVar42._28_4_ = auVar260._28_4_;
        auVar39 = vsubps_avx(auVar281,auVar38);
        auVar314._0_4_ = auVar242._0_4_ + fVar192;
        auVar314._4_4_ = auVar242._4_4_ + fVar350;
        auVar314._8_4_ = auVar242._8_4_ + fVar209;
        auVar314._12_4_ = auVar242._12_4_ + fVar211;
        auVar314._16_4_ = auVar242._16_4_ + fVar225;
        auVar314._20_4_ = auVar242._20_4_ + fVar227;
        auVar314._24_4_ = auVar242._24_4_ + fVar237;
        auVar314._28_4_ = auVar242._28_4_ + auVar260._28_4_;
        fVar192 = (float)local_680._0_4_ * fVar265 * -fVar212;
        fVar350 = (float)local_680._4_4_ * fVar229 * -fVar226;
        auVar260._4_4_ = fVar350;
        auVar260._0_4_ = fVar192;
        fVar209 = fStack_678 * fVar249 * -fVar228;
        auVar260._8_4_ = fVar209;
        fVar211 = fStack_674 * fVar264 * -fVar230;
        auVar260._12_4_ = fVar211;
        fVar225 = register0x00001450 * fVar235 * -fVar232;
        auVar260._16_4_ = fVar225;
        fVar227 = register0x00001454 * fVar234 * -fVar233;
        auVar260._20_4_ = fVar227;
        fVar237 = register0x00001458 * fVar236 * -fVar299;
        auVar260._24_4_ = fVar237;
        auVar260._28_4_ = fVar364;
        auVar25 = vsubps_avx(auVar336,auVar40);
        auVar323._0_4_ = fVar192 + (float)local_4c0._0_4_;
        auVar323._4_4_ = fVar350 + (float)local_4c0._4_4_;
        auVar323._8_4_ = fVar209 + fStack_4b8;
        auVar323._12_4_ = fVar211 + fStack_4b4;
        auVar323._16_4_ = fVar225 + fStack_4b0;
        auVar323._20_4_ = fVar227 + fStack_4ac;
        auVar323._24_4_ = fVar237 + fStack_4a8;
        auVar323._28_4_ = fVar364 + fStack_4a4;
        fVar192 = fVar265 * 0.0 * (float)local_680._0_4_;
        fVar350 = fVar229 * 0.0 * (float)local_680._4_4_;
        auVar43._4_4_ = fVar350;
        auVar43._0_4_ = fVar192;
        fVar209 = fVar249 * 0.0 * fStack_678;
        auVar43._8_4_ = fVar209;
        fVar265 = fVar264 * 0.0 * fStack_674;
        auVar43._12_4_ = fVar265;
        fVar211 = fVar235 * 0.0 * register0x00001450;
        auVar43._16_4_ = fVar211;
        fVar225 = fVar234 * 0.0 * register0x00001454;
        auVar43._20_4_ = fVar225;
        fVar227 = fVar236 * 0.0 * register0x00001458;
        auVar43._24_4_ = fVar227;
        auVar43._28_4_ = fVar251;
        auVar219 = vsubps_avx(auVar127,auVar41);
        auVar366._0_4_ = (float)local_400._0_4_ + fVar192;
        auVar366._4_4_ = (float)local_400._4_4_ + fVar350;
        auVar366._8_4_ = fStack_3f8 + fVar209;
        auVar366._12_4_ = fStack_3f4 + fVar265;
        auVar366._16_4_ = fStack_3f0 + fVar211;
        auVar366._20_4_ = fStack_3ec + fVar225;
        auVar366._24_4_ = fStack_3e8 + fVar227;
        auVar366._28_4_ = fStack_3e4 + fVar251;
        auVar184 = vsubps_avx(auVar242,auVar42);
        auVar283 = vsubps_avx(_local_4c0,auVar260);
        auVar260 = vsubps_avx(_local_400,auVar43);
        auVar34 = vsubps_avx(auVar323,auVar25);
        auVar336 = vsubps_avx(auVar366,auVar219);
        auVar44._4_4_ = auVar219._4_4_ * auVar34._4_4_;
        auVar44._0_4_ = auVar219._0_4_ * auVar34._0_4_;
        auVar44._8_4_ = auVar219._8_4_ * auVar34._8_4_;
        auVar44._12_4_ = auVar219._12_4_ * auVar34._12_4_;
        auVar44._16_4_ = auVar219._16_4_ * auVar34._16_4_;
        auVar44._20_4_ = auVar219._20_4_ * auVar34._20_4_;
        auVar44._24_4_ = auVar219._24_4_ * auVar34._24_4_;
        auVar44._28_4_ = fVar364;
        auVar45._4_4_ = auVar25._4_4_ * auVar336._4_4_;
        auVar45._0_4_ = auVar25._0_4_ * auVar336._0_4_;
        auVar45._8_4_ = auVar25._8_4_ * auVar336._8_4_;
        auVar45._12_4_ = auVar25._12_4_ * auVar336._12_4_;
        auVar45._16_4_ = auVar25._16_4_ * auVar336._16_4_;
        auVar45._20_4_ = auVar25._20_4_ * auVar336._20_4_;
        auVar45._24_4_ = auVar25._24_4_ * auVar336._24_4_;
        auVar45._28_4_ = fStack_4a4;
        auVar35 = vsubps_avx(auVar45,auVar44);
        auVar46._4_4_ = auVar39._4_4_ * auVar336._4_4_;
        auVar46._0_4_ = auVar39._0_4_ * auVar336._0_4_;
        auVar46._8_4_ = auVar39._8_4_ * auVar336._8_4_;
        auVar46._12_4_ = auVar39._12_4_ * auVar336._12_4_;
        auVar46._16_4_ = auVar39._16_4_ * auVar336._16_4_;
        auVar46._20_4_ = auVar39._20_4_ * auVar336._20_4_;
        auVar46._24_4_ = auVar39._24_4_ * auVar336._24_4_;
        auVar46._28_4_ = auVar336._28_4_;
        auVar36 = vsubps_avx(auVar314,auVar39);
        auVar47._4_4_ = auVar219._4_4_ * auVar36._4_4_;
        auVar47._0_4_ = auVar219._0_4_ * auVar36._0_4_;
        auVar47._8_4_ = auVar219._8_4_ * auVar36._8_4_;
        auVar47._12_4_ = auVar219._12_4_ * auVar36._12_4_;
        auVar47._16_4_ = auVar219._16_4_ * auVar36._16_4_;
        auVar47._20_4_ = auVar219._20_4_ * auVar36._20_4_;
        auVar47._24_4_ = auVar219._24_4_ * auVar36._24_4_;
        auVar47._28_4_ = auVar242._28_4_;
        auVar242 = vsubps_avx(auVar47,auVar46);
        auVar48._4_4_ = auVar36._4_4_ * auVar25._4_4_;
        auVar48._0_4_ = auVar36._0_4_ * auVar25._0_4_;
        auVar48._8_4_ = auVar36._8_4_ * auVar25._8_4_;
        auVar48._12_4_ = auVar36._12_4_ * auVar25._12_4_;
        auVar48._16_4_ = auVar36._16_4_ * auVar25._16_4_;
        auVar48._20_4_ = auVar36._20_4_ * auVar25._20_4_;
        auVar48._24_4_ = auVar36._24_4_ * auVar25._24_4_;
        auVar48._28_4_ = auVar336._28_4_;
        auVar49._4_4_ = auVar39._4_4_ * auVar34._4_4_;
        auVar49._0_4_ = auVar39._0_4_ * auVar34._0_4_;
        auVar49._8_4_ = auVar39._8_4_ * auVar34._8_4_;
        auVar49._12_4_ = auVar39._12_4_ * auVar34._12_4_;
        auVar49._16_4_ = auVar39._16_4_ * auVar34._16_4_;
        auVar49._20_4_ = auVar39._20_4_ * auVar34._20_4_;
        auVar49._24_4_ = auVar39._24_4_ * auVar34._24_4_;
        auVar49._28_4_ = auVar34._28_4_;
        auVar34 = vsubps_avx(auVar49,auVar48);
        auVar154._0_4_ = auVar35._0_4_ * 0.0 + auVar34._0_4_ + auVar242._0_4_ * 0.0;
        auVar154._4_4_ = auVar35._4_4_ * 0.0 + auVar34._4_4_ + auVar242._4_4_ * 0.0;
        auVar154._8_4_ = auVar35._8_4_ * 0.0 + auVar34._8_4_ + auVar242._8_4_ * 0.0;
        auVar154._12_4_ = auVar35._12_4_ * 0.0 + auVar34._12_4_ + auVar242._12_4_ * 0.0;
        auVar154._16_4_ = auVar35._16_4_ * 0.0 + auVar34._16_4_ + auVar242._16_4_ * 0.0;
        auVar154._20_4_ = auVar35._20_4_ * 0.0 + auVar34._20_4_ + auVar242._20_4_ * 0.0;
        auVar154._24_4_ = auVar35._24_4_ * 0.0 + auVar34._24_4_ + auVar242._24_4_ * 0.0;
        auVar154._28_4_ = auVar34._28_4_ + auVar34._28_4_ + auVar242._28_4_;
        auVar242 = vcmpps_avx(auVar154,ZEXT432(0) << 0x20,2);
        _local_720 = vblendvps_avx(auVar184,_local_6a0,auVar242);
        _local_620 = vblendvps_avx(auVar283,_local_500,auVar242);
        auVar184 = vblendvps_avx(auVar260,auVar271,auVar242);
        auVar283 = vblendvps_avx(auVar39,auVar314,auVar242);
        auVar260 = vblendvps_avx(auVar25,auVar323,auVar242);
        auVar34 = vblendvps_avx(auVar219,auVar366,auVar242);
        auVar39 = vblendvps_avx(auVar314,auVar39,auVar242);
        auVar25 = vblendvps_avx(auVar323,auVar25,auVar242);
        _local_600 = vpackssdw_avx(local_220._0_16_,local_220._16_16_);
        auStack_5f0 = auVar281._16_16_;
        auVar219 = vblendvps_avx(auVar366,auVar219,auVar242);
        auVar39 = vsubps_avx(auVar39,_local_720);
        auVar281 = vsubps_avx(auVar25,_local_620);
        auVar219 = vsubps_avx(auVar219,auVar184);
        auVar336 = vsubps_avx(_local_620,auVar260);
        fVar192 = auVar281._0_4_;
        fVar169 = auVar184._0_4_;
        fVar225 = auVar281._4_4_;
        fVar212 = auVar184._4_4_;
        auVar50._4_4_ = fVar212 * fVar225;
        auVar50._0_4_ = fVar169 * fVar192;
        fVar248 = auVar281._8_4_;
        fVar226 = auVar184._8_4_;
        auVar50._8_4_ = fVar226 * fVar248;
        fVar264 = auVar281._12_4_;
        fVar228 = auVar184._12_4_;
        auVar50._12_4_ = fVar228 * fVar264;
        fVar329 = auVar281._16_4_;
        fVar230 = auVar184._16_4_;
        auVar50._16_4_ = fVar230 * fVar329;
        fVar267 = auVar281._20_4_;
        fVar232 = auVar184._20_4_;
        auVar50._20_4_ = fVar232 * fVar267;
        fVar163 = auVar281._24_4_;
        fVar233 = auVar184._24_4_;
        auVar50._24_4_ = fVar233 * fVar163;
        auVar50._28_4_ = auVar25._28_4_;
        fVar350 = local_620._0_4_;
        fVar298 = auVar219._0_4_;
        fVar227 = local_620._4_4_;
        fVar173 = auVar219._4_4_;
        auVar51._4_4_ = fVar173 * fVar227;
        auVar51._0_4_ = fVar298 * fVar350;
        fVar249 = local_620._8_4_;
        fVar189 = auVar219._8_4_;
        auVar51._8_4_ = fVar189 * fVar249;
        fVar325 = local_620._12_4_;
        fVar190 = auVar219._12_4_;
        auVar51._12_4_ = fVar190 * fVar325;
        fVar266 = local_620._16_4_;
        fVar191 = auVar219._16_4_;
        auVar51._16_4_ = fVar191 * fVar266;
        fVar332 = local_620._20_4_;
        fVar194 = auVar219._20_4_;
        auVar51._20_4_ = fVar194 * fVar332;
        fVar164 = local_620._24_4_;
        fVar207 = auVar219._24_4_;
        auVar51._24_4_ = fVar207 * fVar164;
        auVar51._28_4_ = auVar323._28_4_;
        auVar25 = vsubps_avx(auVar51,auVar50);
        fVar209 = local_720._0_4_;
        fVar229 = local_720._4_4_;
        auVar52._4_4_ = fVar173 * fVar229;
        auVar52._0_4_ = fVar298 * fVar209;
        fVar253 = local_720._8_4_;
        auVar52._8_4_ = fVar189 * fVar253;
        fVar231 = local_720._12_4_;
        auVar52._12_4_ = fVar190 * fVar231;
        fVar330 = local_720._16_4_;
        auVar52._16_4_ = fVar191 * fVar330;
        fVar236 = local_720._20_4_;
        auVar52._20_4_ = fVar194 * fVar236;
        fVar166 = local_720._24_4_;
        auVar52._24_4_ = fVar207 * fVar166;
        auVar52._28_4_ = auVar323._28_4_;
        fVar265 = auVar39._0_4_;
        auVar358._0_4_ = fVar169 * fVar265;
        fVar237 = auVar39._4_4_;
        auVar358._4_4_ = fVar212 * fVar237;
        fVar262 = auVar39._8_4_;
        auVar358._8_4_ = fVar226 * fVar262;
        fVar327 = auVar39._12_4_;
        auVar358._12_4_ = fVar228 * fVar327;
        fVar234 = auVar39._16_4_;
        auVar358._16_4_ = fVar230 * fVar234;
        fVar252 = auVar39._20_4_;
        auVar358._20_4_ = fVar232 * fVar252;
        fVar167 = auVar39._24_4_;
        auVar358._24_4_ = fVar233 * fVar167;
        auVar358._28_4_ = 0;
        auVar35 = vsubps_avx(auVar358,auVar52);
        auVar53._4_4_ = fVar227 * fVar237;
        auVar53._0_4_ = fVar350 * fVar265;
        auVar53._8_4_ = fVar249 * fVar262;
        auVar53._12_4_ = fVar325 * fVar327;
        auVar53._16_4_ = fVar266 * fVar234;
        auVar53._20_4_ = fVar332 * fVar252;
        auVar53._24_4_ = fVar164 * fVar167;
        auVar53._28_4_ = auVar323._28_4_;
        auVar54._4_4_ = fVar229 * fVar225;
        auVar54._0_4_ = fVar209 * fVar192;
        auVar54._8_4_ = fVar253 * fVar248;
        auVar54._12_4_ = fVar231 * fVar264;
        auVar54._16_4_ = fVar330 * fVar329;
        auVar54._20_4_ = fVar236 * fVar267;
        auVar54._24_4_ = fVar166 * fVar163;
        auVar54._28_4_ = auVar366._28_4_;
        auVar36 = vsubps_avx(auVar54,auVar53);
        auVar37 = vsubps_avx(auVar184,auVar34);
        fVar211 = auVar36._28_4_ + auVar35._28_4_;
        auVar179._0_4_ = auVar36._0_4_ + auVar35._0_4_ * 0.0 + auVar25._0_4_ * 0.0;
        auVar179._4_4_ = auVar36._4_4_ + auVar35._4_4_ * 0.0 + auVar25._4_4_ * 0.0;
        auVar179._8_4_ = auVar36._8_4_ + auVar35._8_4_ * 0.0 + auVar25._8_4_ * 0.0;
        auVar179._12_4_ = auVar36._12_4_ + auVar35._12_4_ * 0.0 + auVar25._12_4_ * 0.0;
        auVar179._16_4_ = auVar36._16_4_ + auVar35._16_4_ * 0.0 + auVar25._16_4_ * 0.0;
        auVar179._20_4_ = auVar36._20_4_ + auVar35._20_4_ * 0.0 + auVar25._20_4_ * 0.0;
        auVar179._24_4_ = auVar36._24_4_ + auVar35._24_4_ * 0.0 + auVar25._24_4_ * 0.0;
        auVar179._28_4_ = fVar211 + auVar25._28_4_;
        fVar299 = auVar336._0_4_;
        fVar251 = auVar336._4_4_;
        auVar55._4_4_ = fVar251 * auVar34._4_4_;
        auVar55._0_4_ = fVar299 * auVar34._0_4_;
        fVar293 = auVar336._8_4_;
        auVar55._8_4_ = fVar293 * auVar34._8_4_;
        fVar294 = auVar336._12_4_;
        auVar55._12_4_ = fVar294 * auVar34._12_4_;
        fVar295 = auVar336._16_4_;
        auVar55._16_4_ = fVar295 * auVar34._16_4_;
        fVar296 = auVar336._20_4_;
        auVar55._20_4_ = fVar296 * auVar34._20_4_;
        fVar297 = auVar336._24_4_;
        auVar55._24_4_ = fVar297 * auVar34._24_4_;
        auVar55._28_4_ = fVar211;
        fVar211 = auVar37._0_4_;
        fVar247 = auVar37._4_4_;
        auVar56._4_4_ = auVar260._4_4_ * fVar247;
        auVar56._0_4_ = auVar260._0_4_ * fVar211;
        fVar263 = auVar37._8_4_;
        auVar56._8_4_ = auVar260._8_4_ * fVar263;
        fVar235 = auVar37._12_4_;
        auVar56._12_4_ = auVar260._12_4_ * fVar235;
        fVar331 = auVar37._16_4_;
        auVar56._16_4_ = auVar260._16_4_ * fVar331;
        fVar161 = auVar37._20_4_;
        auVar56._20_4_ = auVar260._20_4_ * fVar161;
        fVar170 = auVar37._24_4_;
        auVar56._24_4_ = auVar260._24_4_ * fVar170;
        auVar56._28_4_ = auVar36._28_4_;
        auVar336 = vsubps_avx(auVar56,auVar55);
        auVar35 = vsubps_avx(_local_720,auVar283);
        fVar208 = auVar35._0_4_;
        fVar210 = auVar35._4_4_;
        auVar57._4_4_ = fVar210 * auVar34._4_4_;
        auVar57._0_4_ = fVar208 * auVar34._0_4_;
        fVar305 = auVar35._8_4_;
        auVar57._8_4_ = fVar305 * auVar34._8_4_;
        fVar307 = auVar35._12_4_;
        auVar57._12_4_ = fVar307 * auVar34._12_4_;
        fVar308 = auVar35._16_4_;
        auVar57._16_4_ = fVar308 * auVar34._16_4_;
        fVar309 = auVar35._20_4_;
        auVar57._20_4_ = fVar309 * auVar34._20_4_;
        fVar310 = auVar35._24_4_;
        auVar57._24_4_ = fVar310 * auVar34._24_4_;
        auVar57._28_4_ = auVar34._28_4_;
        auVar58._4_4_ = auVar283._4_4_ * fVar247;
        auVar58._0_4_ = auVar283._0_4_ * fVar211;
        auVar58._8_4_ = auVar283._8_4_ * fVar263;
        auVar58._12_4_ = auVar283._12_4_ * fVar235;
        auVar58._16_4_ = auVar283._16_4_ * fVar331;
        auVar58._20_4_ = auVar283._20_4_ * fVar161;
        auVar58._24_4_ = auVar283._24_4_ * fVar170;
        auVar58._28_4_ = auVar25._28_4_;
        auVar25 = vsubps_avx(auVar57,auVar58);
        auVar59._4_4_ = auVar260._4_4_ * fVar210;
        auVar59._0_4_ = auVar260._0_4_ * fVar208;
        auVar59._8_4_ = auVar260._8_4_ * fVar305;
        auVar59._12_4_ = auVar260._12_4_ * fVar307;
        auVar59._16_4_ = auVar260._16_4_ * fVar308;
        auVar59._20_4_ = auVar260._20_4_ * fVar309;
        auVar59._24_4_ = auVar260._24_4_ * fVar310;
        auVar59._28_4_ = auVar34._28_4_;
        auVar60._4_4_ = auVar283._4_4_ * fVar251;
        auVar60._0_4_ = auVar283._0_4_ * fVar299;
        auVar60._8_4_ = auVar283._8_4_ * fVar293;
        auVar60._12_4_ = auVar283._12_4_ * fVar294;
        auVar60._16_4_ = auVar283._16_4_ * fVar295;
        auVar60._20_4_ = auVar283._20_4_ * fVar296;
        auVar60._24_4_ = auVar283._24_4_ * fVar297;
        auVar60._28_4_ = auVar283._28_4_;
        auVar283 = vsubps_avx(auVar60,auVar59);
        auVar244._0_4_ = auVar336._0_4_ * 0.0 + auVar283._0_4_ + auVar25._0_4_ * 0.0;
        auVar244._4_4_ = auVar336._4_4_ * 0.0 + auVar283._4_4_ + auVar25._4_4_ * 0.0;
        auVar244._8_4_ = auVar336._8_4_ * 0.0 + auVar283._8_4_ + auVar25._8_4_ * 0.0;
        auVar244._12_4_ = auVar336._12_4_ * 0.0 + auVar283._12_4_ + auVar25._12_4_ * 0.0;
        auVar244._16_4_ = auVar336._16_4_ * 0.0 + auVar283._16_4_ + auVar25._16_4_ * 0.0;
        auVar244._20_4_ = auVar336._20_4_ * 0.0 + auVar283._20_4_ + auVar25._20_4_ * 0.0;
        auVar244._24_4_ = auVar336._24_4_ * 0.0 + auVar283._24_4_ + auVar25._24_4_ * 0.0;
        auVar244._28_4_ = auVar283._28_4_ + auVar283._28_4_ + auVar25._28_4_;
        auVar283 = vmaxps_avx(auVar179,auVar244);
        auVar283 = vcmpps_avx(auVar283,ZEXT832(0) << 0x20,2);
        auVar255 = vpackssdw_avx(auVar283._0_16_,auVar283._16_16_);
        auVar255 = vpand_avx(auVar255,_local_600);
        auVar201 = vpmovsxwd_avx(auVar255);
        auVar241 = vpunpckhwd_avx(auVar255,auVar255);
        auVar220._16_16_ = auVar241;
        auVar220._0_16_ = auVar201;
        if ((((((((auVar220 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar220 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar220 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar220 >> 0x7f,0) == '\0') &&
              (auVar220 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB161(auVar241 >> 0x3f,0) == '\0') &&
            (auVar220 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar241[0xf]) {
LAB_0104a972:
          auVar224 = ZEXT3264(auVar220);
          auVar188 = ZEXT3264(CONCAT824(local_460[1]._24_8_,
                                        CONCAT816(local_460[1]._16_8_,
                                                  CONCAT88(local_460[1]._8_8_,local_460[1]._0_8_))))
          ;
          auVar160 = ZEXT3264(local_480);
          auVar360 = ZEXT3264(local_4a0);
        }
        else {
          auVar61._4_4_ = fVar247 * fVar225;
          auVar61._0_4_ = fVar211 * fVar192;
          auVar61._8_4_ = fVar263 * fVar248;
          auVar61._12_4_ = fVar235 * fVar264;
          auVar61._16_4_ = fVar331 * fVar329;
          auVar61._20_4_ = fVar161 * fVar267;
          auVar61._24_4_ = fVar170 * fVar163;
          auVar61._28_4_ = auVar241._12_4_;
          auVar337._0_4_ = fVar299 * fVar298;
          auVar337._4_4_ = fVar251 * fVar173;
          auVar337._8_4_ = fVar293 * fVar189;
          auVar337._12_4_ = fVar294 * fVar190;
          auVar337._16_4_ = fVar295 * fVar191;
          auVar337._20_4_ = fVar296 * fVar194;
          auVar337._24_4_ = fVar297 * fVar207;
          auVar337._28_4_ = 0;
          auVar283 = vsubps_avx(auVar337,auVar61);
          auVar62._4_4_ = fVar210 * fVar173;
          auVar62._0_4_ = fVar208 * fVar298;
          auVar62._8_4_ = fVar305 * fVar189;
          auVar62._12_4_ = fVar307 * fVar190;
          auVar62._16_4_ = fVar308 * fVar191;
          auVar62._20_4_ = fVar309 * fVar194;
          auVar62._24_4_ = fVar310 * fVar207;
          auVar62._28_4_ = auVar219._28_4_;
          auVar63._4_4_ = fVar247 * fVar237;
          auVar63._0_4_ = fVar211 * fVar265;
          auVar63._8_4_ = fVar263 * fVar262;
          auVar63._12_4_ = fVar235 * fVar327;
          auVar63._16_4_ = fVar331 * fVar234;
          auVar63._20_4_ = fVar161 * fVar252;
          auVar63._24_4_ = fVar170 * fVar167;
          auVar63._28_4_ = auVar37._28_4_;
          auVar34 = vsubps_avx(auVar63,auVar62);
          auVar64._4_4_ = fVar251 * fVar237;
          auVar64._0_4_ = fVar299 * fVar265;
          auVar64._8_4_ = fVar293 * fVar262;
          auVar64._12_4_ = fVar294 * fVar327;
          auVar64._16_4_ = fVar295 * fVar234;
          auVar64._20_4_ = fVar296 * fVar252;
          auVar64._24_4_ = fVar297 * fVar167;
          auVar64._28_4_ = auVar179._28_4_;
          auVar65._4_4_ = fVar210 * fVar225;
          auVar65._0_4_ = fVar208 * fVar192;
          auVar65._8_4_ = fVar305 * fVar248;
          auVar65._12_4_ = fVar307 * fVar264;
          auVar65._16_4_ = fVar308 * fVar329;
          auVar65._20_4_ = fVar309 * fVar267;
          auVar65._24_4_ = fVar310 * fVar163;
          auVar65._28_4_ = auVar281._28_4_;
          auVar25 = vsubps_avx(auVar65,auVar64);
          auVar282._0_4_ = auVar283._0_4_ * 0.0 + auVar25._0_4_ + auVar34._0_4_ * 0.0;
          auVar282._4_4_ = auVar283._4_4_ * 0.0 + auVar25._4_4_ + auVar34._4_4_ * 0.0;
          auVar282._8_4_ = auVar283._8_4_ * 0.0 + auVar25._8_4_ + auVar34._8_4_ * 0.0;
          auVar282._12_4_ = auVar283._12_4_ * 0.0 + auVar25._12_4_ + auVar34._12_4_ * 0.0;
          auVar282._16_4_ = auVar283._16_4_ * 0.0 + auVar25._16_4_ + auVar34._16_4_ * 0.0;
          auVar282._20_4_ = auVar283._20_4_ * 0.0 + auVar25._20_4_ + auVar34._20_4_ * 0.0;
          auVar282._24_4_ = auVar283._24_4_ * 0.0 + auVar25._24_4_ + auVar34._24_4_ * 0.0;
          auVar282._28_4_ = auVar281._28_4_ + auVar25._28_4_ + auVar179._28_4_;
          auVar260 = vrcpps_avx(auVar282);
          fVar265 = auVar260._0_4_;
          fVar211 = auVar260._4_4_;
          auVar66._4_4_ = auVar282._4_4_ * fVar211;
          auVar66._0_4_ = auVar282._0_4_ * fVar265;
          fVar225 = auVar260._8_4_;
          auVar66._8_4_ = auVar282._8_4_ * fVar225;
          fVar237 = auVar260._12_4_;
          auVar66._12_4_ = auVar282._12_4_ * fVar237;
          fVar247 = auVar260._16_4_;
          auVar66._16_4_ = auVar282._16_4_ * fVar247;
          fVar248 = auVar260._20_4_;
          auVar66._20_4_ = auVar282._20_4_ * fVar248;
          fVar262 = auVar260._24_4_;
          auVar66._24_4_ = auVar282._24_4_ * fVar262;
          auVar66._28_4_ = auVar37._28_4_;
          auVar338._8_4_ = 0x3f800000;
          auVar338._0_8_ = &DAT_3f8000003f800000;
          auVar338._12_4_ = 0x3f800000;
          auVar338._16_4_ = 0x3f800000;
          auVar338._20_4_ = 0x3f800000;
          auVar338._24_4_ = 0x3f800000;
          auVar338._28_4_ = 0x3f800000;
          auVar219 = vsubps_avx(auVar338,auVar66);
          fVar265 = auVar219._0_4_ * fVar265 + fVar265;
          fVar211 = auVar219._4_4_ * fVar211 + fVar211;
          fVar225 = auVar219._8_4_ * fVar225 + fVar225;
          fVar237 = auVar219._12_4_ * fVar237 + fVar237;
          fVar247 = auVar219._16_4_ * fVar247 + fVar247;
          fVar248 = auVar219._20_4_ * fVar248 + fVar248;
          fVar262 = auVar219._24_4_ * fVar262 + fVar262;
          auVar67._4_4_ =
               (auVar283._4_4_ * fVar229 + auVar34._4_4_ * fVar227 + auVar25._4_4_ * fVar212) *
               fVar211;
          auVar67._0_4_ =
               (auVar283._0_4_ * fVar209 + auVar34._0_4_ * fVar350 + auVar25._0_4_ * fVar169) *
               fVar265;
          auVar67._8_4_ =
               (auVar283._8_4_ * fVar253 + auVar34._8_4_ * fVar249 + auVar25._8_4_ * fVar226) *
               fVar225;
          auVar67._12_4_ =
               (auVar283._12_4_ * fVar231 + auVar34._12_4_ * fVar325 + auVar25._12_4_ * fVar228) *
               fVar237;
          auVar67._16_4_ =
               (auVar283._16_4_ * fVar330 + auVar34._16_4_ * fVar266 + auVar25._16_4_ * fVar230) *
               fVar247;
          auVar67._20_4_ =
               (auVar283._20_4_ * fVar236 + auVar34._20_4_ * fVar332 + auVar25._20_4_ * fVar232) *
               fVar248;
          auVar67._24_4_ =
               (auVar283._24_4_ * fVar166 + auVar34._24_4_ * fVar164 + auVar25._24_4_ * fVar233) *
               fVar262;
          auVar67._28_4_ = local_720._28_4_ + auVar39._28_4_ + auVar184._28_4_;
          auVar201 = vpermilps_avx(ZEXT416((uint)local_740),0);
          auVar221._16_16_ = auVar201;
          auVar221._0_16_ = auVar201;
          auVar184 = vcmpps_avx(auVar221,auVar67,2);
          fVar192 = (ray->super_RayK<1>).tfar;
          auVar258._4_4_ = fVar192;
          auVar258._0_4_ = fVar192;
          auVar258._8_4_ = fVar192;
          auVar258._12_4_ = fVar192;
          auVar258._16_4_ = fVar192;
          auVar258._20_4_ = fVar192;
          auVar258._24_4_ = fVar192;
          auVar258._28_4_ = fVar192;
          auVar283 = vcmpps_avx(auVar67,auVar258,2);
          auVar184 = vandps_avx(auVar283,auVar184);
          auVar201 = vpackssdw_avx(auVar184._0_16_,auVar184._16_16_);
          auVar255 = vpand_avx(auVar255,auVar201);
          auVar201 = vpmovsxwd_avx(auVar255);
          auVar241 = vpshufd_avx(auVar255,0xee);
          auVar241 = vpmovsxwd_avx(auVar241);
          auVar220._16_16_ = auVar241;
          auVar220._0_16_ = auVar201;
          if ((((((((auVar220 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar220 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar220 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar220 >> 0x7f,0) == '\0') &&
                (auVar220 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB161(auVar241 >> 0x3f,0) == '\0') &&
              (auVar220 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar241[0xf]) goto LAB_0104a972;
          auVar184 = vcmpps_avx(ZEXT832(0) << 0x20,auVar282,4);
          auVar201 = vpackssdw_avx(auVar184._0_16_,auVar184._16_16_);
          auVar255 = vpand_avx(auVar255,auVar201);
          auVar201 = vpmovsxwd_avx(auVar255);
          auVar255 = vpunpckhwd_avx(auVar255,auVar255);
          auVar224 = ZEXT1664(auVar255);
          auVar272._16_16_ = auVar255;
          auVar272._0_16_ = auVar201;
          auVar188 = ZEXT3264(CONCAT824(local_460[1]._24_8_,
                                        CONCAT816(local_460[1]._16_8_,
                                                  CONCAT88(local_460[1]._8_8_,local_460[1]._0_8_))))
          ;
          auVar160 = ZEXT3264(local_480);
          auVar360 = ZEXT3264(local_4a0);
          if ((((((((auVar272 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar272 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar272 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar272 >> 0x7f,0) != '\0') ||
                (auVar272 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB161(auVar255 >> 0x3f,0) != '\0') ||
              (auVar272 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar255[0xf] < '\0') {
            auVar222._0_4_ = auVar179._0_4_ * fVar265;
            auVar222._4_4_ = auVar179._4_4_ * fVar211;
            auVar222._8_4_ = auVar179._8_4_ * fVar225;
            auVar222._12_4_ = auVar179._12_4_ * fVar237;
            auVar222._16_4_ = auVar179._16_4_ * fVar247;
            auVar222._20_4_ = auVar179._20_4_ * fVar248;
            auVar222._24_4_ = auVar179._24_4_ * fVar262;
            auVar222._28_4_ = 0;
            auVar68._4_4_ = auVar244._4_4_ * fVar211;
            auVar68._0_4_ = auVar244._0_4_ * fVar265;
            auVar68._8_4_ = auVar244._8_4_ * fVar225;
            auVar68._12_4_ = auVar244._12_4_ * fVar237;
            auVar68._16_4_ = auVar244._16_4_ * fVar247;
            auVar68._20_4_ = auVar244._20_4_ * fVar248;
            auVar68._24_4_ = auVar244._24_4_ * fVar262;
            auVar68._28_4_ = auVar219._28_4_ + auVar260._28_4_;
            auVar259._8_4_ = 0x3f800000;
            auVar259._0_8_ = &DAT_3f8000003f800000;
            auVar259._12_4_ = 0x3f800000;
            auVar259._16_4_ = 0x3f800000;
            auVar259._20_4_ = 0x3f800000;
            auVar259._24_4_ = 0x3f800000;
            auVar259._28_4_ = 0x3f800000;
            auVar184 = vsubps_avx(auVar259,auVar222);
            auVar184 = vblendvps_avx(auVar184,auVar222,auVar242);
            auVar160 = ZEXT3264(auVar184);
            auVar184 = vsubps_avx(auVar259,auVar68);
            auVar224 = ZEXT3264(auVar184);
            _local_240 = vblendvps_avx(auVar184,auVar68,auVar242);
            auVar188 = ZEXT3264(auVar272);
            auVar360 = ZEXT3264(auVar67);
          }
        }
        auVar359 = ZEXT3264(_local_760);
        auVar347 = ZEXT3264(local_640);
        auVar317 = ZEXT3264(auVar313);
        auVar283 = auVar160._0_32_;
        auVar184 = auVar360._0_32_;
        auVar260 = auVar188._0_32_;
        _local_590 = auVar27;
        if ((((((((auVar260 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar260 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar260 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar260 >> 0x7f,0) != '\0') ||
              (auVar188 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
             SUB321(auVar260 >> 0xbf,0) != '\0') ||
            (auVar188 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
            auVar188[0x1f] < '\0') {
          auVar34 = vsubps_avx(_local_680,_local_780);
          fVar350 = (float)local_780._0_4_ + auVar34._0_4_ * auVar160._0_4_;
          fVar209 = (float)local_780._4_4_ + auVar34._4_4_ * auVar160._4_4_;
          fVar265 = fStack_778 + auVar34._8_4_ * auVar160._8_4_;
          fVar211 = fStack_774 + auVar34._12_4_ * auVar160._12_4_;
          fVar225 = fStack_770 + auVar34._16_4_ * auVar160._16_4_;
          fVar227 = fStack_76c + auVar34._20_4_ * auVar160._20_4_;
          fVar229 = fStack_768 + auVar34._24_4_ * auVar160._24_4_;
          fVar237 = fStack_764 + auVar34._28_4_;
          fVar192 = local_7b8->depth_scale;
          auVar69._4_4_ = (fVar209 + fVar209) * fVar192;
          auVar69._0_4_ = (fVar350 + fVar350) * fVar192;
          auVar69._8_4_ = (fVar265 + fVar265) * fVar192;
          auVar69._12_4_ = (fVar211 + fVar211) * fVar192;
          auVar69._16_4_ = (fVar225 + fVar225) * fVar192;
          auVar69._20_4_ = (fVar227 + fVar227) * fVar192;
          auVar69._24_4_ = (fVar229 + fVar229) * fVar192;
          auVar69._28_4_ = fVar237 + fVar237;
          auVar34 = vcmpps_avx(auVar184,auVar69,6);
          auVar39 = auVar260 & auVar34;
          if ((((((((auVar39 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar39 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar39 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar39 >> 0x7f,0) != '\0') ||
                (auVar39 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar39 >> 0xbf,0) != '\0') ||
              (auVar39 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar39[0x1f] < '\0') {
            auVar260 = vandps_avx(auVar34,auVar260);
            local_240._0_4_ = (float)local_240._0_4_ + (float)local_240._0_4_ + -1.0;
            local_240._4_4_ = (float)local_240._4_4_ + (float)local_240._4_4_ + -1.0;
            uStack_238._0_4_ = (float)uStack_238 + (float)uStack_238 + -1.0;
            uStack_238._4_4_ = uStack_238._4_4_ + uStack_238._4_4_ + -1.0;
            uStack_230._0_4_ = (float)uStack_230 + (float)uStack_230 + -1.0;
            uStack_230._4_4_ = uStack_230._4_4_ + uStack_230._4_4_ + -1.0;
            uStack_228._0_4_ = (float)uStack_228 + (float)uStack_228 + -1.0;
            uStack_228._4_4_ = uStack_228._4_4_ + uStack_228._4_4_ + -1.0;
            local_380 = auVar283;
            auVar135 = _local_240;
            auVar34 = _local_240;
            local_360 = (float)local_240._0_4_;
            fStack_35c = (float)local_240._4_4_;
            fStack_358 = (float)uStack_238;
            fStack_354 = uStack_238._4_4_;
            fStack_350 = (float)uStack_230;
            fStack_34c = uStack_230._4_4_;
            fStack_348 = (float)uStack_228;
            fStack_344 = uStack_228._4_4_;
            local_340 = auVar184;
            local_320 = 0;
            local_31c = uVar17;
            uStack_7c8 = auVar289._8_8_;
            local_310 = auVar289._0_8_;
            uStack_308 = uStack_7c8;
            uStack_578 = auVar335._8_8_;
            local_300 = auVar335._0_8_;
            uStack_2f8 = uStack_578;
            local_2f0 = local_590;
            uStack_2e8 = uStack_588;
            uStack_568 = auVar357._8_8_;
            local_2e0._8_8_ = uStack_568;
            local_2e0._0_8_ = auVar357._0_8_;
            local_2c0 = auVar260;
            _local_240 = auVar34;
            if ((pGVar18->mask & (ray->super_RayK<1>).mask) != 0) {
              local_460[0] = auVar260;
              auVar198._0_4_ = 1.0 / (float)(int)uVar17;
              auVar198._4_12_ = SUB6012((undefined1  [60])0x0,0);
              auVar255 = vshufps_avx(auVar198,auVar198,0);
              local_2a0[0] = auVar255._0_4_ * (auVar160._0_4_ + 0.0);
              local_2a0[1] = auVar255._4_4_ * (auVar160._4_4_ + 1.0);
              local_2a0[2] = auVar255._8_4_ * (auVar160._8_4_ + 2.0);
              local_2a0[3] = auVar255._12_4_ * (auVar160._12_4_ + 3.0);
              fStack_290 = auVar255._0_4_ * (auVar160._16_4_ + 4.0);
              fStack_28c = auVar255._4_4_ * (auVar160._20_4_ + 5.0);
              fStack_288 = auVar255._8_4_ * (auVar160._24_4_ + 6.0);
              fStack_284 = auVar160._28_4_ + 7.0;
              uStack_230 = auVar135._16_8_;
              uStack_228 = auVar34._24_8_;
              local_280 = local_240;
              uStack_278 = uStack_238;
              uStack_270 = uStack_230;
              uStack_268 = uStack_228;
              local_260 = auVar184;
              auVar180._8_4_ = 0x7f800000;
              auVar180._0_8_ = 0x7f8000007f800000;
              auVar180._12_4_ = 0x7f800000;
              auVar180._16_4_ = 0x7f800000;
              auVar180._20_4_ = 0x7f800000;
              auVar180._24_4_ = 0x7f800000;
              auVar180._28_4_ = 0x7f800000;
              auVar34 = vblendvps_avx(auVar180,auVar184,auVar260);
              auVar39 = vshufps_avx(auVar34,auVar34,0xb1);
              auVar39 = vminps_avx(auVar34,auVar39);
              auVar25 = vshufpd_avx(auVar39,auVar39,5);
              auVar39 = vminps_avx(auVar39,auVar25);
              auVar25 = vperm2f128_avx(auVar39,auVar39,1);
              auVar39 = vminps_avx(auVar39,auVar25);
              auVar34 = vcmpps_avx(auVar34,auVar39,0);
              auVar39 = auVar260 & auVar34;
              if ((((((((auVar39 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar39 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar39 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar39 >> 0x7f,0) != '\0') ||
                    (auVar39 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar39 >> 0xbf,0) != '\0') ||
                  (auVar39 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar39[0x1f] < '\0') {
                auVar260 = vandps_avx(auVar34,auVar260);
              }
              uVar137 = vmovmskps_avx(auVar260);
              uVar23 = 0;
              if (uVar137 != 0) {
                for (; (uVar137 >> uVar23 & 1) == 0; uVar23 = uVar23 + 1) {
                }
              }
              auVar144 = (undefined1  [8])(ulong)uVar23;
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar18->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                fVar192 = local_2a0[(long)auVar144];
                fVar350 = *(float *)((long)&local_280 + (long)auVar144 * 4);
                fVar265 = 1.0 - fVar192;
                fVar209 = fVar192 * fVar265 + fVar192 * fVar265;
                auVar255 = ZEXT416((uint)(fVar192 * fVar192 * 3.0));
                auVar255 = vshufps_avx(auVar255,auVar255,0);
                auVar201 = ZEXT416((uint)((fVar209 - fVar192 * fVar192) * 3.0));
                auVar201 = vshufps_avx(auVar201,auVar201,0);
                auVar241 = ZEXT416((uint)((fVar265 * fVar265 - fVar209) * 3.0));
                auVar241 = vshufps_avx(auVar241,auVar241,0);
                auVar216 = ZEXT416((uint)(fVar265 * fVar265 * -3.0));
                auVar216 = vshufps_avx(auVar216,auVar216,0);
                auVar199._0_4_ =
                     auVar216._0_4_ * fVar285 +
                     auVar241._0_4_ * fVar333 +
                     auVar255._0_4_ * fVar355 + auVar201._0_4_ * (float)local_590._0_4_;
                auVar199._4_4_ =
                     auVar216._4_4_ * fVar292 +
                     auVar241._4_4_ * fVar341 +
                     auVar255._4_4_ * fVar361 + auVar201._4_4_ * (float)local_590._4_4_;
                auVar199._8_4_ =
                     auVar216._8_4_ * auVar289._8_4_ +
                     auVar241._8_4_ * auVar335._8_4_ +
                     auVar255._8_4_ * auVar357._8_4_ + auVar201._8_4_ * (float)uStack_588;
                auVar199._12_4_ =
                     auVar216._12_4_ * auVar289._12_4_ +
                     auVar241._12_4_ * auVar335._12_4_ +
                     auVar255._12_4_ * auVar357._12_4_ + auVar201._12_4_ * uStack_588._4_4_;
                auVar224 = ZEXT464((uint)*(float *)(local_260 + (long)auVar144 * 4));
                (ray->super_RayK<1>).tfar = *(float *)(local_260 + (long)auVar144 * 4);
                uVar14 = vmovlps_avx(auVar199);
                *(undefined8 *)&(ray->Ng).field_0 = uVar14;
                fVar209 = (float)vextractps_avx(auVar199,2);
                (ray->Ng).field_0.field_0.z = fVar209;
                ray->u = fVar192;
                ray->v = fVar350;
                ray->primID = uVar138;
                ray->geomID = uVar140;
                ray->instID[0] = context->user->instID[0];
                ray->instPrimID[0] = context->user->instPrimID[0];
              }
              else {
                uStack_5f8 = uStack_578;
                local_600 = (undefined1  [8])auVar335._0_8_;
                _local_720 = _local_590;
                uStack_618 = uStack_568;
                local_620 = (undefined1  [8])auVar357._0_8_;
                local_480 = auVar283;
                local_4a0 = auVar184;
                local_7e8 = prim;
                _local_580 = auVar28;
                _local_570 = auVar29;
                _local_200 = auVar30;
                do {
                  local_6c4 = local_2a0[(long)auVar144];
                  local_6c0 = *(undefined4 *)((long)&local_280 + (long)auVar144 * 4);
                  local_680._0_4_ = (ray->super_RayK<1>).tfar;
                  (ray->super_RayK<1>).tfar = *(float *)(local_260 + (long)auVar144 * 4);
                  local_7b0.context = context->user;
                  fVar350 = 1.0 - local_6c4;
                  fVar192 = local_6c4 * fVar350 + local_6c4 * fVar350;
                  auVar255 = ZEXT416((uint)(local_6c4 * local_6c4 * 3.0));
                  auVar255 = vshufps_avx(auVar255,auVar255,0);
                  auVar201 = ZEXT416((uint)((fVar192 - local_6c4 * local_6c4) * 3.0));
                  auVar201 = vshufps_avx(auVar201,auVar201,0);
                  auVar241 = ZEXT416((uint)((fVar350 * fVar350 - fVar192) * 3.0));
                  auVar241 = vshufps_avx(auVar241,auVar241,0);
                  auVar216 = ZEXT416((uint)(fVar350 * fVar350 * -3.0));
                  auVar216 = vshufps_avx(auVar216,auVar216,0);
                  auVar218._0_4_ = auVar216._0_4_ * (float)local_7d0._0_4_;
                  auVar218._4_4_ = auVar216._4_4_ * (float)local_7d0._4_4_;
                  auVar218._8_4_ = auVar216._8_4_ * (float)uStack_7c8;
                  auVar218._12_4_ = auVar216._12_4_ * uStack_7c8._4_4_;
                  auVar224 = ZEXT1664(auVar218);
                  auVar204._0_4_ =
                       auVar218._0_4_ +
                       auVar241._0_4_ * (float)local_600._0_4_ +
                       auVar255._0_4_ * (float)local_620._0_4_ +
                       auVar201._0_4_ * (float)local_720._0_4_;
                  auVar204._4_4_ =
                       auVar218._4_4_ +
                       auVar241._4_4_ * (float)local_600._4_4_ +
                       auVar255._4_4_ * (float)local_620._4_4_ +
                       auVar201._4_4_ * (float)local_720._4_4_;
                  auVar204._8_4_ =
                       auVar218._8_4_ +
                       auVar241._8_4_ * (float)uStack_5f8 +
                       auVar255._8_4_ * (float)uStack_618 + auVar201._8_4_ * fStack_718;
                  auVar204._12_4_ =
                       auVar218._12_4_ +
                       auVar241._12_4_ * uStack_5f8._4_4_ +
                       auVar255._12_4_ * uStack_618._4_4_ + auVar201._12_4_ * fStack_714;
                  local_6d0 = vmovlps_avx(auVar204);
                  local_6c8 = vextractps_avx(auVar204,2);
                  local_6bc = (int)local_7d8;
                  local_6b8 = (int)local_7e0;
                  local_6b4 = (local_7b0.context)->instID[0];
                  local_6b0 = (local_7b0.context)->instPrimID[0];
                  local_7ec = -1;
                  local_7b0.valid = &local_7ec;
                  local_7b0.geometryUserPtr = pGVar18->userPtr;
                  local_7b0.ray = (RTCRayN *)ray;
                  local_7b0.hit = (RTCHitN *)&local_6d0;
                  local_7b0.N = 1;
                  local_780 = auVar144;
                  if (pGVar18->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_0104abd7:
                    p_Var22 = context->args->filter;
                    if (p_Var22 != (RTCFilterFunctionN)0x0) {
                      if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                         (((pGVar18->field_8).field_0x2 & 0x40) != 0)) {
                        auVar224 = ZEXT1664(auVar224._0_16_);
                        (*p_Var22)(&local_7b0);
                        auVar317 = ZEXT3264(_local_660);
                        auVar347 = ZEXT3264(local_640);
                        auVar359 = ZEXT3264(_local_760);
                        auVar360 = ZEXT3264(local_4a0);
                        auVar160 = ZEXT3264(local_480);
                        auVar144 = local_780;
                        prim = local_7e8;
                      }
                      if (*local_7b0.valid == 0) goto LAB_0104acae;
                    }
                    (((Vec3f *)((long)local_7b0.ray + 0x30))->field_0).components[0] =
                         *(float *)local_7b0.hit;
                    (((Vec3f *)((long)local_7b0.ray + 0x30))->field_0).field_0.y =
                         *(float *)(local_7b0.hit + 4);
                    (((Vec3f *)((long)local_7b0.ray + 0x30))->field_0).field_0.z =
                         *(float *)(local_7b0.hit + 8);
                    *(float *)((long)local_7b0.ray + 0x3c) = *(float *)(local_7b0.hit + 0xc);
                    *(float *)((long)local_7b0.ray + 0x40) = *(float *)(local_7b0.hit + 0x10);
                    *(float *)((long)local_7b0.ray + 0x44) = *(float *)(local_7b0.hit + 0x14);
                    *(float *)((long)local_7b0.ray + 0x48) = *(float *)(local_7b0.hit + 0x18);
                    *(float *)((long)local_7b0.ray + 0x4c) = *(float *)(local_7b0.hit + 0x1c);
                    *(float *)((long)local_7b0.ray + 0x50) = *(float *)(local_7b0.hit + 0x20);
                  }
                  else {
                    auVar224 = ZEXT1664(auVar218);
                    (*pGVar18->intersectionFilterN)(&local_7b0);
                    auVar317 = ZEXT3264(_local_660);
                    auVar347 = ZEXT3264(local_640);
                    auVar359 = ZEXT3264(_local_760);
                    auVar360 = ZEXT3264(local_4a0);
                    auVar160 = ZEXT3264(local_480);
                    auVar144 = local_780;
                    prim = local_7e8;
                    if (*local_7b0.valid != 0) goto LAB_0104abd7;
LAB_0104acae:
                    (ray->super_RayK<1>).tfar = (float)local_680._0_4_;
                  }
                  auVar313 = auVar317._0_32_;
                  *(undefined4 *)(local_460[0] + (long)auVar144 * 4) = 0;
                  auVar34 = local_460[0];
                  fVar192 = (ray->super_RayK<1>).tfar;
                  auVar159._4_4_ = fVar192;
                  auVar159._0_4_ = fVar192;
                  auVar159._8_4_ = fVar192;
                  auVar159._12_4_ = fVar192;
                  auVar159._16_4_ = fVar192;
                  auVar159._20_4_ = fVar192;
                  auVar159._24_4_ = fVar192;
                  auVar159._28_4_ = fVar192;
                  auVar184 = auVar360._0_32_;
                  auVar260 = vcmpps_avx(auVar184,auVar159,2);
                  auVar283 = vandps_avx(auVar260,local_460[0]);
                  local_460[0] = auVar283;
                  auVar34 = auVar34 & auVar260;
                  bVar119 = (auVar34 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
                  bVar120 = (auVar34 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
                  bVar118 = (auVar34 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
                  bVar117 = SUB321(auVar34 >> 0x7f,0) != '\0';
                  bVar116 = (auVar34 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0;
                  bVar115 = SUB321(auVar34 >> 0xbf,0) != '\0';
                  bVar114 = (auVar34 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0;
                  bVar113 = auVar34[0x1f] < '\0';
                  if (((((((bVar119 || bVar120) || bVar118) || bVar117) || bVar116) || bVar115) ||
                      bVar114) || bVar113) {
                    auVar187._8_4_ = 0x7f800000;
                    auVar187._0_8_ = 0x7f8000007f800000;
                    auVar187._12_4_ = 0x7f800000;
                    auVar187._16_4_ = 0x7f800000;
                    auVar187._20_4_ = 0x7f800000;
                    auVar187._24_4_ = 0x7f800000;
                    auVar187._28_4_ = 0x7f800000;
                    auVar260 = vblendvps_avx(auVar187,auVar184,auVar283);
                    auVar34 = vshufps_avx(auVar260,auVar260,0xb1);
                    auVar34 = vminps_avx(auVar260,auVar34);
                    auVar39 = vshufpd_avx(auVar34,auVar34,5);
                    auVar34 = vminps_avx(auVar34,auVar39);
                    auVar39 = vperm2f128_avx(auVar34,auVar34,1);
                    auVar224 = ZEXT3264(auVar39);
                    auVar34 = vminps_avx(auVar34,auVar39);
                    auVar260 = vcmpps_avx(auVar260,auVar34,0);
                    auVar34 = auVar283 & auVar260;
                    if ((((((((auVar34 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar34 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar34 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar34 >> 0x7f,0) != '\0') ||
                          (auVar34 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar34 >> 0xbf,0) != '\0') ||
                        (auVar34 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar34[0x1f] < '\0') {
                      auVar283 = vandps_avx(auVar260,auVar283);
                    }
                    uVar138 = vmovmskps_avx(auVar283);
                    uVar140 = 0;
                    if (uVar138 != 0) {
                      for (; (uVar138 >> uVar140 & 1) == 0; uVar140 = uVar140 + 1) {
                      }
                    }
                    auVar144 = (undefined1  [8])(ulong)uVar140;
                  }
                  auVar283 = auVar160._0_32_;
                  auVar28 = _local_580;
                  auVar29 = _local_570;
                } while (((((((bVar119 || bVar120) || bVar118) || bVar117) || bVar116) || bVar115)
                         || bVar114) || bVar113);
              }
            }
          }
        }
        _local_570 = auVar29;
        _local_580 = auVar28;
        local_480 = auVar283;
        local_4a0 = auVar184;
        auVar255 = _local_700;
      }
      auVar188 = ZEXT1664(auVar255);
      if (8 < (int)uVar17) {
        _local_660 = auVar313;
        _local_200 = vpshufd_avx(ZEXT416(uVar17),0);
        auVar255 = vshufps_avx(auVar255,auVar255,0);
        local_220._16_16_ = auVar255;
        local_220._0_16_ = auVar255;
        auVar123._4_4_ = fStack_73c;
        auVar123._0_4_ = local_740;
        auVar123._8_4_ = fStack_738;
        auVar123._12_4_ = fStack_734;
        auVar255 = vpermilps_avx(auVar123,0);
        local_100._16_16_ = auVar255;
        local_100._0_16_ = auVar255;
        auVar151._0_4_ = 1.0 / (float)local_3e0._0_4_;
        auVar151._4_12_ = SUB6012((undefined1  [60])0x0,0);
        auVar255 = vshufps_avx(auVar151,auVar151,0);
        register0x00001210 = auVar255;
        _local_120 = auVar255;
        auVar160 = ZEXT3264(_local_120);
        lVar143 = 8;
        fVar192 = (float)local_560._0_4_;
        fVar350 = (float)local_560._4_4_;
        fVar209 = fStack_558;
        fVar265 = fStack_554;
        fVar211 = fStack_550;
        fVar225 = fStack_54c;
        fVar227 = fStack_548;
        fVar229 = (float)local_5c0._0_4_;
        fVar237 = (float)local_5c0._4_4_;
        fVar247 = fStack_5b8;
        fVar248 = fStack_5b4;
        fVar249 = fStack_5b0;
        fVar253 = fStack_5ac;
        fVar262 = fStack_5a8;
        do {
          pauVar10 = (undefined1 (*) [28])(bezier_basis0 + lVar143 * 4 + lVar24);
          fVar263 = *(float *)*pauVar10;
          fVar264 = *(float *)(*pauVar10 + 4);
          fVar325 = *(float *)(*pauVar10 + 8);
          fVar231 = *(float *)(*pauVar10 + 0xc);
          fVar327 = *(float *)(*pauVar10 + 0x10);
          fVar235 = *(float *)(*pauVar10 + 0x14);
          fVar329 = *(float *)(*pauVar10 + 0x18);
          auVar132 = *pauVar10;
          pauVar11 = (undefined1 (*) [28])(lVar24 + 0x2227768 + lVar143 * 4);
          fVar266 = *(float *)*pauVar11;
          fVar330 = *(float *)(*pauVar11 + 4);
          fVar234 = *(float *)(*pauVar11 + 8);
          fVar331 = *(float *)(*pauVar11 + 0xc);
          fVar267 = *(float *)(*pauVar11 + 0x10);
          fVar332 = *(float *)(*pauVar11 + 0x14);
          fVar236 = *(float *)(*pauVar11 + 0x18);
          auVar131 = *pauVar11;
          pauVar11 = (undefined1 (*) [28])(lVar24 + 0x2227bec + lVar143 * 4);
          fVar252 = *(float *)*pauVar11;
          fVar161 = *(float *)(*pauVar11 + 4);
          fVar163 = *(float *)(*pauVar11 + 8);
          fVar164 = *(float *)(*pauVar11 + 0xc);
          fVar166 = *(float *)(*pauVar11 + 0x10);
          fVar167 = *(float *)(*pauVar11 + 0x14);
          fVar170 = *(float *)(*pauVar11 + 0x18);
          auVar129 = *pauVar11;
          pfVar1 = (float *)(lVar24 + 0x2228070 + lVar143 * 4);
          fVar169 = *pfVar1;
          fVar212 = pfVar1[1];
          fVar226 = pfVar1[2];
          fVar228 = pfVar1[3];
          fVar230 = pfVar1[4];
          fVar232 = pfVar1[5];
          fVar233 = pfVar1[6];
          fVar189 = auVar359._0_4_;
          fVar190 = auVar359._4_4_;
          fVar191 = auVar359._8_4_;
          fVar194 = auVar359._12_4_;
          fVar207 = auVar359._16_4_;
          fVar208 = auVar359._20_4_;
          fVar210 = auVar359._24_4_;
          fVar299 = auVar224._28_4_;
          fStack_724 = fVar299 + fVar299 + auVar160._28_4_;
          fVar293 = auVar347._0_4_;
          fVar294 = auVar347._4_4_;
          fVar295 = auVar347._8_4_;
          fVar296 = auVar347._12_4_;
          fVar297 = auVar347._16_4_;
          fVar298 = auVar347._20_4_;
          fVar173 = auVar347._24_4_;
          fVar251 = fVar299 + fVar299 + pfVar1[7];
          local_700._0_4_ =
               (float)local_3a0._0_4_ * fVar263 +
               fVar192 * fVar266 + fVar229 * fVar252 + (float)local_3c0._0_4_ * fVar169;
          local_700._4_4_ =
               (float)local_3a0._4_4_ * fVar264 +
               fVar350 * fVar330 + fVar237 * fVar161 + (float)local_3c0._4_4_ * fVar212;
          fStack_6f8 = fStack_398 * fVar325 +
                       fVar209 * fVar234 + fVar247 * fVar163 + fStack_3b8 * fVar226;
          fStack_6f4 = fStack_394 * fVar231 +
                       fVar265 * fVar331 + fVar248 * fVar164 + fStack_3b4 * fVar228;
          register0x00001450 =
               fStack_390 * fVar327 + fVar211 * fVar267 + fVar249 * fVar166 + fStack_3b0 * fVar230;
          register0x00001454 =
               fStack_38c * fVar235 + fVar225 * fVar332 + fVar253 * fVar167 + fStack_3ac * fVar232;
          register0x00001458 =
               fStack_388 * fVar329 + fVar227 * fVar236 + fVar262 * fVar170 + fStack_3a8 * fVar233;
          register0x0000145c = fVar299 + pfVar1[7] + fStack_724;
          auVar206._0_4_ =
               (float)local_140._0_4_ * fVar263 +
               fVar293 * fVar266 + (float)local_5e0._0_4_ * fVar252 + fVar189 * fVar169;
          auVar206._4_4_ =
               (float)local_140._4_4_ * fVar264 +
               fVar294 * fVar330 + (float)local_5e0._4_4_ * fVar161 + fVar190 * fVar212;
          auVar206._8_4_ =
               fStack_138 * fVar325 + fVar295 * fVar234 + fStack_5d8 * fVar163 + fVar191 * fVar226;
          auVar206._12_4_ =
               fStack_134 * fVar231 + fVar296 * fVar331 + fStack_5d4 * fVar164 + fVar194 * fVar228;
          auVar206._16_4_ =
               fStack_130 * fVar327 + fVar297 * fVar267 + fStack_5d0 * fVar166 + fVar207 * fVar230;
          auVar206._20_4_ =
               fStack_12c * fVar235 + fVar298 * fVar332 + fStack_5cc * fVar167 + fVar208 * fVar232;
          auVar206._24_4_ =
               fStack_128 * fVar329 + fVar173 * fVar236 + fStack_5c8 * fVar170 + fVar210 * fVar233;
          auVar206._28_4_ = fStack_724 + fVar299 + fVar299 + auVar188._28_4_;
          local_740 = fVar263 * (float)local_180._0_4_ +
                      (float)local_a0._0_4_ * fVar266 +
                      (float)local_80._0_4_ * fVar252 + fVar169 * (float)local_160._0_4_;
          fStack_73c = fVar264 * (float)local_180._4_4_ +
                       (float)local_a0._4_4_ * fVar330 +
                       (float)local_80._4_4_ * fVar161 + fVar212 * (float)local_160._4_4_;
          fStack_738 = fVar325 * fStack_178 +
                       fStack_98 * fVar234 + fStack_78 * fVar163 + fVar226 * fStack_158;
          fStack_734 = fVar231 * fStack_174 +
                       fStack_94 * fVar331 + fStack_74 * fVar164 + fVar228 * fStack_154;
          fStack_730 = fVar327 * fStack_170 +
                       fStack_90 * fVar267 + fStack_70 * fVar166 + fVar230 * fStack_150;
          fStack_72c = fVar235 * fStack_16c +
                       fStack_8c * fVar332 + fStack_6c * fVar167 + fVar232 * fStack_14c;
          fStack_728 = fVar329 * fStack_168 +
                       fStack_88 * fVar236 + fStack_68 * fVar170 + fVar233 * fStack_148;
          fStack_724 = fStack_724 + fVar251;
          pfVar1 = (float *)(bezier_basis1 + lVar143 * 4 + lVar24);
          fVar263 = *pfVar1;
          fVar264 = pfVar1[1];
          fVar325 = pfVar1[2];
          fVar231 = pfVar1[3];
          fVar327 = pfVar1[4];
          fVar235 = pfVar1[5];
          fVar329 = pfVar1[6];
          pauVar11 = (undefined1 (*) [28])(lVar24 + 0x2229b88 + lVar143 * 4);
          fVar192 = *(float *)*pauVar11;
          fVar350 = *(float *)(*pauVar11 + 4);
          fVar209 = *(float *)(*pauVar11 + 8);
          fVar265 = *(float *)(*pauVar11 + 0xc);
          fVar211 = *(float *)(*pauVar11 + 0x10);
          fVar225 = *(float *)(*pauVar11 + 0x14);
          fVar227 = *(float *)(*pauVar11 + 0x18);
          auVar134 = *pauVar11;
          pauVar12 = (undefined1 (*) [28])(lVar24 + 0x222a00c + lVar143 * 4);
          fVar229 = *(float *)*pauVar12;
          fVar237 = *(float *)(*pauVar12 + 4);
          fVar247 = *(float *)(*pauVar12 + 8);
          fVar248 = *(float *)(*pauVar12 + 0xc);
          fVar249 = *(float *)(*pauVar12 + 0x10);
          fVar253 = *(float *)(*pauVar12 + 0x14);
          fVar262 = *(float *)(*pauVar12 + 0x18);
          auVar133 = *pauVar12;
          pfVar1 = (float *)(lVar24 + 0x222a490 + lVar143 * 4);
          fVar266 = *pfVar1;
          fVar330 = pfVar1[1];
          fVar234 = pfVar1[2];
          fVar331 = pfVar1[3];
          fVar267 = pfVar1[4];
          fVar332 = pfVar1[5];
          fVar236 = pfVar1[6];
          fVar252 = fStack_3a4 + fStack_3a4 + fVar251;
          local_680._0_4_ =
               (float)local_3a0._0_4_ * fVar263 +
               (float)local_560._0_4_ * fVar192 +
               fVar229 * (float)local_5c0._0_4_ + (float)local_3c0._0_4_ * fVar266;
          local_680._4_4_ =
               (float)local_3a0._4_4_ * fVar264 +
               (float)local_560._4_4_ * fVar350 +
               fVar237 * (float)local_5c0._4_4_ + (float)local_3c0._4_4_ * fVar330;
          fStack_678 = fStack_398 * fVar325 +
                       fStack_558 * fVar209 + fVar247 * fStack_5b8 + fStack_3b8 * fVar234;
          fStack_674 = fStack_394 * fVar231 +
                       fStack_554 * fVar265 + fVar248 * fStack_5b4 + fStack_3b4 * fVar331;
          register0x00001390 =
               fStack_390 * fVar327 +
               fStack_550 * fVar211 + fVar249 * fStack_5b0 + fStack_3b0 * fVar267;
          register0x00001394 =
               fStack_38c * fVar235 +
               fStack_54c * fVar225 + fVar253 * fStack_5ac + fStack_3ac * fVar332;
          register0x00001398 =
               fStack_388 * fVar329 +
               fStack_548 * fVar227 + fVar262 * fStack_5a8 + fStack_3a8 * fVar236;
          register0x0000139c = fStack_3a4 + pfVar1[7] + fVar252;
          local_600._0_4_ =
               (float)local_140._0_4_ * fVar263 +
               fVar293 * fVar192 + (float)local_5e0._0_4_ * fVar229 + fVar189 * fVar266;
          local_600._4_4_ =
               (float)local_140._4_4_ * fVar264 +
               fVar294 * fVar350 + (float)local_5e0._4_4_ * fVar237 + fVar190 * fVar330;
          uStack_5f8._0_4_ =
               fStack_138 * fVar325 + fVar295 * fVar209 + fStack_5d8 * fVar247 + fVar191 * fVar234;
          uStack_5f8._4_4_ =
               fStack_134 * fVar231 + fVar296 * fVar265 + fStack_5d4 * fVar248 + fVar194 * fVar331;
          register0x00001350 =
               fStack_130 * fVar327 + fVar297 * fVar211 + fStack_5d0 * fVar249 + fVar207 * fVar267;
          register0x00001354 =
               fStack_12c * fVar235 + fVar298 * fVar225 + fStack_5cc * fVar253 + fVar208 * fVar332;
          register0x00001358 =
               fStack_128 * fVar329 + fVar173 * fVar227 + fStack_5c8 * fVar262 + fVar210 * fVar236;
          register0x0000135c = fVar252 + fStack_3a4 + fStack_3a4 + *(float *)pauVar10[1];
          auVar284._0_4_ =
               (float)local_a0._0_4_ * fVar192 +
               (float)local_80._0_4_ * fVar229 + fVar266 * (float)local_160._0_4_ +
               fVar263 * (float)local_180._0_4_;
          auVar284._4_4_ =
               (float)local_a0._4_4_ * fVar350 +
               (float)local_80._4_4_ * fVar237 + fVar330 * (float)local_160._4_4_ +
               fVar264 * (float)local_180._4_4_;
          auVar284._8_4_ =
               fStack_98 * fVar209 + fStack_78 * fVar247 + fVar234 * fStack_158 +
               fVar325 * fStack_178;
          auVar284._12_4_ =
               fStack_94 * fVar265 + fStack_74 * fVar248 + fVar331 * fStack_154 +
               fVar231 * fStack_174;
          auVar284._16_4_ =
               fStack_90 * fVar211 + fStack_70 * fVar249 + fVar267 * fStack_150 +
               fVar327 * fStack_170;
          auVar284._20_4_ =
               fStack_8c * fVar225 + fStack_6c * fVar253 + fVar332 * fStack_14c +
               fVar235 * fStack_16c;
          auVar284._24_4_ =
               fStack_88 * fVar227 + fStack_68 * fVar262 + fVar236 * fStack_148 +
               fVar329 * fStack_168;
          auVar284._28_4_ = fStack_3a4 + fStack_3a4 + pfVar1[7] + fVar252;
          auVar360 = ZEXT3264(auVar359._0_32_);
          auVar283 = vsubps_avx(_local_680,_local_700);
          auVar188 = ZEXT3264(auVar283);
          _local_400 = vsubps_avx(_local_600,auVar206);
          auVar160 = ZEXT3264(_local_400);
          fVar192 = auVar283._0_4_;
          fVar209 = auVar283._4_4_;
          auVar70._4_4_ = auVar206._4_4_ * fVar209;
          auVar70._0_4_ = auVar206._0_4_ * fVar192;
          fVar211 = auVar283._8_4_;
          auVar70._8_4_ = auVar206._8_4_ * fVar211;
          fVar227 = auVar283._12_4_;
          auVar70._12_4_ = auVar206._12_4_ * fVar227;
          fVar237 = auVar283._16_4_;
          auVar70._16_4_ = auVar206._16_4_ * fVar237;
          fVar248 = auVar283._20_4_;
          auVar70._20_4_ = auVar206._20_4_ * fVar248;
          fVar253 = auVar283._24_4_;
          auVar70._24_4_ = auVar206._24_4_ * fVar253;
          auVar70._28_4_ = fVar252;
          fVar350 = local_400._0_4_;
          fVar265 = local_400._4_4_;
          auVar71._4_4_ = (float)local_700._4_4_ * fVar265;
          auVar71._0_4_ = (float)local_700._0_4_ * fVar350;
          fVar225 = local_400._8_4_;
          auVar71._8_4_ = fStack_6f8 * fVar225;
          fVar229 = local_400._12_4_;
          auVar71._12_4_ = fStack_6f4 * fVar229;
          fVar247 = local_400._16_4_;
          auVar71._16_4_ = register0x00001450 * fVar247;
          fVar249 = local_400._20_4_;
          auVar71._20_4_ = register0x00001454 * fVar249;
          fVar262 = local_400._24_4_;
          auVar71._24_4_ = register0x00001458 * fVar262;
          auVar71._28_4_ = register0x0000135c;
          auVar260 = vsubps_avx(auVar70,auVar71);
          auVar124._4_4_ = fStack_73c;
          auVar124._0_4_ = local_740;
          auVar124._8_4_ = fStack_738;
          auVar124._12_4_ = fStack_734;
          auVar124._16_4_ = fStack_730;
          auVar124._20_4_ = fStack_72c;
          auVar124._24_4_ = fStack_728;
          auVar124._28_4_ = fStack_724;
          auVar184 = vmaxps_avx(auVar124,auVar284);
          auVar72._4_4_ = auVar184._4_4_ * auVar184._4_4_ * (fVar209 * fVar209 + fVar265 * fVar265);
          auVar72._0_4_ = auVar184._0_4_ * auVar184._0_4_ * (fVar192 * fVar192 + fVar350 * fVar350);
          auVar72._8_4_ = auVar184._8_4_ * auVar184._8_4_ * (fVar211 * fVar211 + fVar225 * fVar225);
          auVar72._12_4_ =
               auVar184._12_4_ * auVar184._12_4_ * (fVar227 * fVar227 + fVar229 * fVar229);
          auVar72._16_4_ =
               auVar184._16_4_ * auVar184._16_4_ * (fVar237 * fVar237 + fVar247 * fVar247);
          auVar72._20_4_ =
               auVar184._20_4_ * auVar184._20_4_ * (fVar248 * fVar248 + fVar249 * fVar249);
          auVar72._24_4_ =
               auVar184._24_4_ * auVar184._24_4_ * (fVar253 * fVar253 + fVar262 * fVar262);
          auVar72._28_4_ = register0x0000139c + register0x0000135c;
          auVar73._4_4_ = auVar260._4_4_ * auVar260._4_4_;
          auVar73._0_4_ = auVar260._0_4_ * auVar260._0_4_;
          auVar73._8_4_ = auVar260._8_4_ * auVar260._8_4_;
          auVar73._12_4_ = auVar260._12_4_ * auVar260._12_4_;
          auVar73._16_4_ = auVar260._16_4_ * auVar260._16_4_;
          auVar73._20_4_ = auVar260._20_4_ * auVar260._20_4_;
          auVar73._24_4_ = auVar260._24_4_ * auVar260._24_4_;
          auVar73._28_4_ = auVar260._28_4_;
          auVar184 = vcmpps_avx(auVar73,auVar72,2);
          local_320 = (uint)lVar143;
          auVar201 = vpshufd_avx(ZEXT416(local_320),0);
          auVar255 = vpor_avx(auVar201,_DAT_01ff0cf0);
          auVar201 = vpor_avx(auVar201,_DAT_02020ea0);
          auVar255 = vpcmpgtd_avx(_local_200,auVar255);
          auVar201 = vpcmpgtd_avx(_local_200,auVar201);
          auVar223._16_16_ = auVar201;
          auVar223._0_16_ = auVar255;
          auVar224 = ZEXT3264(auVar223);
          auVar260 = auVar223 & auVar184;
          fVar192 = (float)local_560._0_4_;
          fVar350 = (float)local_560._4_4_;
          fVar209 = fStack_558;
          fVar265 = fStack_554;
          fVar211 = fStack_550;
          fVar225 = fStack_54c;
          fVar227 = fStack_548;
          fVar229 = (float)local_5c0._0_4_;
          fVar237 = (float)local_5c0._4_4_;
          fVar247 = fStack_5b8;
          fVar248 = fStack_5b4;
          fVar249 = fStack_5b0;
          fVar253 = fStack_5ac;
          fVar262 = fStack_5a8;
          if ((((((((auVar260 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar260 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar260 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar260 >> 0x7f,0) == '\0') &&
                (auVar260 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar260 >> 0xbf,0) == '\0') &&
              (auVar260 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar260[0x1f]) {
            auVar347 = ZEXT3264(auVar347._0_32_);
          }
          else {
            local_6a0._0_4_ = auVar134._0_4_;
            local_6a0._4_4_ = auVar134._4_4_;
            fStack_698 = auVar134._8_4_;
            fStack_694 = auVar134._12_4_;
            fStack_690 = auVar134._16_4_;
            fStack_68c = auVar134._20_4_;
            fStack_688 = auVar134._24_4_;
            fVar299 = (float)local_1e0._0_4_ * (float)local_6a0._0_4_;
            fVar251 = (float)local_1e0._4_4_ * (float)local_6a0._4_4_;
            fVar305 = fStack_1d8 * fStack_698;
            fVar307 = fStack_1d4 * fStack_694;
            fVar308 = fStack_1d0 * fStack_690;
            fVar309 = fStack_1cc * fStack_68c;
            fVar310 = fStack_1c8 * fStack_688;
            _local_6a0 = auVar284;
            local_500._0_4_ = auVar133._0_4_;
            local_500._4_4_ = auVar133._4_4_;
            fStack_4f8 = auVar133._8_4_;
            fStack_4f4 = auVar133._12_4_;
            fStack_4f0 = auVar133._16_4_;
            fStack_4ec = auVar133._20_4_;
            fStack_4e8 = auVar133._24_4_;
            fVar252 = (float)local_c0._0_4_ * (float)local_500._0_4_;
            fVar161 = (float)local_c0._4_4_ * (float)local_500._4_4_;
            fVar163 = fStack_b8 * fStack_4f8;
            fVar164 = fStack_b4 * fStack_4f4;
            fVar166 = fStack_b0 * fStack_4f0;
            fVar167 = fStack_ac * fStack_4ec;
            fVar170 = fStack_a8 * fStack_4e8;
            _local_500 = auVar223;
            local_3e0 = auVar283;
            local_520 = fVar263 * (float)local_660._0_4_ +
                        fVar299 + fVar252 + (float)local_540._0_4_ * fVar266;
            fStack_51c = fVar264 * (float)local_660._4_4_ +
                         fVar251 + fVar161 + (float)local_540._4_4_ * fVar330;
            fStack_518 = fVar325 * fStack_658 + fVar305 + fVar163 + fStack_538 * fVar234;
            fStack_514 = fVar231 * fStack_654 + fVar307 + fVar164 + fStack_534 * fVar331;
            fStack_510 = fVar327 * fStack_650 + fVar308 + fVar166 + fStack_530 * fVar267;
            fStack_50c = fVar235 * fStack_64c + fVar309 + fVar167 + fStack_52c * fVar332;
            fStack_508 = fVar329 * fStack_648 + fVar310 + fVar170 + fStack_528 * fVar236;
            fStack_504 = register0x0000145c + local_400._28_4_ + auVar283._28_4_ + 0.0;
            local_620._0_4_ = auVar131._0_4_;
            local_620._4_4_ = auVar131._4_4_;
            uStack_618._0_4_ = auVar131._8_4_;
            uStack_618._4_4_ = auVar131._12_4_;
            auStack_610._0_4_ = auVar131._16_4_;
            auStack_610._4_4_ = auVar131._20_4_;
            fStack_608 = auVar131._24_4_;
            fVar145 = (float)local_1e0._0_4_ * (float)local_620._0_4_;
            fVar162 = (float)local_1e0._4_4_ * (float)local_620._4_4_;
            fVar285 = fStack_1d8 * (float)uStack_618;
            fVar165 = fStack_1d4 * uStack_618._4_4_;
            fVar292 = fStack_1d0 * (float)auStack_610._0_4_;
            fVar168 = fStack_1cc * (float)auStack_610._4_4_;
            fVar171 = fStack_1c8 * fStack_608;
            local_4c0._0_4_ = auVar129._0_4_;
            local_4c0._4_4_ = auVar129._4_4_;
            fStack_4b8 = auVar129._8_4_;
            fStack_4b4 = auVar129._12_4_;
            fStack_4b0 = auVar129._16_4_;
            fStack_4ac = auVar129._20_4_;
            fStack_4a8 = auVar129._24_4_;
            pfVar1 = (float *)(lVar24 + 0x2228dfc + lVar143 * 4);
            fVar263 = *pfVar1;
            fVar264 = pfVar1[1];
            fVar325 = pfVar1[2];
            fVar231 = pfVar1[3];
            fVar327 = pfVar1[4];
            fVar235 = pfVar1[5];
            fVar329 = pfVar1[6];
            pfVar2 = (float *)(lVar24 + 0x2229280 + lVar143 * 4);
            fVar266 = *pfVar2;
            fVar330 = pfVar2[1];
            fVar234 = pfVar2[2];
            fVar331 = pfVar2[3];
            fVar267 = pfVar2[4];
            fVar332 = pfVar2[5];
            fVar236 = pfVar2[6];
            fVar274 = auVar359._28_4_ + 0.0;
            pfVar3 = (float *)(lVar24 + 0x2228978 + lVar143 * 4);
            fVar252 = *pfVar3;
            fVar161 = pfVar3[1];
            fVar163 = pfVar3[2];
            fVar164 = pfVar3[3];
            fVar166 = pfVar3[4];
            fVar167 = pfVar3[5];
            fVar170 = pfVar3[6];
            fVar172 = pfVar1[7] + pfVar2[7];
            fVar193 = pfVar2[7] + fVar274;
            fVar274 = auVar359._28_4_ + *(float *)pauVar11[1] + fVar274;
            pfVar1 = (float *)(lVar24 + 0x22284f4 + lVar143 * 4);
            fVar299 = *pfVar1;
            fVar251 = pfVar1[1];
            fVar305 = pfVar1[2];
            fVar307 = pfVar1[3];
            fVar308 = pfVar1[4];
            fVar309 = pfVar1[5];
            fVar310 = pfVar1[6];
            local_4e0 = (float)local_3a0._0_4_ * fVar299 +
                        (float)local_560._0_4_ * fVar252 +
                        (float)local_5c0._0_4_ * fVar263 + (float)local_3c0._0_4_ * fVar266;
            fStack_4dc = (float)local_3a0._4_4_ * fVar251 +
                         (float)local_560._4_4_ * fVar161 +
                         (float)local_5c0._4_4_ * fVar264 + (float)local_3c0._4_4_ * fVar330;
            fStack_4d8 = fStack_398 * fVar305 +
                         fStack_558 * fVar163 + fStack_5b8 * fVar325 + fStack_3b8 * fVar234;
            fStack_4d4 = fStack_394 * fVar307 +
                         fStack_554 * fVar164 + fStack_5b4 * fVar231 + fStack_3b4 * fVar331;
            fStack_4d0 = fStack_390 * fVar308 +
                         fStack_550 * fVar166 + fStack_5b0 * fVar327 + fStack_3b0 * fVar267;
            fStack_4cc = fStack_38c * fVar309 +
                         fStack_54c * fVar167 + fStack_5ac * fVar235 + fStack_3ac * fVar332;
            fStack_4c8 = fStack_388 * fVar310 +
                         fStack_548 * fVar170 + fStack_5a8 * fVar329 + fStack_3a8 * fVar236;
            fStack_4c4 = fVar172 + fVar193;
            auVar181._0_4_ =
                 (float)local_140._0_4_ * fVar299 +
                 fVar263 * (float)local_5e0._0_4_ + fVar189 * fVar266 + fVar293 * fVar252;
            auVar181._4_4_ =
                 (float)local_140._4_4_ * fVar251 +
                 fVar264 * (float)local_5e0._4_4_ + fVar190 * fVar330 + fVar294 * fVar161;
            auVar181._8_4_ =
                 fStack_138 * fVar305 + fVar325 * fStack_5d8 + fVar191 * fVar234 + fVar295 * fVar163
            ;
            auVar181._12_4_ =
                 fStack_134 * fVar307 + fVar231 * fStack_5d4 + fVar194 * fVar331 + fVar296 * fVar164
            ;
            auVar181._16_4_ =
                 fStack_130 * fVar308 + fVar327 * fStack_5d0 + fVar207 * fVar267 + fVar297 * fVar166
            ;
            auVar181._20_4_ =
                 fStack_12c * fVar309 + fVar235 * fStack_5cc + fVar208 * fVar332 + fVar298 * fVar167
            ;
            auVar181._24_4_ =
                 fStack_128 * fVar310 + fVar329 * fStack_5c8 + fVar210 * fVar236 + fVar173 * fVar170
            ;
            auVar181._28_4_ = fVar193 + fVar274;
            auVar345._0_4_ =
                 fVar252 * (float)local_1e0._0_4_ +
                 (float)local_c0._0_4_ * fVar263 + (float)local_540._0_4_ * fVar266 +
                 fVar299 * (float)local_660._0_4_;
            auVar345._4_4_ =
                 fVar161 * (float)local_1e0._4_4_ +
                 (float)local_c0._4_4_ * fVar264 + (float)local_540._4_4_ * fVar330 +
                 fVar251 * (float)local_660._4_4_;
            auVar345._8_4_ =
                 fVar163 * fStack_1d8 + fStack_b8 * fVar325 + fStack_538 * fVar234 +
                 fVar305 * fStack_658;
            auVar345._12_4_ =
                 fVar164 * fStack_1d4 + fStack_b4 * fVar231 + fStack_534 * fVar331 +
                 fVar307 * fStack_654;
            auVar345._16_4_ =
                 fVar166 * fStack_1d0 + fStack_b0 * fVar327 + fStack_530 * fVar267 +
                 fVar308 * fStack_650;
            auVar345._20_4_ =
                 fVar167 * fStack_1cc + fStack_ac * fVar235 + fStack_52c * fVar332 +
                 fVar309 * fStack_64c;
            auVar345._24_4_ =
                 fVar170 * fStack_1c8 + fStack_a8 * fVar329 + fStack_528 * fVar236 +
                 fVar310 * fStack_648;
            auVar345._28_4_ = pfVar3[7] + fVar172 + fVar274;
            pfVar1 = (float *)(lVar24 + 0x222b21c + lVar143 * 4);
            fVar264 = *pfVar1;
            fVar325 = pfVar1[1];
            fVar231 = pfVar1[2];
            fVar327 = pfVar1[3];
            fVar235 = pfVar1[4];
            fVar329 = pfVar1[5];
            fVar266 = pfVar1[6];
            pfVar2 = (float *)(lVar24 + 0x222b6a0 + lVar143 * 4);
            fVar330 = *pfVar2;
            fVar234 = pfVar2[1];
            fVar331 = pfVar2[2];
            fVar267 = pfVar2[3];
            fVar332 = pfVar2[4];
            fVar236 = pfVar2[5];
            fVar252 = pfVar2[6];
            fVar263 = auVar347._28_4_;
            _local_620 = auVar184;
            pfVar3 = (float *)(lVar24 + 0x222ad98 + lVar143 * 4);
            fVar161 = *pfVar3;
            fVar163 = pfVar3[1];
            fVar164 = pfVar3[2];
            fVar166 = pfVar3[3];
            fVar167 = pfVar3[4];
            fVar170 = pfVar3[5];
            fVar299 = pfVar3[6];
            pfVar4 = (float *)(lVar24 + 0x222a914 + lVar143 * 4);
            fVar251 = *pfVar4;
            fVar189 = pfVar4[1];
            fVar190 = pfVar4[2];
            fVar191 = pfVar4[3];
            fVar194 = pfVar4[4];
            fVar207 = pfVar4[5];
            fVar208 = pfVar4[6];
            auVar302._0_4_ =
                 fVar251 * (float)local_3a0._0_4_ +
                 (float)local_560._0_4_ * fVar161 +
                 (float)local_5c0._0_4_ * fVar264 + (float)local_3c0._0_4_ * fVar330;
            auVar302._4_4_ =
                 fVar189 * (float)local_3a0._4_4_ +
                 (float)local_560._4_4_ * fVar163 +
                 (float)local_5c0._4_4_ * fVar325 + (float)local_3c0._4_4_ * fVar234;
            auVar302._8_4_ =
                 fVar190 * fStack_398 +
                 fStack_558 * fVar164 + fStack_5b8 * fVar231 + fStack_3b8 * fVar331;
            auVar302._12_4_ =
                 fVar191 * fStack_394 +
                 fStack_554 * fVar166 + fStack_5b4 * fVar327 + fStack_3b4 * fVar267;
            auVar302._16_4_ =
                 fVar194 * fStack_390 +
                 fStack_550 * fVar167 + fStack_5b0 * fVar235 + fStack_3b0 * fVar332;
            auVar302._20_4_ =
                 fVar207 * fStack_38c +
                 fStack_54c * fVar170 + fStack_5ac * fVar329 + fStack_3ac * fVar236;
            auVar302._24_4_ =
                 fVar208 * fStack_388 +
                 fStack_548 * fVar299 + fStack_5a8 * fVar266 + fStack_3a8 * fVar252;
            auVar302._28_4_ = fVar263 + fVar263 + fStack_3a4 + fVar263;
            auVar339._0_4_ =
                 (float)local_140._0_4_ * fVar251 +
                 fVar161 * fVar293 +
                 fVar264 * (float)local_5e0._0_4_ + fVar330 * (float)local_760._0_4_;
            auVar339._4_4_ =
                 (float)local_140._4_4_ * fVar189 +
                 fVar163 * fVar294 +
                 fVar325 * (float)local_5e0._4_4_ + fVar234 * (float)local_760._4_4_;
            auVar339._8_4_ =
                 fStack_138 * fVar190 +
                 fVar164 * fVar295 + fVar231 * fStack_5d8 + fVar331 * fStack_758;
            auVar339._12_4_ =
                 fStack_134 * fVar191 +
                 fVar166 * fVar296 + fVar327 * fStack_5d4 + fVar267 * fStack_754;
            auVar339._16_4_ =
                 fStack_130 * fVar194 +
                 fVar167 * fVar297 + fVar235 * fStack_5d0 + fVar332 * fStack_750;
            auVar339._20_4_ =
                 fStack_12c * fVar207 +
                 fVar170 * fVar298 + fVar329 * fStack_5cc + fVar236 * fStack_74c;
            auVar339._24_4_ =
                 fStack_128 * fVar208 +
                 fVar299 * fVar173 + fVar266 * fStack_5c8 + fVar252 * fStack_748;
            auVar339._28_4_ = fVar263 + fVar263 + fStack_384 + fVar263;
            auVar261._8_4_ = 0x7fffffff;
            auVar261._0_8_ = 0x7fffffff7fffffff;
            auVar261._12_4_ = 0x7fffffff;
            auVar261._16_4_ = 0x7fffffff;
            auVar261._20_4_ = 0x7fffffff;
            auVar261._24_4_ = 0x7fffffff;
            auVar261._28_4_ = 0x7fffffff;
            auVar128._4_4_ = fStack_4dc;
            auVar128._0_4_ = local_4e0;
            auVar128._8_4_ = fStack_4d8;
            auVar128._12_4_ = fStack_4d4;
            auVar128._16_4_ = fStack_4d0;
            auVar128._20_4_ = fStack_4cc;
            auVar128._24_4_ = fStack_4c8;
            auVar128._28_4_ = fStack_4c4;
            auVar260 = vandps_avx(auVar128,auVar261);
            auVar34 = vandps_avx(auVar181,auVar261);
            auVar34 = vmaxps_avx(auVar260,auVar34);
            auVar260 = vandps_avx(auVar345,auVar261);
            auVar34 = vmaxps_avx(auVar34,auVar260);
            auVar34 = vcmpps_avx(auVar34,local_220,1);
            auVar39 = vblendvps_avx(auVar128,auVar283,auVar34);
            auVar155._0_4_ =
                 fVar251 * (float)local_660._0_4_ +
                 fVar161 * (float)local_1e0._0_4_ +
                 fVar330 * (float)local_540._0_4_ + (float)local_c0._0_4_ * fVar264;
            auVar155._4_4_ =
                 fVar189 * (float)local_660._4_4_ +
                 fVar163 * (float)local_1e0._4_4_ +
                 fVar234 * (float)local_540._4_4_ + (float)local_c0._4_4_ * fVar325;
            auVar155._8_4_ =
                 fVar190 * fStack_658 +
                 fVar164 * fStack_1d8 + fVar331 * fStack_538 + fStack_b8 * fVar231;
            auVar155._12_4_ =
                 fVar191 * fStack_654 +
                 fVar166 * fStack_1d4 + fVar267 * fStack_534 + fStack_b4 * fVar327;
            auVar155._16_4_ =
                 fVar194 * fStack_650 +
                 fVar167 * fStack_1d0 + fVar332 * fStack_530 + fStack_b0 * fVar235;
            auVar155._20_4_ =
                 fVar207 * fStack_64c +
                 fVar170 * fStack_1cc + fVar236 * fStack_52c + fStack_ac * fVar329;
            auVar155._24_4_ =
                 fVar208 * fStack_648 +
                 fVar299 * fStack_1c8 + fVar252 * fStack_528 + fStack_a8 * fVar266;
            auVar155._28_4_ = auVar260._28_4_ + pfVar3[7] + pfVar2[7] + pfVar1[7];
            auVar25 = vblendvps_avx(auVar181,_local_400,auVar34);
            auVar260 = vandps_avx(auVar302,auVar261);
            auVar34 = vandps_avx(auVar339,auVar261);
            auVar219 = vmaxps_avx(auVar260,auVar34);
            auVar260 = vandps_avx(auVar155,auVar261);
            auVar260 = vmaxps_avx(auVar219,auVar260);
            local_720._0_4_ = auVar132._0_4_;
            local_720._4_4_ = auVar132._4_4_;
            fStack_718 = auVar132._8_4_;
            fStack_714 = auVar132._12_4_;
            auStack_710._0_4_ = auVar132._16_4_;
            auStack_710._4_4_ = auVar132._20_4_;
            fStack_708 = auVar132._24_4_;
            auVar34 = vcmpps_avx(auVar260,local_220,1);
            auVar260 = vblendvps_avx(auVar302,auVar283,auVar34);
            auVar156._0_4_ =
                 (float)local_660._0_4_ * (float)local_720._0_4_ +
                 fVar145 + (float)local_c0._0_4_ * (float)local_4c0._0_4_ +
                           (float)local_540._0_4_ * fVar169;
            auVar156._4_4_ =
                 (float)local_660._4_4_ * (float)local_720._4_4_ +
                 fVar162 + (float)local_c0._4_4_ * (float)local_4c0._4_4_ +
                           (float)local_540._4_4_ * fVar212;
            auVar156._8_4_ =
                 fStack_658 * fStack_718 + fVar285 + fStack_b8 * fStack_4b8 + fStack_538 * fVar226;
            auVar156._12_4_ =
                 fStack_654 * fStack_714 + fVar165 + fStack_b4 * fStack_4b4 + fStack_534 * fVar228;
            auVar156._16_4_ =
                 fStack_650 * (float)auStack_710._0_4_ +
                 fVar292 + fStack_b0 * fStack_4b0 + fStack_530 * fVar230;
            auVar156._20_4_ =
                 fStack_64c * (float)auStack_710._4_4_ +
                 fVar168 + fStack_ac * fStack_4ac + fStack_52c * fVar232;
            auVar156._24_4_ =
                 fStack_648 * fStack_708 + fVar171 + fStack_a8 * fStack_4a8 + fStack_528 * fVar233;
            auVar156._28_4_ = auVar219._28_4_ + fStack_504 + auVar283._28_4_ + 0.0;
            auVar283 = vblendvps_avx(auVar339,_local_400,auVar34);
            fVar298 = auVar39._0_4_;
            fVar173 = auVar39._4_4_;
            fVar189 = auVar39._8_4_;
            fVar190 = auVar39._12_4_;
            fVar191 = auVar39._16_4_;
            fVar194 = auVar39._20_4_;
            fVar207 = auVar39._24_4_;
            fVar208 = auVar39._28_4_;
            fVar252 = auVar260._0_4_;
            fVar163 = auVar260._4_4_;
            fVar166 = auVar260._8_4_;
            fVar170 = auVar260._12_4_;
            fVar212 = auVar260._16_4_;
            fVar228 = auVar260._20_4_;
            fVar232 = auVar260._24_4_;
            fVar263 = auVar25._0_4_;
            fVar325 = auVar25._4_4_;
            fVar327 = auVar25._8_4_;
            fVar329 = auVar25._12_4_;
            fVar330 = auVar25._16_4_;
            fVar331 = auVar25._20_4_;
            fVar332 = auVar25._24_4_;
            auVar315._0_4_ = fVar263 * fVar263 + fVar298 * fVar298;
            auVar315._4_4_ = fVar325 * fVar325 + fVar173 * fVar173;
            auVar315._8_4_ = fVar327 * fVar327 + fVar189 * fVar189;
            auVar315._12_4_ = fVar329 * fVar329 + fVar190 * fVar190;
            auVar315._16_4_ = fVar330 * fVar330 + fVar191 * fVar191;
            auVar315._20_4_ = fVar331 * fVar331 + fVar194 * fVar194;
            auVar315._24_4_ = fVar332 * fVar332 + fVar207 * fVar207;
            auVar315._28_4_ = fStack_124 + fStack_5a4;
            auVar34 = vrsqrtps_avx(auVar315);
            fVar264 = auVar34._0_4_;
            fVar231 = auVar34._4_4_;
            auVar74._4_4_ = fVar231 * 1.5;
            auVar74._0_4_ = fVar264 * 1.5;
            fVar235 = auVar34._8_4_;
            auVar74._8_4_ = fVar235 * 1.5;
            fVar266 = auVar34._12_4_;
            auVar74._12_4_ = fVar266 * 1.5;
            fVar234 = auVar34._16_4_;
            auVar74._16_4_ = fVar234 * 1.5;
            fVar267 = auVar34._20_4_;
            auVar74._20_4_ = fVar267 * 1.5;
            fVar236 = auVar34._24_4_;
            auVar74._24_4_ = fVar236 * 1.5;
            auVar74._28_4_ = auVar339._28_4_;
            auVar75._4_4_ = fVar231 * fVar231 * fVar231 * auVar315._4_4_ * 0.5;
            auVar75._0_4_ = fVar264 * fVar264 * fVar264 * auVar315._0_4_ * 0.5;
            auVar75._8_4_ = fVar235 * fVar235 * fVar235 * auVar315._8_4_ * 0.5;
            auVar75._12_4_ = fVar266 * fVar266 * fVar266 * auVar315._12_4_ * 0.5;
            auVar75._16_4_ = fVar234 * fVar234 * fVar234 * auVar315._16_4_ * 0.5;
            auVar75._20_4_ = fVar267 * fVar267 * fVar267 * auVar315._20_4_ * 0.5;
            auVar75._24_4_ = fVar236 * fVar236 * fVar236 * auVar315._24_4_ * 0.5;
            auVar75._28_4_ = auVar315._28_4_;
            auVar39 = vsubps_avx(auVar74,auVar75);
            fVar299 = auVar39._0_4_;
            fVar251 = auVar39._4_4_;
            fVar293 = auVar39._8_4_;
            fVar294 = auVar39._12_4_;
            fVar295 = auVar39._16_4_;
            fVar296 = auVar39._20_4_;
            fVar297 = auVar39._24_4_;
            fVar264 = auVar283._0_4_;
            fVar231 = auVar283._4_4_;
            fVar235 = auVar283._8_4_;
            fVar266 = auVar283._12_4_;
            fVar234 = auVar283._16_4_;
            fVar267 = auVar283._20_4_;
            fVar236 = auVar283._24_4_;
            auVar291._0_4_ = fVar264 * fVar264 + fVar252 * fVar252;
            auVar291._4_4_ = fVar231 * fVar231 + fVar163 * fVar163;
            auVar291._8_4_ = fVar235 * fVar235 + fVar166 * fVar166;
            auVar291._12_4_ = fVar266 * fVar266 + fVar170 * fVar170;
            auVar291._16_4_ = fVar234 * fVar234 + fVar212 * fVar212;
            auVar291._20_4_ = fVar267 * fVar267 + fVar228 * fVar228;
            auVar291._24_4_ = fVar236 * fVar236 + fVar232 * fVar232;
            auVar291._28_4_ = auVar34._28_4_ + auVar260._28_4_;
            auVar283 = vrsqrtps_avx(auVar291);
            fVar161 = auVar283._0_4_;
            fVar164 = auVar283._4_4_;
            auVar76._4_4_ = fVar164 * 1.5;
            auVar76._0_4_ = fVar161 * 1.5;
            fVar167 = auVar283._8_4_;
            auVar76._8_4_ = fVar167 * 1.5;
            fVar169 = auVar283._12_4_;
            auVar76._12_4_ = fVar169 * 1.5;
            fVar226 = auVar283._16_4_;
            auVar76._16_4_ = fVar226 * 1.5;
            fVar230 = auVar283._20_4_;
            auVar76._20_4_ = fVar230 * 1.5;
            fVar233 = auVar283._24_4_;
            auVar76._24_4_ = fVar233 * 1.5;
            auVar76._28_4_ = auVar339._28_4_;
            auVar77._4_4_ = fVar164 * fVar164 * fVar164 * auVar291._4_4_ * 0.5;
            auVar77._0_4_ = fVar161 * fVar161 * fVar161 * auVar291._0_4_ * 0.5;
            auVar77._8_4_ = fVar167 * fVar167 * fVar167 * auVar291._8_4_ * 0.5;
            auVar77._12_4_ = fVar169 * fVar169 * fVar169 * auVar291._12_4_ * 0.5;
            auVar77._16_4_ = fVar226 * fVar226 * fVar226 * auVar291._16_4_ * 0.5;
            auVar77._20_4_ = fVar230 * fVar230 * fVar230 * auVar291._20_4_ * 0.5;
            auVar77._24_4_ = fVar233 * fVar233 * fVar233 * auVar291._24_4_ * 0.5;
            auVar77._28_4_ = auVar291._28_4_;
            auVar260 = vsubps_avx(auVar76,auVar77);
            fVar161 = auVar260._0_4_;
            fVar164 = auVar260._4_4_;
            fVar167 = auVar260._8_4_;
            fVar169 = auVar260._12_4_;
            fVar226 = auVar260._16_4_;
            fVar230 = auVar260._20_4_;
            fVar233 = auVar260._24_4_;
            fVar263 = local_740 * fVar299 * fVar263;
            fVar325 = fStack_73c * fVar251 * fVar325;
            auVar78._4_4_ = fVar325;
            auVar78._0_4_ = fVar263;
            fVar327 = fStack_738 * fVar293 * fVar327;
            auVar78._8_4_ = fVar327;
            fVar329 = fStack_734 * fVar294 * fVar329;
            auVar78._12_4_ = fVar329;
            fVar330 = fStack_730 * fVar295 * fVar330;
            auVar78._16_4_ = fVar330;
            fVar331 = fStack_72c * fVar296 * fVar331;
            auVar78._20_4_ = fVar331;
            fVar332 = fStack_728 * fVar297 * fVar332;
            auVar78._24_4_ = fVar332;
            auVar78._28_4_ = auVar283._28_4_;
            local_720._4_4_ = fVar325 + (float)local_700._4_4_;
            local_720._0_4_ = fVar263 + (float)local_700._0_4_;
            fStack_718 = fVar327 + fStack_6f8;
            fStack_714 = fVar329 + fStack_6f4;
            auStack_710._0_4_ = fVar330 + register0x00001450;
            auStack_710._4_4_ = fVar331 + register0x00001454;
            fStack_708 = fVar332 + register0x00001458;
            fStack_704 = auVar283._28_4_ + register0x0000145c;
            fVar263 = local_740 * fVar299 * -fVar298;
            fVar325 = fStack_73c * fVar251 * -fVar173;
            auVar79._4_4_ = fVar325;
            auVar79._0_4_ = fVar263;
            fVar327 = fStack_738 * fVar293 * -fVar189;
            auVar79._8_4_ = fVar327;
            fVar329 = fStack_734 * fVar294 * -fVar190;
            auVar79._12_4_ = fVar329;
            fVar330 = fStack_730 * fVar295 * -fVar191;
            auVar79._16_4_ = fVar330;
            fVar331 = fStack_72c * fVar296 * -fVar194;
            auVar79._20_4_ = fVar331;
            fVar332 = fStack_728 * fVar297 * -fVar207;
            auVar79._24_4_ = fVar332;
            auVar79._28_4_ = -fVar208;
            local_4c0._4_4_ = auVar206._4_4_ + fVar325;
            local_4c0._0_4_ = auVar206._0_4_ + fVar263;
            fStack_4b8 = auVar206._8_4_ + fVar327;
            fStack_4b4 = auVar206._12_4_ + fVar329;
            fStack_4b0 = auVar206._16_4_ + fVar330;
            fStack_4ac = auVar206._20_4_ + fVar331;
            fStack_4a8 = auVar206._24_4_ + fVar332;
            fStack_4a4 = auVar206._28_4_ + -fVar208;
            fVar263 = fVar299 * 0.0 * local_740;
            fVar325 = fVar251 * 0.0 * fStack_73c;
            auVar80._4_4_ = fVar325;
            auVar80._0_4_ = fVar263;
            fVar327 = fVar293 * 0.0 * fStack_738;
            auVar80._8_4_ = fVar327;
            fVar329 = fVar294 * 0.0 * fStack_734;
            auVar80._12_4_ = fVar329;
            fVar330 = fVar295 * 0.0 * fStack_730;
            auVar80._16_4_ = fVar330;
            fVar331 = fVar296 * 0.0 * fStack_72c;
            auVar80._20_4_ = fVar331;
            fVar332 = fVar297 * 0.0 * fStack_728;
            auVar80._24_4_ = fVar332;
            auVar80._28_4_ = fVar208;
            auVar242 = vsubps_avx(_local_700,auVar78);
            auVar367._0_4_ = fVar263 + auVar156._0_4_;
            auVar367._4_4_ = fVar325 + auVar156._4_4_;
            auVar367._8_4_ = fVar327 + auVar156._8_4_;
            auVar367._12_4_ = fVar329 + auVar156._12_4_;
            auVar367._16_4_ = fVar330 + auVar156._16_4_;
            auVar367._20_4_ = fVar331 + auVar156._20_4_;
            auVar367._24_4_ = fVar332 + auVar156._24_4_;
            auVar367._28_4_ = fVar208 + auVar156._28_4_;
            fVar263 = auVar284._0_4_ * fVar161 * fVar264;
            fVar264 = auVar284._4_4_ * fVar164 * fVar231;
            auVar81._4_4_ = fVar264;
            auVar81._0_4_ = fVar263;
            fVar325 = auVar284._8_4_ * fVar167 * fVar235;
            auVar81._8_4_ = fVar325;
            fVar231 = auVar284._12_4_ * fVar169 * fVar266;
            auVar81._12_4_ = fVar231;
            fVar327 = auVar284._16_4_ * fVar226 * fVar234;
            auVar81._16_4_ = fVar327;
            fVar235 = auVar284._20_4_ * fVar230 * fVar267;
            auVar81._20_4_ = fVar235;
            fVar329 = auVar284._24_4_ * fVar233 * fVar236;
            auVar81._24_4_ = fVar329;
            auVar81._28_4_ = fStack_724;
            auVar35 = vsubps_avx(auVar206,auVar79);
            auVar346._0_4_ = (float)local_680._0_4_ + fVar263;
            auVar346._4_4_ = (float)local_680._4_4_ + fVar264;
            auVar346._8_4_ = fStack_678 + fVar325;
            auVar346._12_4_ = fStack_674 + fVar231;
            auVar346._16_4_ = register0x00001390 + fVar327;
            auVar346._20_4_ = register0x00001394 + fVar235;
            auVar346._24_4_ = register0x00001398 + fVar329;
            auVar346._28_4_ = register0x0000139c + fStack_724;
            fVar263 = fVar161 * -fVar252 * auVar284._0_4_;
            fVar264 = fVar164 * -fVar163 * auVar284._4_4_;
            auVar82._4_4_ = fVar264;
            auVar82._0_4_ = fVar263;
            fVar325 = fVar167 * -fVar166 * auVar284._8_4_;
            auVar82._8_4_ = fVar325;
            fVar231 = fVar169 * -fVar170 * auVar284._12_4_;
            auVar82._12_4_ = fVar231;
            fVar327 = fVar226 * -fVar212 * auVar284._16_4_;
            auVar82._16_4_ = fVar327;
            fVar235 = fVar230 * -fVar228 * auVar284._20_4_;
            auVar82._20_4_ = fVar235;
            fVar329 = fVar233 * -fVar232 * auVar284._24_4_;
            auVar82._24_4_ = fVar329;
            auVar82._28_4_ = register0x0000145c;
            auVar36 = vsubps_avx(auVar156,auVar80);
            auVar245._0_4_ = (float)local_600._0_4_ + fVar263;
            auVar245._4_4_ = (float)local_600._4_4_ + fVar264;
            auVar245._8_4_ = (float)uStack_5f8 + fVar325;
            auVar245._12_4_ = uStack_5f8._4_4_ + fVar231;
            auVar245._16_4_ = register0x00001350 + fVar327;
            auVar245._20_4_ = register0x00001354 + fVar235;
            auVar245._24_4_ = register0x00001358 + fVar329;
            auVar245._28_4_ = register0x0000135c + register0x0000145c;
            fVar263 = fVar161 * 0.0 * auVar284._0_4_;
            fVar264 = fVar164 * 0.0 * auVar284._4_4_;
            auVar83._4_4_ = fVar264;
            auVar83._0_4_ = fVar263;
            fVar325 = fVar167 * 0.0 * auVar284._8_4_;
            auVar83._8_4_ = fVar325;
            fVar231 = fVar169 * 0.0 * auVar284._12_4_;
            auVar83._12_4_ = fVar231;
            fVar327 = fVar226 * 0.0 * auVar284._16_4_;
            auVar83._16_4_ = fVar327;
            fVar235 = fVar230 * 0.0 * auVar284._20_4_;
            auVar83._20_4_ = fVar235;
            fVar329 = fVar233 * 0.0 * auVar284._24_4_;
            auVar83._24_4_ = fVar329;
            auVar83._28_4_ = auVar156._28_4_;
            auVar283 = vsubps_avx(_local_680,auVar81);
            auVar126._4_4_ = fStack_51c;
            auVar126._0_4_ = local_520;
            auVar126._8_4_ = fStack_518;
            auVar126._12_4_ = fStack_514;
            auVar126._16_4_ = fStack_510;
            auVar126._20_4_ = fStack_50c;
            auVar126._24_4_ = fStack_508;
            auVar126._28_4_ = fStack_504;
            auVar303._0_4_ = local_520 + fVar263;
            auVar303._4_4_ = fStack_51c + fVar264;
            auVar303._8_4_ = fStack_518 + fVar325;
            auVar303._12_4_ = fStack_514 + fVar231;
            auVar303._16_4_ = fStack_510 + fVar327;
            auVar303._20_4_ = fStack_50c + fVar235;
            auVar303._24_4_ = fStack_508 + fVar329;
            auVar303._28_4_ = fStack_504 + auVar156._28_4_;
            auVar34 = vsubps_avx(_local_600,auVar82);
            auVar39 = vsubps_avx(auVar126,auVar83);
            auVar25 = vsubps_avx(auVar245,auVar35);
            auVar219 = vsubps_avx(auVar303,auVar36);
            auVar84._4_4_ = auVar36._4_4_ * auVar25._4_4_;
            auVar84._0_4_ = auVar36._0_4_ * auVar25._0_4_;
            auVar84._8_4_ = auVar36._8_4_ * auVar25._8_4_;
            auVar84._12_4_ = auVar36._12_4_ * auVar25._12_4_;
            auVar84._16_4_ = auVar36._16_4_ * auVar25._16_4_;
            auVar84._20_4_ = auVar36._20_4_ * auVar25._20_4_;
            auVar84._24_4_ = auVar36._24_4_ * auVar25._24_4_;
            auVar84._28_4_ = auVar339._28_4_;
            auVar85._4_4_ = auVar35._4_4_ * auVar219._4_4_;
            auVar85._0_4_ = auVar35._0_4_ * auVar219._0_4_;
            auVar85._8_4_ = auVar35._8_4_ * auVar219._8_4_;
            auVar85._12_4_ = auVar35._12_4_ * auVar219._12_4_;
            auVar85._16_4_ = auVar35._16_4_ * auVar219._16_4_;
            auVar85._20_4_ = auVar35._20_4_ * auVar219._20_4_;
            auVar85._24_4_ = auVar35._24_4_ * auVar219._24_4_;
            auVar85._28_4_ = fStack_504;
            auVar281 = vsubps_avx(auVar85,auVar84);
            auVar86._4_4_ = auVar242._4_4_ * auVar219._4_4_;
            auVar86._0_4_ = auVar242._0_4_ * auVar219._0_4_;
            auVar86._8_4_ = auVar242._8_4_ * auVar219._8_4_;
            auVar86._12_4_ = auVar242._12_4_ * auVar219._12_4_;
            auVar86._16_4_ = auVar242._16_4_ * auVar219._16_4_;
            auVar86._20_4_ = auVar242._20_4_ * auVar219._20_4_;
            auVar86._24_4_ = auVar242._24_4_ * auVar219._24_4_;
            auVar86._28_4_ = auVar219._28_4_;
            auVar219 = vsubps_avx(auVar346,auVar242);
            auVar87._4_4_ = auVar36._4_4_ * auVar219._4_4_;
            auVar87._0_4_ = auVar36._0_4_ * auVar219._0_4_;
            auVar87._8_4_ = auVar36._8_4_ * auVar219._8_4_;
            auVar87._12_4_ = auVar36._12_4_ * auVar219._12_4_;
            auVar87._16_4_ = auVar36._16_4_ * auVar219._16_4_;
            auVar87._20_4_ = auVar36._20_4_ * auVar219._20_4_;
            auVar87._24_4_ = auVar36._24_4_ * auVar219._24_4_;
            auVar87._28_4_ = auVar260._28_4_;
            auVar313 = vsubps_avx(auVar87,auVar86);
            auVar88._4_4_ = auVar35._4_4_ * auVar219._4_4_;
            auVar88._0_4_ = auVar35._0_4_ * auVar219._0_4_;
            auVar88._8_4_ = auVar35._8_4_ * auVar219._8_4_;
            auVar88._12_4_ = auVar35._12_4_ * auVar219._12_4_;
            auVar88._16_4_ = auVar35._16_4_ * auVar219._16_4_;
            auVar88._20_4_ = auVar35._20_4_ * auVar219._20_4_;
            auVar88._24_4_ = auVar35._24_4_ * auVar219._24_4_;
            auVar88._28_4_ = auVar260._28_4_;
            auVar89._4_4_ = auVar242._4_4_ * auVar25._4_4_;
            auVar89._0_4_ = auVar242._0_4_ * auVar25._0_4_;
            auVar89._8_4_ = auVar242._8_4_ * auVar25._8_4_;
            auVar89._12_4_ = auVar242._12_4_ * auVar25._12_4_;
            auVar89._16_4_ = auVar242._16_4_ * auVar25._16_4_;
            auVar89._20_4_ = auVar242._20_4_ * auVar25._20_4_;
            auVar89._24_4_ = auVar242._24_4_ * auVar25._24_4_;
            auVar89._28_4_ = auVar25._28_4_;
            auVar260 = vsubps_avx(auVar89,auVar88);
            auVar182._0_4_ = auVar281._0_4_ * 0.0 + auVar260._0_4_ + auVar313._0_4_ * 0.0;
            auVar182._4_4_ = auVar281._4_4_ * 0.0 + auVar260._4_4_ + auVar313._4_4_ * 0.0;
            auVar182._8_4_ = auVar281._8_4_ * 0.0 + auVar260._8_4_ + auVar313._8_4_ * 0.0;
            auVar182._12_4_ = auVar281._12_4_ * 0.0 + auVar260._12_4_ + auVar313._12_4_ * 0.0;
            auVar182._16_4_ = auVar281._16_4_ * 0.0 + auVar260._16_4_ + auVar313._16_4_ * 0.0;
            auVar182._20_4_ = auVar281._20_4_ * 0.0 + auVar260._20_4_ + auVar313._20_4_ * 0.0;
            auVar182._24_4_ = auVar281._24_4_ * 0.0 + auVar260._24_4_ + auVar313._24_4_ * 0.0;
            auVar182._28_4_ = auVar281._28_4_ + auVar260._28_4_ + auVar313._28_4_;
            auVar336 = vcmpps_avx(auVar182,ZEXT832(0) << 0x20,2);
            auVar283 = vblendvps_avx(auVar283,_local_720,auVar336);
            auVar224 = ZEXT3264(auVar283);
            auVar260 = vblendvps_avx(auVar34,_local_4c0,auVar336);
            auVar34 = vblendvps_avx(auVar39,auVar367,auVar336);
            auVar39 = vblendvps_avx(auVar242,auVar346,auVar336);
            auVar25 = vblendvps_avx(auVar35,auVar245,auVar336);
            auVar219 = vblendvps_avx(auVar36,auVar303,auVar336);
            auVar242 = vblendvps_avx(auVar346,auVar242,auVar336);
            auVar281 = vblendvps_avx(auVar245,auVar35,auVar336);
            auVar313 = vblendvps_avx(auVar303,auVar36,auVar336);
            _local_780 = vandps_avx(auVar184,auVar223);
            auVar242 = vsubps_avx(auVar242,auVar283);
            auVar37 = vsubps_avx(auVar281,auVar260);
            auVar313 = vsubps_avx(auVar313,auVar34);
            auVar184 = vsubps_avx(auVar260,auVar25);
            fVar263 = auVar37._0_4_;
            fVar145 = auVar34._0_4_;
            fVar266 = auVar37._4_4_;
            fVar162 = auVar34._4_4_;
            auVar90._4_4_ = fVar162 * fVar266;
            auVar90._0_4_ = fVar145 * fVar263;
            fVar252 = auVar37._8_4_;
            fVar285 = auVar34._8_4_;
            auVar90._8_4_ = fVar285 * fVar252;
            fVar169 = auVar37._12_4_;
            fVar165 = auVar34._12_4_;
            auVar90._12_4_ = fVar165 * fVar169;
            fVar299 = auVar37._16_4_;
            fVar292 = auVar34._16_4_;
            auVar90._16_4_ = fVar292 * fVar299;
            fVar298 = auVar37._20_4_;
            fVar168 = auVar34._20_4_;
            auVar90._20_4_ = fVar168 * fVar298;
            fVar208 = auVar37._24_4_;
            fVar171 = auVar34._24_4_;
            auVar90._24_4_ = fVar171 * fVar208;
            auVar90._28_4_ = auVar281._28_4_;
            fVar264 = auVar260._0_4_;
            fVar172 = auVar313._0_4_;
            fVar330 = auVar260._4_4_;
            fVar193 = auVar313._4_4_;
            auVar91._4_4_ = fVar193 * fVar330;
            auVar91._0_4_ = fVar172 * fVar264;
            fVar161 = auVar260._8_4_;
            fVar274 = auVar313._8_4_;
            auVar91._8_4_ = fVar274 * fVar161;
            fVar212 = auVar260._12_4_;
            fVar304 = auVar313._12_4_;
            auVar91._12_4_ = fVar304 * fVar212;
            fVar251 = auVar260._16_4_;
            fVar306 = auVar313._16_4_;
            auVar91._16_4_ = fVar306 * fVar251;
            fVar173 = auVar260._20_4_;
            fVar250 = auVar313._20_4_;
            auVar91._20_4_ = fVar250 * fVar173;
            fVar210 = auVar260._24_4_;
            fVar311 = auVar313._24_4_;
            uVar13 = auVar35._28_4_;
            auVar91._24_4_ = fVar311 * fVar210;
            auVar91._28_4_ = uVar13;
            auVar281 = vsubps_avx(auVar91,auVar90);
            fVar325 = auVar283._0_4_;
            fVar234 = auVar283._4_4_;
            auVar92._4_4_ = fVar193 * fVar234;
            auVar92._0_4_ = fVar172 * fVar325;
            fVar163 = auVar283._8_4_;
            auVar92._8_4_ = fVar274 * fVar163;
            fVar226 = auVar283._12_4_;
            auVar92._12_4_ = fVar304 * fVar226;
            fVar293 = auVar283._16_4_;
            auVar92._16_4_ = fVar306 * fVar293;
            fVar189 = auVar283._20_4_;
            auVar92._20_4_ = fVar250 * fVar189;
            fVar305 = auVar283._24_4_;
            auVar92._24_4_ = fVar311 * fVar305;
            auVar92._28_4_ = uVar13;
            fVar231 = auVar242._0_4_;
            fVar331 = auVar242._4_4_;
            auVar93._4_4_ = fVar162 * fVar331;
            auVar93._0_4_ = fVar145 * fVar231;
            fVar164 = auVar242._8_4_;
            auVar93._8_4_ = fVar285 * fVar164;
            fVar228 = auVar242._12_4_;
            auVar93._12_4_ = fVar165 * fVar228;
            fVar294 = auVar242._16_4_;
            auVar93._16_4_ = fVar292 * fVar294;
            fVar190 = auVar242._20_4_;
            auVar93._20_4_ = fVar168 * fVar190;
            fVar307 = auVar242._24_4_;
            auVar93._24_4_ = fVar171 * fVar307;
            auVar93._28_4_ = auVar346._28_4_;
            auVar35 = vsubps_avx(auVar93,auVar92);
            auVar94._4_4_ = fVar330 * fVar331;
            auVar94._0_4_ = fVar264 * fVar231;
            auVar94._8_4_ = fVar161 * fVar164;
            auVar94._12_4_ = fVar212 * fVar228;
            auVar94._16_4_ = fVar251 * fVar294;
            auVar94._20_4_ = fVar173 * fVar190;
            auVar94._24_4_ = fVar210 * fVar307;
            auVar94._28_4_ = uVar13;
            auVar95._4_4_ = fVar234 * fVar266;
            auVar95._0_4_ = fVar325 * fVar263;
            auVar95._8_4_ = fVar163 * fVar252;
            auVar95._12_4_ = fVar226 * fVar169;
            auVar95._16_4_ = fVar293 * fVar299;
            auVar95._20_4_ = fVar189 * fVar298;
            auVar95._24_4_ = fVar305 * fVar208;
            auVar95._28_4_ = auVar36._28_4_;
            auVar36 = vsubps_avx(auVar95,auVar94);
            auVar38 = vsubps_avx(auVar34,auVar219);
            fVar235 = auVar36._28_4_ + auVar35._28_4_;
            local_700._0_4_ = auVar36._0_4_ + auVar35._0_4_ * 0.0 + auVar281._0_4_ * 0.0;
            local_700._4_4_ = auVar36._4_4_ + auVar35._4_4_ * 0.0 + auVar281._4_4_ * 0.0;
            fStack_6f8 = auVar36._8_4_ + auVar35._8_4_ * 0.0 + auVar281._8_4_ * 0.0;
            fStack_6f4 = auVar36._12_4_ + auVar35._12_4_ * 0.0 + auVar281._12_4_ * 0.0;
            register0x00001490 = auVar36._16_4_ + auVar35._16_4_ * 0.0 + auVar281._16_4_ * 0.0;
            register0x00001494 = auVar36._20_4_ + auVar35._20_4_ * 0.0 + auVar281._20_4_ * 0.0;
            register0x00001498 = auVar36._24_4_ + auVar35._24_4_ * 0.0 + auVar281._24_4_ * 0.0;
            register0x0000149c = fVar235 + auVar281._28_4_;
            fVar327 = auVar184._0_4_;
            fVar267 = auVar184._4_4_;
            auVar96._4_4_ = auVar219._4_4_ * fVar267;
            auVar96._0_4_ = auVar219._0_4_ * fVar327;
            fVar166 = auVar184._8_4_;
            auVar96._8_4_ = auVar219._8_4_ * fVar166;
            fVar230 = auVar184._12_4_;
            auVar96._12_4_ = auVar219._12_4_ * fVar230;
            fVar295 = auVar184._16_4_;
            auVar96._16_4_ = auVar219._16_4_ * fVar295;
            fVar191 = auVar184._20_4_;
            auVar96._20_4_ = auVar219._20_4_ * fVar191;
            fVar308 = auVar184._24_4_;
            auVar96._24_4_ = auVar219._24_4_ * fVar308;
            auVar96._28_4_ = fVar235;
            fVar235 = auVar38._0_4_;
            fVar332 = auVar38._4_4_;
            auVar97._4_4_ = auVar25._4_4_ * fVar332;
            auVar97._0_4_ = auVar25._0_4_ * fVar235;
            fVar167 = auVar38._8_4_;
            auVar97._8_4_ = auVar25._8_4_ * fVar167;
            fVar232 = auVar38._12_4_;
            auVar97._12_4_ = auVar25._12_4_ * fVar232;
            fVar296 = auVar38._16_4_;
            auVar97._16_4_ = auVar25._16_4_ * fVar296;
            fVar194 = auVar38._20_4_;
            auVar97._20_4_ = auVar25._20_4_ * fVar194;
            fVar309 = auVar38._24_4_;
            auVar97._24_4_ = auVar25._24_4_ * fVar309;
            auVar97._28_4_ = auVar36._28_4_;
            auVar184 = vsubps_avx(auVar97,auVar96);
            auVar35 = vsubps_avx(auVar283,auVar39);
            fVar329 = auVar35._0_4_;
            fVar236 = auVar35._4_4_;
            auVar98._4_4_ = auVar219._4_4_ * fVar236;
            auVar98._0_4_ = auVar219._0_4_ * fVar329;
            fVar170 = auVar35._8_4_;
            auVar98._8_4_ = auVar219._8_4_ * fVar170;
            fVar233 = auVar35._12_4_;
            auVar98._12_4_ = auVar219._12_4_ * fVar233;
            fVar297 = auVar35._16_4_;
            auVar98._16_4_ = auVar219._16_4_ * fVar297;
            fVar207 = auVar35._20_4_;
            auVar98._20_4_ = auVar219._20_4_ * fVar207;
            fVar310 = auVar35._24_4_;
            auVar98._24_4_ = auVar219._24_4_ * fVar310;
            auVar98._28_4_ = auVar219._28_4_;
            auVar99._4_4_ = fVar332 * auVar39._4_4_;
            auVar99._0_4_ = fVar235 * auVar39._0_4_;
            auVar99._8_4_ = fVar167 * auVar39._8_4_;
            auVar99._12_4_ = fVar232 * auVar39._12_4_;
            auVar99._16_4_ = fVar296 * auVar39._16_4_;
            auVar99._20_4_ = fVar194 * auVar39._20_4_;
            auVar99._24_4_ = fVar309 * auVar39._24_4_;
            auVar99._28_4_ = auVar281._28_4_;
            auVar219 = vsubps_avx(auVar98,auVar99);
            auVar100._4_4_ = auVar25._4_4_ * fVar236;
            auVar100._0_4_ = auVar25._0_4_ * fVar329;
            auVar100._8_4_ = auVar25._8_4_ * fVar170;
            auVar100._12_4_ = auVar25._12_4_ * fVar233;
            auVar100._16_4_ = auVar25._16_4_ * fVar297;
            auVar100._20_4_ = auVar25._20_4_ * fVar207;
            auVar100._24_4_ = auVar25._24_4_ * fVar310;
            auVar100._28_4_ = auVar25._28_4_;
            auVar101._4_4_ = fVar267 * auVar39._4_4_;
            auVar101._0_4_ = fVar327 * auVar39._0_4_;
            auVar101._8_4_ = fVar166 * auVar39._8_4_;
            auVar101._12_4_ = fVar230 * auVar39._12_4_;
            auVar101._16_4_ = fVar295 * auVar39._16_4_;
            auVar101._20_4_ = fVar191 * auVar39._20_4_;
            auVar101._24_4_ = fVar308 * auVar39._24_4_;
            auVar101._28_4_ = auVar39._28_4_;
            auVar39 = vsubps_avx(auVar101,auVar100);
            auVar157._0_4_ = auVar184._0_4_ * 0.0 + auVar39._0_4_ + auVar219._0_4_ * 0.0;
            auVar157._4_4_ = auVar184._4_4_ * 0.0 + auVar39._4_4_ + auVar219._4_4_ * 0.0;
            auVar157._8_4_ = auVar184._8_4_ * 0.0 + auVar39._8_4_ + auVar219._8_4_ * 0.0;
            auVar157._12_4_ = auVar184._12_4_ * 0.0 + auVar39._12_4_ + auVar219._12_4_ * 0.0;
            auVar157._16_4_ = auVar184._16_4_ * 0.0 + auVar39._16_4_ + auVar219._16_4_ * 0.0;
            auVar157._20_4_ = auVar184._20_4_ * 0.0 + auVar39._20_4_ + auVar219._20_4_ * 0.0;
            auVar157._24_4_ = auVar184._24_4_ * 0.0 + auVar39._24_4_ + auVar219._24_4_ * 0.0;
            auVar157._28_4_ = auVar219._28_4_ + auVar39._28_4_ + auVar219._28_4_;
            auVar160 = ZEXT3264(auVar157);
            auVar184 = vmaxps_avx(_local_700,auVar157);
            auVar184 = vcmpps_avx(auVar184,ZEXT432(0) << 0x20,2);
            auVar39 = _local_780 & auVar184;
            if ((((((((auVar39 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar39 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar39 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar39 >> 0x7f,0) == '\0') &&
                  (auVar39 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar39 >> 0xbf,0) == '\0') &&
                (auVar39 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar39[0x1f]) {
LAB_0104a5e8:
              auVar188 = ZEXT3264(CONCAT824(local_460[1]._24_8_,
                                            CONCAT816(local_460[1]._16_8_,
                                                      CONCAT88(local_460[1]._8_8_,local_460[1]._0_8_
                                                              ))));
              auVar359 = ZEXT3264(local_420);
              auVar316._4_4_ = fStack_73c;
              auVar316._0_4_ = local_740;
              auVar316._8_4_ = fStack_738;
              auVar316._12_4_ = fStack_734;
              auVar316._16_4_ = fStack_730;
              auVar316._20_4_ = fStack_72c;
              auVar316._24_4_ = fStack_728;
              auVar316._28_4_ = fStack_724;
            }
            else {
              auVar39 = vandps_avx(auVar184,_local_780);
              auVar102._4_4_ = fVar332 * fVar266;
              auVar102._0_4_ = fVar235 * fVar263;
              auVar102._8_4_ = fVar167 * fVar252;
              auVar102._12_4_ = fVar232 * fVar169;
              auVar102._16_4_ = fVar296 * fVar299;
              auVar102._20_4_ = fVar194 * fVar298;
              auVar102._24_4_ = fVar309 * fVar208;
              auVar102._28_4_ = local_780._28_4_;
              auVar103._4_4_ = fVar267 * fVar193;
              auVar103._0_4_ = fVar327 * fVar172;
              auVar103._8_4_ = fVar166 * fVar274;
              auVar103._12_4_ = fVar230 * fVar304;
              auVar103._16_4_ = fVar295 * fVar306;
              auVar103._20_4_ = fVar191 * fVar250;
              auVar103._24_4_ = fVar308 * fVar311;
              auVar103._28_4_ = auVar184._28_4_;
              auVar25 = vsubps_avx(auVar103,auVar102);
              auVar104._4_4_ = fVar236 * fVar193;
              auVar104._0_4_ = fVar329 * fVar172;
              auVar104._8_4_ = fVar170 * fVar274;
              auVar104._12_4_ = fVar233 * fVar304;
              auVar104._16_4_ = fVar297 * fVar306;
              auVar104._20_4_ = fVar207 * fVar250;
              auVar104._24_4_ = fVar310 * fVar311;
              auVar104._28_4_ = auVar313._28_4_;
              auVar105._4_4_ = fVar332 * fVar331;
              auVar105._0_4_ = fVar235 * fVar231;
              auVar105._8_4_ = fVar167 * fVar164;
              auVar105._12_4_ = fVar232 * fVar228;
              auVar105._16_4_ = fVar296 * fVar294;
              auVar105._20_4_ = fVar194 * fVar190;
              auVar105._24_4_ = fVar309 * fVar307;
              auVar105._28_4_ = auVar38._28_4_;
              auVar219 = vsubps_avx(auVar105,auVar104);
              auVar106._4_4_ = fVar267 * fVar331;
              auVar106._0_4_ = fVar327 * fVar231;
              auVar106._8_4_ = fVar166 * fVar164;
              auVar106._12_4_ = fVar230 * fVar228;
              auVar106._16_4_ = fVar295 * fVar294;
              auVar106._20_4_ = fVar191 * fVar190;
              auVar106._24_4_ = fVar308 * fVar307;
              auVar106._28_4_ = auVar242._28_4_;
              auVar107._4_4_ = fVar236 * fVar266;
              auVar107._0_4_ = fVar329 * fVar263;
              auVar107._8_4_ = fVar170 * fVar252;
              auVar107._12_4_ = fVar233 * fVar169;
              auVar107._16_4_ = fVar297 * fVar299;
              auVar107._20_4_ = fVar207 * fVar298;
              auVar107._24_4_ = fVar310 * fVar208;
              auVar107._28_4_ = auVar37._28_4_;
              auVar281 = vsubps_avx(auVar107,auVar106);
              auVar183._0_4_ = auVar25._0_4_ * 0.0 + auVar281._0_4_ + auVar219._0_4_ * 0.0;
              auVar183._4_4_ = auVar25._4_4_ * 0.0 + auVar281._4_4_ + auVar219._4_4_ * 0.0;
              auVar183._8_4_ = auVar25._8_4_ * 0.0 + auVar281._8_4_ + auVar219._8_4_ * 0.0;
              auVar183._12_4_ = auVar25._12_4_ * 0.0 + auVar281._12_4_ + auVar219._12_4_ * 0.0;
              auVar183._16_4_ = auVar25._16_4_ * 0.0 + auVar281._16_4_ + auVar219._16_4_ * 0.0;
              auVar183._20_4_ = auVar25._20_4_ * 0.0 + auVar281._20_4_ + auVar219._20_4_ * 0.0;
              auVar183._24_4_ = auVar25._24_4_ * 0.0 + auVar281._24_4_ + auVar219._24_4_ * 0.0;
              auVar183._28_4_ = auVar37._28_4_ + auVar281._28_4_ + auVar242._28_4_;
              auVar184 = vrcpps_avx(auVar183);
              fVar231 = auVar184._0_4_;
              fVar327 = auVar184._4_4_;
              auVar108._4_4_ = auVar183._4_4_ * fVar327;
              auVar108._0_4_ = auVar183._0_4_ * fVar231;
              fVar235 = auVar184._8_4_;
              auVar108._8_4_ = auVar183._8_4_ * fVar235;
              fVar329 = auVar184._12_4_;
              auVar108._12_4_ = auVar183._12_4_ * fVar329;
              fVar266 = auVar184._16_4_;
              auVar108._16_4_ = auVar183._16_4_ * fVar266;
              fVar331 = auVar184._20_4_;
              auVar108._20_4_ = auVar183._20_4_ * fVar331;
              fVar267 = auVar184._24_4_;
              auVar108._24_4_ = auVar183._24_4_ * fVar267;
              auVar108._28_4_ = auVar38._28_4_;
              auVar340._8_4_ = 0x3f800000;
              auVar340._0_8_ = &DAT_3f8000003f800000;
              auVar340._12_4_ = 0x3f800000;
              auVar340._16_4_ = 0x3f800000;
              auVar340._20_4_ = 0x3f800000;
              auVar340._24_4_ = 0x3f800000;
              auVar340._28_4_ = 0x3f800000;
              auVar184 = vsubps_avx(auVar340,auVar108);
              fVar231 = auVar184._0_4_ * fVar231 + fVar231;
              fVar327 = auVar184._4_4_ * fVar327 + fVar327;
              fVar235 = auVar184._8_4_ * fVar235 + fVar235;
              fVar329 = auVar184._12_4_ * fVar329 + fVar329;
              fVar266 = auVar184._16_4_ * fVar266 + fVar266;
              fVar331 = auVar184._20_4_ * fVar331 + fVar331;
              fVar267 = auVar184._24_4_ * fVar267 + fVar267;
              auVar109._4_4_ =
                   (fVar234 * auVar25._4_4_ + auVar219._4_4_ * fVar330 + auVar281._4_4_ * fVar162) *
                   fVar327;
              auVar109._0_4_ =
                   (fVar325 * auVar25._0_4_ + auVar219._0_4_ * fVar264 + auVar281._0_4_ * fVar145) *
                   fVar231;
              auVar109._8_4_ =
                   (fVar163 * auVar25._8_4_ + auVar219._8_4_ * fVar161 + auVar281._8_4_ * fVar285) *
                   fVar235;
              auVar109._12_4_ =
                   (fVar226 * auVar25._12_4_ + auVar219._12_4_ * fVar212 + auVar281._12_4_ * fVar165
                   ) * fVar329;
              auVar109._16_4_ =
                   (fVar293 * auVar25._16_4_ + auVar219._16_4_ * fVar251 + auVar281._16_4_ * fVar292
                   ) * fVar266;
              auVar109._20_4_ =
                   (fVar189 * auVar25._20_4_ + auVar219._20_4_ * fVar173 + auVar281._20_4_ * fVar168
                   ) * fVar331;
              auVar109._24_4_ =
                   (fVar305 * auVar25._24_4_ + auVar219._24_4_ * fVar210 + auVar281._24_4_ * fVar171
                   ) * fVar267;
              auVar109._28_4_ = auVar283._28_4_ + auVar260._28_4_ + auVar34._28_4_;
              auVar224 = ZEXT3264(auVar109);
              fVar263 = (ray->super_RayK<1>).tfar;
              auVar246._4_4_ = fVar263;
              auVar246._0_4_ = fVar263;
              auVar246._8_4_ = fVar263;
              auVar246._12_4_ = fVar263;
              auVar246._16_4_ = fVar263;
              auVar246._20_4_ = fVar263;
              auVar246._24_4_ = fVar263;
              auVar246._28_4_ = fVar263;
              auVar184 = vcmpps_avx(local_100,auVar109,2);
              auVar283 = vcmpps_avx(auVar109,auVar246,2);
              auVar184 = vandps_avx(auVar184,auVar283);
              auVar260 = auVar39 & auVar184;
              if ((((((((auVar260 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar260 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar260 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar260 >> 0x7f,0) == '\0') &&
                    (auVar260 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar260 >> 0xbf,0) == '\0') &&
                  (auVar260 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar260[0x1f]) goto LAB_0104a5e8;
              auVar184 = vandps_avx(auVar39,auVar184);
              auVar260 = vcmpps_avx(ZEXT432(0) << 0x20,auVar183,4);
              auVar34 = auVar184 & auVar260;
              auVar188 = ZEXT3264(CONCAT824(local_460[1]._24_8_,
                                            CONCAT816(local_460[1]._16_8_,
                                                      CONCAT88(local_460[1]._8_8_,local_460[1]._0_8_
                                                              ))));
              auVar359 = ZEXT3264(local_420);
              auVar316._4_4_ = fStack_73c;
              auVar316._0_4_ = local_740;
              auVar316._8_4_ = fStack_738;
              auVar316._12_4_ = fStack_734;
              auVar316._16_4_ = fStack_730;
              auVar316._20_4_ = fStack_72c;
              auVar316._24_4_ = fStack_728;
              auVar316._28_4_ = fStack_724;
              if ((((((((auVar34 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar34 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar34 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar34 >> 0x7f,0) != '\0') ||
                    (auVar34 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar34 >> 0xbf,0) != '\0') ||
                  (auVar34 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar34[0x1f] < '\0') {
                auVar184 = vandps_avx(auVar260,auVar184);
                auVar188 = ZEXT3264(auVar184);
                auVar110._4_4_ = fVar327 * (float)local_700._4_4_;
                auVar110._0_4_ = fVar231 * (float)local_700._0_4_;
                auVar110._8_4_ = fVar235 * fStack_6f8;
                auVar110._12_4_ = fVar329 * fStack_6f4;
                auVar110._16_4_ = fVar266 * register0x00001490;
                auVar110._20_4_ = fVar331 * register0x00001494;
                auVar110._24_4_ = fVar267 * register0x00001498;
                auVar110._28_4_ = auVar283._28_4_;
                auVar111._4_4_ = auVar157._4_4_ * fVar327;
                auVar111._0_4_ = auVar157._0_4_ * fVar231;
                auVar111._8_4_ = auVar157._8_4_ * fVar235;
                auVar111._12_4_ = auVar157._12_4_ * fVar329;
                auVar111._16_4_ = auVar157._16_4_ * fVar266;
                auVar111._20_4_ = auVar157._20_4_ * fVar331;
                auVar111._24_4_ = auVar157._24_4_ * fVar267;
                auVar111._28_4_ = auVar157._28_4_;
                auVar273._8_4_ = 0x3f800000;
                auVar273._0_8_ = &DAT_3f8000003f800000;
                auVar273._12_4_ = 0x3f800000;
                auVar273._16_4_ = 0x3f800000;
                auVar273._20_4_ = 0x3f800000;
                auVar273._24_4_ = 0x3f800000;
                auVar273._28_4_ = 0x3f800000;
                auVar184 = vsubps_avx(auVar273,auVar110);
                local_e0 = vblendvps_avx(auVar184,auVar110,auVar336);
                auVar184 = vsubps_avx(auVar273,auVar111);
                _local_1a0 = vblendvps_avx(auVar184,auVar111,auVar336);
                auVar160 = ZEXT3264(_local_1a0);
                auVar359 = ZEXT3264(auVar109);
              }
            }
            auVar360 = ZEXT3264(_local_760);
            auVar184 = auVar188._0_32_;
            auVar347 = ZEXT3264(local_640);
            local_420 = auVar359._0_32_;
            if ((((((((auVar184 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar184 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar184 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar184 >> 0x7f,0) != '\0') ||
                  (auVar188 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
                 SUB321(auVar184 >> 0xbf,0) != '\0') ||
                (auVar188 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
                auVar188[0x1f] < '\0') {
              auVar283 = vsubps_avx(auVar284,auVar316);
              auVar224 = ZEXT3264(local_e0);
              fVar264 = auVar316._0_4_ + auVar283._0_4_ * local_e0._0_4_;
              fVar325 = auVar316._4_4_ + auVar283._4_4_ * local_e0._4_4_;
              fVar231 = auVar316._8_4_ + auVar283._8_4_ * local_e0._8_4_;
              fVar327 = auVar316._12_4_ + auVar283._12_4_ * local_e0._12_4_;
              fVar235 = auVar316._16_4_ + auVar283._16_4_ * local_e0._16_4_;
              fVar329 = auVar316._20_4_ + auVar283._20_4_ * local_e0._20_4_;
              fVar266 = auVar316._24_4_ + auVar283._24_4_ * local_e0._24_4_;
              fVar330 = auVar316._28_4_ + auVar283._28_4_;
              fVar263 = local_7b8->depth_scale;
              auVar112._4_4_ = (fVar325 + fVar325) * fVar263;
              auVar112._0_4_ = (fVar264 + fVar264) * fVar263;
              auVar112._8_4_ = (fVar231 + fVar231) * fVar263;
              auVar112._12_4_ = (fVar327 + fVar327) * fVar263;
              auVar112._16_4_ = (fVar235 + fVar235) * fVar263;
              auVar112._20_4_ = (fVar329 + fVar329) * fVar263;
              auVar112._24_4_ = (fVar266 + fVar266) * fVar263;
              auVar112._28_4_ = fVar330 + fVar330;
              auVar283 = vcmpps_avx(local_420,auVar112,6);
              auVar160 = ZEXT3264(auVar283);
              auVar260 = auVar184 & auVar283;
              if ((((((((auVar260 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar260 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar260 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar260 >> 0x7f,0) != '\0') ||
                    (auVar260 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar260 >> 0xbf,0) != '\0') ||
                  (auVar260 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar260[0x1f] < '\0') {
                auVar184 = vandps_avx(auVar283,auVar184);
                auVar160 = ZEXT3264(auVar184);
                local_360 = (float)local_1a0._0_4_ + (float)local_1a0._0_4_ + -1.0;
                fStack_35c = (float)local_1a0._4_4_ + (float)local_1a0._4_4_ + -1.0;
                fStack_358 = fStack_198 + fStack_198 + -1.0;
                fStack_354 = fStack_194 + fStack_194 + -1.0;
                fStack_350 = fStack_190 + fStack_190 + -1.0;
                fStack_34c = fStack_18c + fStack_18c + -1.0;
                fStack_348 = fStack_188 + fStack_188 + -1.0;
                fStack_344 = fStack_184 + fStack_184 + -1.0;
                local_380 = local_e0;
                local_340 = local_420;
                local_31c = uVar17;
                local_310 = local_7d0;
                uStack_308 = uStack_7c8;
                local_300 = local_580;
                uStack_2f8 = uStack_578;
                local_2f0 = local_590;
                uStack_2e8 = uStack_588;
                auVar188 = ZEXT1664(_local_570);
                local_2e0 = _local_570;
                local_2c0 = auVar184;
                auVar144 = (undefined1  [8])(context->scene->geometries).items[local_7e0].ptr;
                local_1a0._4_4_ = fStack_35c;
                local_1a0._0_4_ = local_360;
                fStack_198 = fStack_358;
                fStack_194 = fStack_354;
                fStack_190 = fStack_350;
                fStack_18c = fStack_34c;
                fStack_188 = fStack_348;
                fStack_184 = fStack_344;
                if ((((Geometry *)auVar144)->mask & (ray->super_RayK<1>).mask) != 0) {
                  local_460[0] = auVar184;
                  auVar200._0_4_ = (float)(int)local_320;
                  auVar200._4_8_ = SUB128(ZEXT812(0),4);
                  auVar200._12_4_ = 0;
                  auVar255 = vshufps_avx(auVar200,auVar200,0);
                  local_2a0[0] = (auVar255._0_4_ + local_e0._0_4_ + 0.0) * (float)local_120._0_4_;
                  local_2a0[1] = (auVar255._4_4_ + local_e0._4_4_ + 1.0) * (float)local_120._4_4_;
                  local_2a0[2] = (auVar255._8_4_ + local_e0._8_4_ + 2.0) * fStack_118;
                  local_2a0[3] = (auVar255._12_4_ + local_e0._12_4_ + 3.0) * fStack_114;
                  fStack_290 = (auVar255._0_4_ + local_e0._16_4_ + 4.0) * fStack_110;
                  fStack_28c = (auVar255._4_4_ + local_e0._20_4_ + 5.0) * fStack_10c;
                  fStack_288 = (auVar255._8_4_ + local_e0._24_4_ + 6.0) * fStack_108;
                  fStack_284 = auVar255._12_4_ + local_e0._28_4_ + 7.0;
                  local_280 = CONCAT44(fStack_35c,local_360);
                  uStack_278 = CONCAT44(fStack_354,fStack_358);
                  uStack_270 = CONCAT44(fStack_34c,fStack_350);
                  uStack_268 = CONCAT44(fStack_344,fStack_348);
                  local_260 = local_420;
                  auVar185._8_4_ = 0x7f800000;
                  auVar185._0_8_ = 0x7f8000007f800000;
                  auVar185._12_4_ = 0x7f800000;
                  auVar185._16_4_ = 0x7f800000;
                  auVar185._20_4_ = 0x7f800000;
                  auVar185._24_4_ = 0x7f800000;
                  auVar185._28_4_ = 0x7f800000;
                  auVar283 = vblendvps_avx(auVar185,local_420,auVar184);
                  auVar260 = vshufps_avx(auVar283,auVar283,0xb1);
                  auVar260 = vminps_avx(auVar283,auVar260);
                  auVar34 = vshufpd_avx(auVar260,auVar260,5);
                  auVar260 = vminps_avx(auVar260,auVar34);
                  auVar34 = vperm2f128_avx(auVar260,auVar260,1);
                  auVar260 = vminps_avx(auVar260,auVar34);
                  auVar283 = vcmpps_avx(auVar283,auVar260,0);
                  auVar260 = auVar184 & auVar283;
                  if ((((((((auVar260 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar260 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar260 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar260 >> 0x7f,0) != '\0') ||
                        (auVar260 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar260 >> 0xbf,0) != '\0') ||
                      (auVar260 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar260[0x1f] < '\0') {
                    auVar184 = vandps_avx(auVar283,auVar184);
                  }
                  uVar138 = vmovmskps_avx(auVar184);
                  uVar140 = 0;
                  if (uVar138 != 0) {
                    for (; (uVar138 >> uVar140 & 1) == 0; uVar140 = uVar140 + 1) {
                    }
                  }
                  uVar139 = (ulong)uVar140;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (((Geometry *)auVar144)->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    fVar229 = local_2a0[uVar139];
                    auVar160 = ZEXT464((uint)fVar229);
                    fVar237 = *(float *)((long)&local_280 + uVar139 * 4);
                    auVar188 = ZEXT464((uint)fVar237);
                    fVar248 = 1.0 - fVar229;
                    fVar247 = fVar229 * fVar248 + fVar229 * fVar248;
                    auVar255 = ZEXT416((uint)(fVar229 * fVar229 * 3.0));
                    auVar255 = vshufps_avx(auVar255,auVar255,0);
                    auVar201 = ZEXT416((uint)((fVar247 - fVar229 * fVar229) * 3.0));
                    auVar201 = vshufps_avx(auVar201,auVar201,0);
                    auVar241 = ZEXT416((uint)((fVar248 * fVar248 - fVar247) * 3.0));
                    auVar241 = vshufps_avx(auVar241,auVar241,0);
                    auVar216 = ZEXT416((uint)(fVar248 * fVar248 * -3.0));
                    auVar216 = vshufps_avx(auVar216,auVar216,0);
                    auVar202._0_4_ =
                         auVar216._0_4_ * (float)local_7d0._0_4_ +
                         auVar241._0_4_ * (float)local_580._0_4_ +
                         auVar255._0_4_ * (float)local_570._0_4_ +
                         auVar201._0_4_ * (float)local_590._0_4_;
                    auVar202._4_4_ =
                         auVar216._4_4_ * (float)local_7d0._4_4_ +
                         auVar241._4_4_ * (float)local_580._4_4_ +
                         auVar255._4_4_ * (float)local_570._4_4_ +
                         auVar201._4_4_ * (float)local_590._4_4_;
                    auVar202._8_4_ =
                         auVar216._8_4_ * (float)uStack_7c8 +
                         auVar241._8_4_ * (float)uStack_578 +
                         auVar255._8_4_ * (float)uStack_568 + auVar201._8_4_ * (float)uStack_588;
                    auVar202._12_4_ =
                         auVar216._12_4_ * uStack_7c8._4_4_ +
                         auVar241._12_4_ * uStack_578._4_4_ +
                         auVar255._12_4_ * uStack_568._4_4_ + auVar201._12_4_ * uStack_588._4_4_;
                    auVar224 = ZEXT464((uint)*(float *)(local_260 + uVar139 * 4));
                    (ray->super_RayK<1>).tfar = *(float *)(local_260 + uVar139 * 4);
                    uVar14 = vmovlps_avx(auVar202);
                    *(undefined8 *)&(ray->Ng).field_0 = uVar14;
                    fVar247 = (float)vextractps_avx(auVar202,2);
                    (ray->Ng).field_0.field_0.z = fVar247;
                    ray->u = fVar229;
                    ray->v = fVar237;
                    ray->primID = (uint)local_7d8;
                    ray->geomID = (uint)local_7e0;
                    ray->instID[0] = context->user->instID[0];
                    ray->instPrimID[0] = context->user->instPrimID[0];
                  }
                  else {
                    _local_700 = _local_580;
                    _local_680 = _local_590;
                    _local_600 = _local_570;
                    local_720 = auVar144;
                    local_7e8 = prim;
                    do {
                      local_6c4 = local_2a0[uVar139];
                      local_6c0 = *(undefined4 *)((long)&local_280 + uVar139 * 4);
                      local_780._0_4_ = (ray->super_RayK<1>).tfar;
                      local_740 = (float)uVar139;
                      fStack_73c = (float)(uVar139 >> 0x20);
                      (ray->super_RayK<1>).tfar = *(float *)(local_260 + uVar139 * 4);
                      local_7b0.context = context->user;
                      fVar237 = 1.0 - local_6c4;
                      fVar229 = local_6c4 * fVar237 + local_6c4 * fVar237;
                      auVar255 = ZEXT416((uint)(local_6c4 * local_6c4 * 3.0));
                      auVar255 = vshufps_avx(auVar255,auVar255,0);
                      auVar201 = ZEXT416((uint)((fVar229 - local_6c4 * local_6c4) * 3.0));
                      auVar201 = vshufps_avx(auVar201,auVar201,0);
                      auVar241 = ZEXT416((uint)((fVar237 * fVar237 - fVar229) * 3.0));
                      auVar241 = vshufps_avx(auVar241,auVar241,0);
                      auVar216 = ZEXT416((uint)(fVar237 * fVar237 * -3.0));
                      auVar216 = vshufps_avx(auVar216,auVar216,0);
                      auVar217._0_4_ = auVar216._0_4_ * (float)local_7d0._0_4_;
                      auVar217._4_4_ = auVar216._4_4_ * (float)local_7d0._4_4_;
                      auVar217._8_4_ = auVar216._8_4_ * (float)uStack_7c8;
                      auVar217._12_4_ = auVar216._12_4_ * uStack_7c8._4_4_;
                      auVar224 = ZEXT1664(auVar217);
                      auVar203._0_4_ =
                           auVar217._0_4_ +
                           auVar241._0_4_ * (float)local_700._0_4_ +
                           auVar255._0_4_ * (float)local_600._0_4_ +
                           auVar201._0_4_ * (float)local_680._0_4_;
                      auVar203._4_4_ =
                           auVar217._4_4_ +
                           auVar241._4_4_ * (float)local_700._4_4_ +
                           auVar255._4_4_ * (float)local_600._4_4_ +
                           auVar201._4_4_ * (float)local_680._4_4_;
                      auVar203._8_4_ =
                           auVar217._8_4_ +
                           auVar241._8_4_ * fStack_6f8 +
                           auVar255._8_4_ * (float)uStack_5f8 + auVar201._8_4_ * fStack_678;
                      auVar203._12_4_ =
                           auVar217._12_4_ +
                           auVar241._12_4_ * fStack_6f4 +
                           auVar255._12_4_ * uStack_5f8._4_4_ + auVar201._12_4_ * fStack_674;
                      local_6d0 = vmovlps_avx(auVar203);
                      local_6c8 = vextractps_avx(auVar203,2);
                      local_6bc = (int)local_7d8;
                      local_6b8 = (int)local_7e0;
                      local_6b4 = (local_7b0.context)->instID[0];
                      local_6b0 = (local_7b0.context)->instPrimID[0];
                      local_7ec = -1;
                      local_7b0.valid = &local_7ec;
                      local_7b0.geometryUserPtr = ((Geometry *)auVar144)->userPtr;
                      local_7b0.ray = (RTCRayN *)ray;
                      local_7b0.hit = (RTCHitN *)&local_6d0;
                      local_7b0.N = 1;
                      if (((Geometry *)auVar144)->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_0104a80a:
                        p_Var22 = context->args->filter;
                        if (p_Var22 != (RTCFilterFunctionN)0x0) {
                          if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                             (((((Geometry *)auVar144)->field_8).field_0x2 & 0x40) != 0)) {
                            auVar224 = ZEXT1664(auVar224._0_16_);
                            (*p_Var22)(&local_7b0);
                            auVar144 = local_720;
                          }
                          auVar359 = ZEXT3264(local_420);
                          auVar360 = ZEXT3264(_local_760);
                          auVar347 = ZEXT3264(local_640);
                          prim = local_7e8;
                          fVar192 = (float)local_560._0_4_;
                          fVar350 = (float)local_560._4_4_;
                          fVar209 = fStack_558;
                          fVar265 = fStack_554;
                          fVar211 = fStack_550;
                          fVar225 = fStack_54c;
                          fVar227 = fStack_548;
                          if (*local_7b0.valid == 0) goto LAB_0104a8d0;
                        }
                        (((Vec3f *)((long)local_7b0.ray + 0x30))->field_0).components[0] =
                             *(float *)local_7b0.hit;
                        (((Vec3f *)((long)local_7b0.ray + 0x30))->field_0).field_0.y =
                             *(float *)(local_7b0.hit + 4);
                        (((Vec3f *)((long)local_7b0.ray + 0x30))->field_0).field_0.z =
                             *(float *)(local_7b0.hit + 8);
                        *(float *)((long)local_7b0.ray + 0x3c) = *(float *)(local_7b0.hit + 0xc);
                        *(float *)((long)local_7b0.ray + 0x40) = *(float *)(local_7b0.hit + 0x10);
                        *(float *)((long)local_7b0.ray + 0x44) = *(float *)(local_7b0.hit + 0x14);
                        *(float *)((long)local_7b0.ray + 0x48) = *(float *)(local_7b0.hit + 0x18);
                        *(float *)((long)local_7b0.ray + 0x4c) = *(float *)(local_7b0.hit + 0x1c);
                        *(float *)((long)local_7b0.ray + 0x50) = *(float *)(local_7b0.hit + 0x20);
                      }
                      else {
                        auVar224 = ZEXT1664(auVar217);
                        (*((Geometry *)auVar144)->intersectionFilterN)(&local_7b0);
                        auVar347 = ZEXT3264(local_640);
                        auVar360 = ZEXT3264(_local_760);
                        auVar359 = ZEXT3264(local_420);
                        auVar144 = local_720;
                        prim = local_7e8;
                        fVar192 = (float)local_560._0_4_;
                        fVar350 = (float)local_560._4_4_;
                        fVar209 = fStack_558;
                        fVar265 = fStack_554;
                        fVar211 = fStack_550;
                        fVar225 = fStack_54c;
                        fVar227 = fStack_548;
                        if (*local_7b0.valid != 0) goto LAB_0104a80a;
LAB_0104a8d0:
                        (ray->super_RayK<1>).tfar = (float)local_780._0_4_;
                        prim = local_7e8;
                      }
                      uVar139 = CONCAT44(fStack_73c,local_740);
                      *(undefined4 *)(local_460[0] + uVar139 * 4) = 0;
                      auVar283 = local_460[0];
                      fVar229 = (ray->super_RayK<1>).tfar;
                      auVar158._4_4_ = fVar229;
                      auVar158._0_4_ = fVar229;
                      auVar158._8_4_ = fVar229;
                      auVar158._12_4_ = fVar229;
                      auVar158._16_4_ = fVar229;
                      auVar158._20_4_ = fVar229;
                      auVar158._24_4_ = fVar229;
                      auVar158._28_4_ = fVar229;
                      auVar184 = vcmpps_avx(auVar359._0_32_,auVar158,2);
                      local_460[0] = vandps_avx(auVar184,local_460[0]);
                      auVar160 = ZEXT3264(local_460[0]);
                      auVar283 = auVar283 & auVar184;
                      bVar119 = (auVar283 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
                      bVar120 = (auVar283 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
                      bVar118 = (auVar283 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
                      bVar117 = SUB321(auVar283 >> 0x7f,0) != '\0';
                      bVar116 = (auVar283 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0;
                      bVar115 = SUB321(auVar283 >> 0xbf,0) != '\0';
                      bVar114 = (auVar283 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0;
                      bVar113 = auVar283[0x1f] < '\0';
                      if (((((((bVar119 || bVar120) || bVar118) || bVar117) || bVar116) || bVar115)
                          || bVar114) || bVar113) {
                        auVar186._8_4_ = 0x7f800000;
                        auVar186._0_8_ = 0x7f8000007f800000;
                        auVar186._12_4_ = 0x7f800000;
                        auVar186._16_4_ = 0x7f800000;
                        auVar186._20_4_ = 0x7f800000;
                        auVar186._24_4_ = 0x7f800000;
                        auVar186._28_4_ = 0x7f800000;
                        auVar184 = vblendvps_avx(auVar186,auVar359._0_32_,local_460[0]);
                        auVar283 = vshufps_avx(auVar184,auVar184,0xb1);
                        auVar283 = vminps_avx(auVar184,auVar283);
                        auVar260 = vshufpd_avx(auVar283,auVar283,5);
                        auVar283 = vminps_avx(auVar283,auVar260);
                        auVar260 = vperm2f128_avx(auVar283,auVar283,1);
                        auVar224 = ZEXT3264(auVar260);
                        auVar283 = vminps_avx(auVar283,auVar260);
                        auVar184 = vcmpps_avx(auVar184,auVar283,0);
                        auVar283 = local_460[0] & auVar184;
                        if ((((((((auVar283 >> 0x1f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0 ||
                                 (auVar283 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                 ) || (auVar283 >> 0x5f & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) || SUB321(auVar283 >> 0x7f,0) != '\0')
                              || (auVar283 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0
                              ) || SUB321(auVar283 >> 0xbf,0) != '\0') ||
                            (auVar283 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                            auVar283[0x1f] < '\0') {
                          auVar283 = vandps_avx(auVar184,local_460[0]);
                          auVar160 = ZEXT3264(auVar283);
                        }
                        uVar138 = vmovmskps_avx(auVar160._0_32_);
                        uVar140 = 0;
                        if (uVar138 != 0) {
                          for (; (uVar138 >> uVar140 & 1) == 0; uVar140 = uVar140 + 1) {
                          }
                        }
                        uVar139 = (ulong)uVar140;
                      }
                      auVar188 = ZEXT3264(auVar184);
                    } while (((((((bVar119 || bVar120) || bVar118) || bVar117) || bVar116) ||
                              bVar115) || bVar114) || bVar113);
                  }
                }
                fVar229 = (float)local_5c0._0_4_;
                fVar237 = (float)local_5c0._4_4_;
                fVar247 = fStack_5b8;
                fVar248 = fStack_5b4;
                fVar249 = fStack_5b0;
                fVar253 = fStack_5ac;
                fVar262 = fStack_5a8;
              }
            }
          }
          lVar143 = lVar143 + 8;
          auVar359 = auVar360;
        } while ((int)lVar143 < (int)uVar17);
      }
      fVar192 = (ray->super_RayK<1>).tfar;
      auVar150._4_4_ = fVar192;
      auVar150._0_4_ = fVar192;
      auVar150._8_4_ = fVar192;
      auVar150._12_4_ = fVar192;
      auVar255 = vcmpps_avx(local_1b0,auVar150,2);
      uVar140 = vmovmskps_avx(auVar255);
      uVar136 = uVar136 & uVar136 + 0xf & uVar140;
    } while (uVar136 != 0);
  }
  return;
}

Assistant:

static __forceinline void intersect_h(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; geom->gather_hermite(p0,t0,p1,t1,geom->curve(primID),ray.time());
          Intersector().intersect(pre,ray,context,geom,primID,p0,t0,p1,t1,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }